

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  uint uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  ulong uVar93;
  uint uVar94;
  long lVar95;
  ulong uVar96;
  ulong uVar97;
  bool bVar98;
  float fVar99;
  float fVar127;
  float fVar130;
  __m128 a;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar100;
  float fVar101;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar136;
  float fVar138;
  float fVar140;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar128;
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar144;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar183;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar182;
  float fVar185;
  undefined1 auVar166 [32];
  float fVar184;
  float fVar186;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar154 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  float fVar231;
  undefined1 auVar208 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [28];
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar234;
  undefined1 auVar221 [32];
  undefined1 auVar209 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  float fVar235;
  float fVar251;
  float fVar252;
  float fVar254;
  undefined1 auVar236 [16];
  float fVar257;
  float fVar260;
  float fVar263;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar253;
  float fVar255;
  float fVar258;
  float fVar261;
  float fVar264;
  undefined1 auVar245 [28];
  float fVar256;
  float fVar259;
  float fVar262;
  undefined1 auVar250 [64];
  float fVar265;
  float fVar266;
  float fVar284;
  float fVar286;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar290;
  float fVar292;
  float fVar294;
  undefined1 auVar274 [32];
  float fVar288;
  undefined1 auVar275 [32];
  float fVar285;
  float fVar287;
  float fVar289;
  float fVar291;
  float fVar293;
  float fVar295;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar296;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar299 [16];
  float fVar297;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar312;
  float fVar314;
  float fVar318;
  float fVar320;
  float fVar322;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar316;
  undefined1 auVar305 [32];
  float fVar298;
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar323;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [64];
  float fVar324;
  float fVar338;
  float fVar339;
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar347;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  float fVar340;
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar348;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [64];
  float fVar349;
  undefined1 auVar350 [16];
  float fVar355;
  float fVar356;
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar357;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [28];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float fVar368;
  undefined1 auVar367 [32];
  float fVar369;
  undefined1 auVar370 [16];
  float fVar374;
  float fVar375;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar376;
  float fVar380;
  undefined1 auVar373 [32];
  undefined1 auVar381 [16];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar387;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar388;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float in_register_0000151c;
  undefined1 auVar389 [32];
  float fVar398;
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  float fVar399;
  float fVar400;
  float fVar406;
  float fVar409;
  float fVar411;
  float fVar413;
  float fVar415;
  float fVar417;
  undefined1 auVar402 [32];
  float fVar407;
  float fVar410;
  float fVar412;
  float fVar414;
  float fVar416;
  float fVar418;
  float fVar419;
  undefined1 auVar403 [32];
  float fVar401;
  float fVar408;
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  float in_register_0000159c;
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  float fVar424;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float in_register_000015dc;
  undefined1 auVar425 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_bc0;
  undefined8 local_b20;
  undefined8 uStack_b18;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined8 *local_9f0;
  ulong local_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar386 [64];
  
  PVar8 = prim[1];
  uVar96 = (ulong)(byte)PVar8;
  lVar95 = uVar96 * 5;
  auVar147 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar214 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar214 = vinsertps_avx(auVar214,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar207 = *(float *)(prim + uVar96 * 0x19 + 0x12);
  auVar147 = vsubps_avx(auVar147,*(undefined1 (*) [16])(prim + uVar96 * 0x19 + 6));
  auVar145._0_4_ = fVar207 * auVar147._0_4_;
  auVar145._4_4_ = fVar207 * auVar147._4_4_;
  auVar145._8_4_ = fVar207 * auVar147._8_4_;
  auVar145._12_4_ = fVar207 * auVar147._12_4_;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 4 + 6)));
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 4 + 10)));
  auVar267._0_4_ = fVar207 * auVar214._0_4_;
  auVar267._4_4_ = fVar207 * auVar214._4_4_;
  auVar267._8_4_ = fVar207 * auVar214._8_4_;
  auVar267._12_4_ = fVar207 * auVar214._12_4_;
  auVar114._16_16_ = auVar106;
  auVar114._0_16_ = auVar147;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar95 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar95 + 10)));
  auVar198._16_16_ = auVar214;
  auVar198._0_16_ = auVar147;
  auVar353 = vcvtdq2ps_avx(auVar198);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 6 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 6 + 10)));
  auVar219._16_16_ = auVar214;
  auVar219._0_16_ = auVar147;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0xb + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0xb + 10)));
  auVar14 = vcvtdq2ps_avx(auVar219);
  auVar220._16_16_ = auVar214;
  auVar220._0_16_ = auVar147;
  auVar15 = vcvtdq2ps_avx(auVar220);
  uVar93 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar302._16_16_ = auVar214;
  auVar302._0_16_ = auVar147;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar96 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar302);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar96 + 10)));
  auVar325._16_16_ = auVar214;
  auVar325._0_16_ = auVar147;
  lVar10 = uVar96 * 9;
  uVar93 = (ulong)(uint)((int)lVar10 * 2);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar405 = vcvtdq2ps_avx(auVar325);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar326._16_16_ = auVar214;
  auVar326._0_16_ = auVar147;
  auVar17 = vcvtdq2ps_avx(auVar326);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar96 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar96 + 10)));
  auVar364._16_16_ = auVar214;
  auVar364._0_16_ = auVar147;
  uVar93 = (ulong)(uint)((int)lVar95 << 2);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 10)));
  auVar308 = vcvtdq2ps_avx(auVar364);
  auVar371._16_16_ = auVar214;
  auVar371._0_16_ = auVar147;
  auVar18 = vcvtdq2ps_avx(auVar371);
  auVar147 = vshufps_avx(auVar267,auVar267,0);
  auVar214 = vshufps_avx(auVar267,auVar267,0x55);
  auVar106 = vshufps_avx(auVar267,auVar267,0xaa);
  fVar207 = auVar106._0_4_;
  fVar229 = auVar106._4_4_;
  fVar230 = auVar106._8_4_;
  fVar231 = auVar106._12_4_;
  fVar232 = auVar214._0_4_;
  fVar233 = auVar214._4_4_;
  fVar234 = auVar214._8_4_;
  fVar235 = auVar214._12_4_;
  fVar251 = auVar147._0_4_;
  fVar252 = auVar147._4_4_;
  fVar254 = auVar147._8_4_;
  fVar256 = auVar147._12_4_;
  auVar389._0_4_ = fVar251 * auVar114._0_4_ + fVar232 * auVar353._0_4_ + fVar207 * auVar14._0_4_;
  auVar389._4_4_ = fVar252 * auVar114._4_4_ + fVar233 * auVar353._4_4_ + fVar229 * auVar14._4_4_;
  auVar389._8_4_ = fVar254 * auVar114._8_4_ + fVar234 * auVar353._8_4_ + fVar230 * auVar14._8_4_;
  auVar389._12_4_ = fVar256 * auVar114._12_4_ + fVar235 * auVar353._12_4_ + fVar231 * auVar14._12_4_
  ;
  auVar389._16_4_ = fVar251 * auVar114._16_4_ + fVar232 * auVar353._16_4_ + fVar207 * auVar14._16_4_
  ;
  auVar389._20_4_ = fVar252 * auVar114._20_4_ + fVar233 * auVar353._20_4_ + fVar229 * auVar14._20_4_
  ;
  auVar389._24_4_ = fVar254 * auVar114._24_4_ + fVar234 * auVar353._24_4_ + fVar230 * auVar14._24_4_
  ;
  auVar389._28_4_ = fVar235 + in_register_000015dc + in_register_0000151c;
  auVar382._0_4_ = fVar251 * auVar15._0_4_ + fVar232 * auVar16._0_4_ + auVar405._0_4_ * fVar207;
  auVar382._4_4_ = fVar252 * auVar15._4_4_ + fVar233 * auVar16._4_4_ + auVar405._4_4_ * fVar229;
  auVar382._8_4_ = fVar254 * auVar15._8_4_ + fVar234 * auVar16._8_4_ + auVar405._8_4_ * fVar230;
  auVar382._12_4_ = fVar256 * auVar15._12_4_ + fVar235 * auVar16._12_4_ + auVar405._12_4_ * fVar231;
  auVar382._16_4_ = fVar251 * auVar15._16_4_ + fVar232 * auVar16._16_4_ + auVar405._16_4_ * fVar207;
  auVar382._20_4_ = fVar252 * auVar15._20_4_ + fVar233 * auVar16._20_4_ + auVar405._20_4_ * fVar229;
  auVar382._24_4_ = fVar254 * auVar15._24_4_ + fVar234 * auVar16._24_4_ + auVar405._24_4_ * fVar230;
  auVar382._28_4_ = fVar235 + in_register_000015dc + in_register_0000159c;
  auVar274._0_4_ = fVar251 * auVar17._0_4_ + fVar232 * auVar308._0_4_ + auVar18._0_4_ * fVar207;
  auVar274._4_4_ = fVar252 * auVar17._4_4_ + fVar233 * auVar308._4_4_ + auVar18._4_4_ * fVar229;
  auVar274._8_4_ = fVar254 * auVar17._8_4_ + fVar234 * auVar308._8_4_ + auVar18._8_4_ * fVar230;
  auVar274._12_4_ = fVar256 * auVar17._12_4_ + fVar235 * auVar308._12_4_ + auVar18._12_4_ * fVar231;
  auVar274._16_4_ = fVar251 * auVar17._16_4_ + fVar232 * auVar308._16_4_ + auVar18._16_4_ * fVar207;
  auVar274._20_4_ = fVar252 * auVar17._20_4_ + fVar233 * auVar308._20_4_ + auVar18._20_4_ * fVar229;
  auVar274._24_4_ = fVar254 * auVar17._24_4_ + fVar234 * auVar308._24_4_ + auVar18._24_4_ * fVar230;
  auVar274._28_4_ = fVar256 + fVar235 + fVar231;
  auVar147 = vshufps_avx(auVar145,auVar145,0);
  auVar214 = vshufps_avx(auVar145,auVar145,0x55);
  auVar106 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar229 = auVar106._0_4_;
  fVar230 = auVar106._4_4_;
  fVar231 = auVar106._8_4_;
  fVar232 = auVar106._12_4_;
  fVar252 = auVar214._0_4_;
  fVar254 = auVar214._4_4_;
  fVar256 = auVar214._8_4_;
  fVar259 = auVar214._12_4_;
  fVar233 = auVar147._0_4_;
  fVar234 = auVar147._4_4_;
  fVar235 = auVar147._8_4_;
  fVar251 = auVar147._12_4_;
  fVar207 = auVar114._28_4_;
  auVar303._0_4_ = fVar233 * auVar114._0_4_ + fVar252 * auVar353._0_4_ + fVar229 * auVar14._0_4_;
  auVar303._4_4_ = fVar234 * auVar114._4_4_ + fVar254 * auVar353._4_4_ + fVar230 * auVar14._4_4_;
  auVar303._8_4_ = fVar235 * auVar114._8_4_ + fVar256 * auVar353._8_4_ + fVar231 * auVar14._8_4_;
  auVar303._12_4_ = fVar251 * auVar114._12_4_ + fVar259 * auVar353._12_4_ + fVar232 * auVar14._12_4_
  ;
  auVar303._16_4_ = fVar233 * auVar114._16_4_ + fVar252 * auVar353._16_4_ + fVar229 * auVar14._16_4_
  ;
  auVar303._20_4_ = fVar234 * auVar114._20_4_ + fVar254 * auVar353._20_4_ + fVar230 * auVar14._20_4_
  ;
  auVar303._24_4_ = fVar235 * auVar114._24_4_ + fVar256 * auVar353._24_4_ + fVar231 * auVar14._24_4_
  ;
  auVar303._28_4_ = fVar207 + auVar353._28_4_ + auVar14._28_4_;
  auVar162._0_4_ = fVar233 * auVar15._0_4_ + auVar405._0_4_ * fVar229 + fVar252 * auVar16._0_4_;
  auVar162._4_4_ = fVar234 * auVar15._4_4_ + auVar405._4_4_ * fVar230 + fVar254 * auVar16._4_4_;
  auVar162._8_4_ = fVar235 * auVar15._8_4_ + auVar405._8_4_ * fVar231 + fVar256 * auVar16._8_4_;
  auVar162._12_4_ = fVar251 * auVar15._12_4_ + auVar405._12_4_ * fVar232 + fVar259 * auVar16._12_4_;
  auVar162._16_4_ = fVar233 * auVar15._16_4_ + auVar405._16_4_ * fVar229 + fVar252 * auVar16._16_4_;
  auVar162._20_4_ = fVar234 * auVar15._20_4_ + auVar405._20_4_ * fVar230 + fVar254 * auVar16._20_4_;
  auVar162._24_4_ = fVar235 * auVar15._24_4_ + auVar405._24_4_ * fVar231 + fVar256 * auVar16._24_4_;
  auVar162._28_4_ = fVar207 + auVar405._28_4_ + auVar14._28_4_;
  auVar327._8_4_ = 0x7fffffff;
  auVar327._0_8_ = 0x7fffffff7fffffff;
  auVar327._12_4_ = 0x7fffffff;
  auVar327._16_4_ = 0x7fffffff;
  auVar327._20_4_ = 0x7fffffff;
  auVar327._24_4_ = 0x7fffffff;
  auVar327._28_4_ = 0x7fffffff;
  auVar365._8_4_ = 0x219392ef;
  auVar365._0_8_ = 0x219392ef219392ef;
  auVar365._12_4_ = 0x219392ef;
  auVar365._16_4_ = 0x219392ef;
  auVar365._20_4_ = 0x219392ef;
  auVar365._24_4_ = 0x219392ef;
  auVar365._28_4_ = 0x219392ef;
  auVar114 = vandps_avx(auVar389,auVar327);
  auVar114 = vcmpps_avx(auVar114,auVar365,1);
  auVar353 = vblendvps_avx(auVar389,auVar365,auVar114);
  auVar114 = vandps_avx(auVar382,auVar327);
  auVar114 = vcmpps_avx(auVar114,auVar365,1);
  auVar14 = vblendvps_avx(auVar382,auVar365,auVar114);
  auVar114 = vandps_avx(auVar274,auVar327);
  auVar114 = vcmpps_avx(auVar114,auVar365,1);
  auVar114 = vblendvps_avx(auVar274,auVar365,auVar114);
  auVar199._0_4_ = fVar252 * auVar308._0_4_ + auVar18._0_4_ * fVar229 + fVar233 * auVar17._0_4_;
  auVar199._4_4_ = fVar254 * auVar308._4_4_ + auVar18._4_4_ * fVar230 + fVar234 * auVar17._4_4_;
  auVar199._8_4_ = fVar256 * auVar308._8_4_ + auVar18._8_4_ * fVar231 + fVar235 * auVar17._8_4_;
  auVar199._12_4_ = fVar259 * auVar308._12_4_ + auVar18._12_4_ * fVar232 + fVar251 * auVar17._12_4_;
  auVar199._16_4_ = fVar252 * auVar308._16_4_ + auVar18._16_4_ * fVar229 + fVar233 * auVar17._16_4_;
  auVar199._20_4_ = fVar254 * auVar308._20_4_ + auVar18._20_4_ * fVar230 + fVar234 * auVar17._20_4_;
  auVar199._24_4_ = fVar256 * auVar308._24_4_ + auVar18._24_4_ * fVar231 + fVar235 * auVar17._24_4_;
  auVar199._28_4_ = auVar16._28_4_ + fVar232 + fVar207;
  auVar15 = vrcpps_avx(auVar353);
  fVar207 = auVar15._0_4_;
  fVar229 = auVar15._4_4_;
  auVar16._4_4_ = auVar353._4_4_ * fVar229;
  auVar16._0_4_ = auVar353._0_4_ * fVar207;
  fVar230 = auVar15._8_4_;
  auVar16._8_4_ = auVar353._8_4_ * fVar230;
  fVar231 = auVar15._12_4_;
  auVar16._12_4_ = auVar353._12_4_ * fVar231;
  fVar232 = auVar15._16_4_;
  auVar16._16_4_ = auVar353._16_4_ * fVar232;
  fVar233 = auVar15._20_4_;
  auVar16._20_4_ = auVar353._20_4_ * fVar233;
  fVar234 = auVar15._24_4_;
  auVar16._24_4_ = auVar353._24_4_ * fVar234;
  auVar16._28_4_ = auVar353._28_4_;
  auVar351._8_4_ = 0x3f800000;
  auVar351._0_8_ = &DAT_3f8000003f800000;
  auVar351._12_4_ = 0x3f800000;
  auVar351._16_4_ = 0x3f800000;
  auVar351._20_4_ = 0x3f800000;
  auVar351._24_4_ = 0x3f800000;
  auVar351._28_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar351,auVar16);
  auVar353 = vrcpps_avx(auVar14);
  fVar207 = fVar207 + fVar207 * auVar16._0_4_;
  fVar229 = fVar229 + fVar229 * auVar16._4_4_;
  fVar230 = fVar230 + fVar230 * auVar16._8_4_;
  fVar231 = fVar231 + fVar231 * auVar16._12_4_;
  fVar232 = fVar232 + fVar232 * auVar16._16_4_;
  fVar233 = fVar233 + fVar233 * auVar16._20_4_;
  fVar234 = fVar234 + fVar234 * auVar16._24_4_;
  fVar265 = auVar353._0_4_;
  fVar284 = auVar353._4_4_;
  auVar405._4_4_ = fVar284 * auVar14._4_4_;
  auVar405._0_4_ = fVar265 * auVar14._0_4_;
  fVar286 = auVar353._8_4_;
  auVar405._8_4_ = fVar286 * auVar14._8_4_;
  fVar288 = auVar353._12_4_;
  auVar405._12_4_ = fVar288 * auVar14._12_4_;
  fVar290 = auVar353._16_4_;
  auVar405._16_4_ = fVar290 * auVar14._16_4_;
  fVar292 = auVar353._20_4_;
  auVar405._20_4_ = fVar292 * auVar14._20_4_;
  fVar294 = auVar353._24_4_;
  auVar405._24_4_ = fVar294 * auVar14._24_4_;
  auVar405._28_4_ = auVar15._28_4_;
  auVar353 = vsubps_avx(auVar351,auVar405);
  fVar265 = fVar265 + fVar265 * auVar353._0_4_;
  fVar284 = fVar284 + fVar284 * auVar353._4_4_;
  fVar286 = fVar286 + fVar286 * auVar353._8_4_;
  fVar288 = fVar288 + fVar288 * auVar353._12_4_;
  fVar290 = fVar290 + fVar290 * auVar353._16_4_;
  fVar292 = fVar292 + fVar292 * auVar353._20_4_;
  fVar294 = fVar294 + fVar294 * auVar353._24_4_;
  auVar353 = vrcpps_avx(auVar114);
  fVar235 = auVar353._0_4_;
  fVar251 = auVar353._4_4_;
  auVar17._4_4_ = fVar251 * auVar114._4_4_;
  auVar17._0_4_ = fVar235 * auVar114._0_4_;
  fVar252 = auVar353._8_4_;
  auVar17._8_4_ = fVar252 * auVar114._8_4_;
  fVar254 = auVar353._12_4_;
  auVar17._12_4_ = fVar254 * auVar114._12_4_;
  fVar256 = auVar353._16_4_;
  auVar17._16_4_ = fVar256 * auVar114._16_4_;
  fVar259 = auVar353._20_4_;
  auVar17._20_4_ = fVar259 * auVar114._20_4_;
  fVar262 = auVar353._24_4_;
  auVar17._24_4_ = fVar262 * auVar114._24_4_;
  auVar17._28_4_ = auVar14._28_4_;
  auVar114 = vsubps_avx(auVar351,auVar17);
  fVar235 = fVar235 + fVar235 * auVar114._0_4_;
  fVar251 = fVar251 + fVar251 * auVar114._4_4_;
  fVar252 = fVar252 + fVar252 * auVar114._8_4_;
  fVar254 = fVar254 + fVar254 * auVar114._12_4_;
  fVar256 = fVar256 + fVar256 * auVar114._16_4_;
  fVar259 = fVar259 + fVar259 * auVar114._20_4_;
  fVar262 = fVar262 + fVar262 * auVar114._24_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar96 * 7 + 6);
  auVar147 = vpmovsxwd_avx(auVar147);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar96 * 7 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar115._16_16_ = auVar214;
  auVar115._0_16_ = auVar147;
  auVar114 = vcvtdq2ps_avx(auVar115);
  auVar114 = vsubps_avx(auVar114,auVar303);
  auVar102._0_4_ = fVar207 * auVar114._0_4_;
  auVar102._4_4_ = fVar229 * auVar114._4_4_;
  auVar102._8_4_ = fVar230 * auVar114._8_4_;
  auVar102._12_4_ = fVar231 * auVar114._12_4_;
  auVar14._16_4_ = fVar232 * auVar114._16_4_;
  auVar14._0_16_ = auVar102;
  auVar14._20_4_ = fVar233 * auVar114._20_4_;
  auVar14._24_4_ = fVar234 * auVar114._24_4_;
  auVar14._28_4_ = auVar114._28_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + lVar10 + 6);
  auVar147 = vpmovsxwd_avx(auVar106);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + lVar10 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar191);
  auVar328._16_16_ = auVar214;
  auVar328._0_16_ = auVar147;
  auVar114 = vcvtdq2ps_avx(auVar328);
  auVar114 = vsubps_avx(auVar114,auVar303);
  auVar208._0_4_ = fVar207 * auVar114._0_4_;
  auVar208._4_4_ = fVar229 * auVar114._4_4_;
  auVar208._8_4_ = fVar230 * auVar114._8_4_;
  auVar208._12_4_ = fVar231 * auVar114._12_4_;
  auVar308._16_4_ = fVar232 * auVar114._16_4_;
  auVar308._0_16_ = auVar208;
  auVar308._20_4_ = fVar233 * auVar114._20_4_;
  auVar308._24_4_ = fVar234 * auVar114._24_4_;
  auVar308._28_4_ = auVar15._28_4_ + auVar16._28_4_;
  lVar95 = (ulong)(byte)PVar8 * 0x10;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + lVar95 + 6);
  auVar147 = vpmovsxwd_avx(auVar211);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + lVar95 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar3);
  lVar95 = lVar95 + uVar96 * -2;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + lVar95 + 6);
  auVar106 = vpmovsxwd_avx(auVar151);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + lVar95 + 0xe);
  auVar191 = vpmovsxwd_avx(auVar158);
  auVar304._16_16_ = auVar191;
  auVar304._0_16_ = auVar106;
  auVar114 = vcvtdq2ps_avx(auVar304);
  auVar114 = vsubps_avx(auVar114,auVar162);
  auVar299._0_4_ = fVar265 * auVar114._0_4_;
  auVar299._4_4_ = fVar284 * auVar114._4_4_;
  auVar299._8_4_ = fVar286 * auVar114._8_4_;
  auVar299._12_4_ = fVar288 * auVar114._12_4_;
  auVar15._16_4_ = fVar290 * auVar114._16_4_;
  auVar15._0_16_ = auVar299;
  auVar15._20_4_ = fVar292 * auVar114._20_4_;
  auVar15._24_4_ = fVar294 * auVar114._24_4_;
  auVar15._28_4_ = auVar114._28_4_;
  auVar329._16_16_ = auVar214;
  auVar329._0_16_ = auVar147;
  auVar114 = vcvtdq2ps_avx(auVar329);
  auVar114 = vsubps_avx(auVar114,auVar162);
  auVar146._0_4_ = fVar265 * auVar114._0_4_;
  auVar146._4_4_ = fVar284 * auVar114._4_4_;
  auVar146._8_4_ = fVar286 * auVar114._8_4_;
  auVar146._12_4_ = fVar288 * auVar114._12_4_;
  auVar18._16_4_ = fVar290 * auVar114._16_4_;
  auVar18._0_16_ = auVar146;
  auVar18._20_4_ = fVar292 * auVar114._20_4_;
  auVar18._24_4_ = fVar294 * auVar114._24_4_;
  auVar18._28_4_ = auVar114._28_4_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar93 + uVar96 + 6);
  auVar147 = vpmovsxwd_avx(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar93 + uVar96 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar5);
  auVar275._16_16_ = auVar214;
  auVar275._0_16_ = auVar147;
  auVar114 = vcvtdq2ps_avx(auVar275);
  auVar114 = vsubps_avx(auVar114,auVar199);
  auVar268._0_4_ = fVar235 * auVar114._0_4_;
  auVar268._4_4_ = fVar251 * auVar114._4_4_;
  auVar268._8_4_ = fVar252 * auVar114._8_4_;
  auVar268._12_4_ = fVar254 * auVar114._12_4_;
  auVar24._16_4_ = fVar256 * auVar114._16_4_;
  auVar24._0_16_ = auVar268;
  auVar24._20_4_ = fVar259 * auVar114._20_4_;
  auVar24._24_4_ = fVar262 * auVar114._24_4_;
  auVar24._28_4_ = auVar114._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar96 * 0x17 + 6);
  auVar147 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar96 * 0x17 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar7);
  auVar330._16_16_ = auVar214;
  auVar330._0_16_ = auVar147;
  auVar114 = vcvtdq2ps_avx(auVar330);
  auVar114 = vsubps_avx(auVar114,auVar199);
  auVar190._0_4_ = fVar235 * auVar114._0_4_;
  auVar190._4_4_ = fVar251 * auVar114._4_4_;
  auVar190._8_4_ = fVar252 * auVar114._8_4_;
  auVar190._12_4_ = fVar254 * auVar114._12_4_;
  auVar25._16_4_ = fVar256 * auVar114._16_4_;
  auVar25._0_16_ = auVar190;
  auVar25._20_4_ = fVar259 * auVar114._20_4_;
  auVar25._24_4_ = fVar262 * auVar114._24_4_;
  auVar25._28_4_ = auVar114._28_4_;
  auVar147 = vpminsd_avx(auVar14._16_16_,auVar308._16_16_);
  auVar214 = vpminsd_avx(auVar102,auVar208);
  auVar352._16_16_ = auVar147;
  auVar352._0_16_ = auVar214;
  auVar147 = vpminsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar214 = vpminsd_avx(auVar299,auVar146);
  auVar383._16_16_ = auVar147;
  auVar383._0_16_ = auVar214;
  auVar114 = vmaxps_avx(auVar352,auVar383);
  auVar147 = vpminsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar214 = vpminsd_avx(auVar268,auVar190);
  auVar402._16_16_ = auVar147;
  auVar402._0_16_ = auVar214;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar420._4_4_ = uVar2;
  auVar420._0_4_ = uVar2;
  auVar420._8_4_ = uVar2;
  auVar420._12_4_ = uVar2;
  auVar420._16_4_ = uVar2;
  auVar420._20_4_ = uVar2;
  auVar420._24_4_ = uVar2;
  auVar420._28_4_ = uVar2;
  auVar353 = vmaxps_avx(auVar402,auVar420);
  auVar114 = vmaxps_avx(auVar114,auVar353);
  local_400._4_4_ = auVar114._4_4_ * 0.99999964;
  local_400._0_4_ = auVar114._0_4_ * 0.99999964;
  local_400._8_4_ = auVar114._8_4_ * 0.99999964;
  local_400._12_4_ = auVar114._12_4_ * 0.99999964;
  local_400._16_4_ = auVar114._16_4_ * 0.99999964;
  local_400._20_4_ = auVar114._20_4_ * 0.99999964;
  local_400._24_4_ = auVar114._24_4_ * 0.99999964;
  local_400._28_4_ = auVar114._28_4_;
  auVar147 = vpmaxsd_avx(auVar14._16_16_,auVar308._16_16_);
  auVar214 = vpmaxsd_avx(auVar102,auVar208);
  auVar116._16_16_ = auVar147;
  auVar116._0_16_ = auVar214;
  auVar147 = vpmaxsd_avx(auVar15._16_16_,auVar18._16_16_);
  auVar214 = vpmaxsd_avx(auVar299,auVar146);
  auVar163._16_16_ = auVar147;
  auVar163._0_16_ = auVar214;
  auVar114 = vminps_avx(auVar116,auVar163);
  auVar147 = vpmaxsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar214 = vpmaxsd_avx(auVar268,auVar190);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar221._4_4_ = uVar2;
  auVar221._0_4_ = uVar2;
  auVar221._8_4_ = uVar2;
  auVar221._12_4_ = uVar2;
  auVar221._16_4_ = uVar2;
  auVar221._20_4_ = uVar2;
  auVar221._24_4_ = uVar2;
  auVar221._28_4_ = uVar2;
  auVar164._16_16_ = auVar147;
  auVar164._0_16_ = auVar214;
  auVar353 = vminps_avx(auVar164,auVar221);
  auVar114 = vminps_avx(auVar114,auVar353);
  auVar353._4_4_ = auVar114._4_4_ * 1.0000004;
  auVar353._0_4_ = auVar114._0_4_ * 1.0000004;
  auVar353._8_4_ = auVar114._8_4_ * 1.0000004;
  auVar353._12_4_ = auVar114._12_4_ * 1.0000004;
  auVar353._16_4_ = auVar114._16_4_ * 1.0000004;
  auVar353._20_4_ = auVar114._20_4_ * 1.0000004;
  auVar353._24_4_ = auVar114._24_4_ * 1.0000004;
  auVar353._28_4_ = auVar114._28_4_;
  auVar114 = vcmpps_avx(local_400,auVar353,2);
  auVar147 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar165._16_16_ = auVar147;
  auVar165._0_16_ = auVar147;
  auVar353 = vcvtdq2ps_avx(auVar165);
  auVar353 = vcmpps_avx(_DAT_02020f40,auVar353,1);
  auVar114 = vandps_avx(auVar114,auVar353);
  uVar92 = vmovmskps_avx(auVar114);
  if (uVar92 == 0) {
    return;
  }
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  uVar92 = uVar92 & 0xff;
  local_3c0 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_9f0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8b0 = prim;
LAB_0111c70c:
  local_8a8 = (ulong)uVar92;
  lVar95 = 0;
  if (local_8a8 != 0) {
    for (; (uVar92 >> lVar95 & 1) == 0; lVar95 = lVar95 + 1) {
    }
  }
  uVar92 = *(uint *)(local_8b0 + 2);
  local_9e8 = (ulong)*(uint *)(local_8b0 + lVar95 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar92].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  uVar96 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_9e8 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar147 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * uVar96);
  auVar214 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * (uVar96 + 1));
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar191 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar207 = *(float *)(ray + k * 4 + 0x40);
  auVar361._4_4_ = fVar207;
  auVar361._0_4_ = fVar207;
  auVar361._8_4_ = fVar207;
  auVar361._12_4_ = fVar207;
  fStack_7b0 = fVar207;
  _local_7c0 = auVar361;
  fStack_7ac = fVar207;
  fStack_7a8 = fVar207;
  fStack_7a4 = fVar207;
  fVar229 = *(float *)(ray + k * 4 + 0x50);
  auVar370._4_4_ = fVar229;
  auVar370._0_4_ = fVar229;
  auVar370._8_4_ = fVar229;
  auVar370._12_4_ = fVar229;
  fStack_7d0 = fVar229;
  _local_7e0 = auVar370;
  fStack_7cc = fVar229;
  fStack_7c8 = fVar229;
  fStack_7c4 = fVar229;
  auVar106 = vunpcklps_avx(auVar361,auVar370);
  fVar230 = *(float *)(ray + k * 4 + 0x60);
  auVar381._4_4_ = fVar230;
  auVar381._0_4_ = fVar230;
  auVar381._8_4_ = fVar230;
  auVar381._12_4_ = fVar230;
  fStack_850 = fVar230;
  _local_860 = auVar381;
  fStack_84c = fVar230;
  fStack_848 = fVar230;
  fStack_844 = fVar230;
  auVar386 = ZEXT3264(_local_860);
  _local_950 = vinsertps_avx(auVar106,auVar381,0x28);
  pfVar1 = (float *)(pGVar9[2].intersectionFilterN + uVar96 * (long)pGVar9[2].pointQueryFunc);
  auVar236._0_4_ = auVar147._0_4_ + *pfVar1 * 0.33333334;
  auVar236._4_4_ = auVar147._4_4_ + pfVar1[1] * 0.33333334;
  auVar236._8_4_ = auVar147._8_4_ + pfVar1[2] * 0.33333334;
  auVar236._12_4_ = auVar147._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar9[2].intersectionFilterN + (long)pGVar9[2].pointQueryFunc * (uVar96 + 1));
  auVar103._0_4_ = *pfVar1 * 0.33333334;
  auVar103._4_4_ = pfVar1[1] * 0.33333334;
  auVar103._8_4_ = pfVar1[2] * 0.33333334;
  auVar103._12_4_ = pfVar1[3] * 0.33333334;
  auVar3 = vsubps_avx(auVar214,auVar103);
  auVar104._0_4_ = (auVar214._0_4_ + auVar147._0_4_ + auVar236._0_4_ + auVar3._0_4_) * 0.25;
  auVar104._4_4_ = (auVar214._4_4_ + auVar147._4_4_ + auVar236._4_4_ + auVar3._4_4_) * 0.25;
  auVar104._8_4_ = (auVar214._8_4_ + auVar147._8_4_ + auVar236._8_4_ + auVar3._8_4_) * 0.25;
  auVar104._12_4_ = (auVar214._12_4_ + auVar147._12_4_ + auVar236._12_4_ + auVar3._12_4_) * 0.25;
  auVar106 = vsubps_avx(auVar104,auVar191);
  auVar106 = vdpps_avx(auVar106,_local_950,0x7f);
  local_960 = vdpps_avx(_local_950,_local_950,0x7f);
  auVar211 = vrcpss_avx(local_960,local_960);
  fVar231 = auVar106._0_4_ * auVar211._0_4_ * (2.0 - local_960._0_4_ * auVar211._0_4_);
  auVar211 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
  auVar209._0_4_ = auVar191._0_4_ + local_950._0_4_ * auVar211._0_4_;
  auVar209._4_4_ = auVar191._4_4_ + local_950._4_4_ * auVar211._4_4_;
  auVar209._8_4_ = auVar191._8_4_ + local_950._8_4_ * auVar211._8_4_;
  auVar209._12_4_ = auVar191._12_4_ + local_950._12_4_ * auVar211._12_4_;
  auVar106 = vblendps_avx(auVar209,_DAT_01feba10,8);
  _local_a80 = vsubps_avx(auVar147,auVar106);
  _local_a90 = vsubps_avx(auVar3,auVar106);
  _local_aa0 = vsubps_avx(auVar236,auVar106);
  _local_ab0 = vsubps_avx(auVar214,auVar106);
  auVar228 = ZEXT1664(_local_ab0);
  auVar147 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001250 = auVar147;
  _local_1a0 = auVar147;
  auVar147 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001250 = auVar147;
  _local_1c0 = auVar147;
  auVar147 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001250 = auVar147;
  _local_1e0 = auVar147;
  auVar147 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar147;
  _local_200 = auVar147;
  auVar147 = vshufps_avx(_local_aa0,_local_aa0,0);
  register0x00001290 = auVar147;
  _local_220 = auVar147;
  auVar147 = vshufps_avx(_local_aa0,_local_aa0,0x55);
  register0x00001290 = auVar147;
  _local_240 = auVar147;
  auVar147 = vshufps_avx(_local_aa0,_local_aa0,0xaa);
  register0x00001290 = auVar147;
  _local_260 = auVar147;
  auVar147 = vshufps_avx(_local_aa0,_local_aa0,0xff);
  register0x00001290 = auVar147;
  _local_280 = auVar147;
  auVar147 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar147;
  _local_2a0 = auVar147;
  auVar147 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar147;
  _local_2c0 = auVar147;
  auVar147 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar147;
  _local_2e0 = auVar147;
  auVar147 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar147;
  _local_300 = auVar147;
  auVar147 = vshufps_avx(_local_ab0,_local_ab0,0);
  register0x00001290 = auVar147;
  _local_320 = auVar147;
  auVar147 = vshufps_avx(_local_ab0,_local_ab0,0x55);
  register0x00001290 = auVar147;
  _local_340 = auVar147;
  auVar147 = vshufps_avx(_local_ab0,_local_ab0,0xaa);
  register0x00001290 = auVar147;
  _local_360 = auVar147;
  auVar147 = vshufps_avx(_local_ab0,_local_ab0,0xff);
  register0x00001290 = auVar147;
  _local_380 = auVar147;
  auVar147 = ZEXT416((uint)(fVar207 * fVar207 + fVar229 * fVar229 + fVar230 * fVar230));
  auVar147 = vshufps_avx(auVar147,auVar147,0);
  local_3a0._16_16_ = auVar147;
  local_3a0._0_16_ = auVar147;
  fVar207 = *(float *)(ray + k * 4 + 0x30);
  local_8c0 = ZEXT416((uint)fVar231);
  auVar147 = vshufps_avx(ZEXT416((uint)(fVar207 - fVar231)),ZEXT416((uint)(fVar207 - fVar231)),0);
  local_3e0._16_16_ = auVar147;
  local_3e0._0_16_ = auVar147;
  local_710 = vpshufd_avx(ZEXT416(uVar92),0);
  local_720 = vpshufd_avx(ZEXT416(*(uint *)(local_8b0 + lVar95 * 4 + 6)),0);
  register0x00001390 = auVar211;
  _local_940 = auVar211;
  auVar311 = ZEXT3264(_local_940);
  uVar93 = 0;
  uVar96 = 1;
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  local_4e0 = vandps_avx(local_3a0,auVar118);
  auVar147 = vsqrtss_avx(local_960,local_960);
  local_b04 = auVar147._0_4_;
  auVar147 = vsqrtss_avx(local_960,local_960);
  local_b08 = auVar147._0_4_;
  auVar337 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    local_a00 = auVar337._0_16_;
    auVar147 = vmovshdup_avx(local_a00);
    fVar229 = auVar147._0_4_ - auVar337._0_4_;
    auVar147 = vshufps_avx(local_a00,local_a00,0);
    local_9a0._16_16_ = auVar147;
    local_9a0._0_16_ = auVar147;
    auVar214 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
    local_920._16_16_ = auVar214;
    local_920._0_16_ = auVar214;
    fVar144 = auVar214._0_4_;
    fVar182 = auVar214._4_4_;
    fVar183 = auVar214._8_4_;
    fVar185 = auVar214._12_4_;
    fVar99 = auVar147._0_4_;
    auVar166._0_4_ = fVar99 + fVar144 * 0.0;
    fVar127 = auVar147._4_4_;
    auVar166._4_4_ = fVar127 + fVar182 * 0.14285715;
    fVar130 = auVar147._8_4_;
    auVar166._8_4_ = fVar130 + fVar183 * 0.2857143;
    fVar133 = auVar147._12_4_;
    auVar166._12_4_ = fVar133 + fVar185 * 0.42857146;
    auVar166._16_4_ = fVar99 + fVar144 * 0.5714286;
    auVar166._20_4_ = fVar127 + fVar182 * 0.71428573;
    auVar166._24_4_ = fVar130 + fVar183 * 0.8571429;
    auVar166._28_4_ = fVar133 + fVar185;
    auVar114 = vsubps_avx(auVar250._0_32_,auVar166);
    fVar230 = auVar114._0_4_;
    fVar231 = auVar114._4_4_;
    fVar232 = auVar114._8_4_;
    fVar233 = auVar114._12_4_;
    fVar234 = auVar114._16_4_;
    fVar235 = auVar114._20_4_;
    fVar251 = auVar114._24_4_;
    fVar286 = auVar228._28_4_;
    fVar297 = (float)local_2a0._0_4_ * auVar166._0_4_ + (float)local_220._0_4_ * fVar230;
    fVar312 = (float)local_2a0._4_4_ * auVar166._4_4_ + (float)local_220._4_4_ * fVar231;
    fVar314 = fStack_298 * auVar166._8_4_ + fStack_218 * fVar232;
    fVar316 = fStack_294 * auVar166._12_4_ + fStack_214 * fVar233;
    fVar318 = fStack_290 * auVar166._16_4_ + fStack_210 * fVar234;
    fVar320 = fStack_28c * auVar166._20_4_ + fStack_20c * fVar235;
    fVar322 = fStack_288 * auVar166._24_4_ + fStack_208 * fVar251;
    fVar252 = (float)local_2c0._0_4_ * auVar166._0_4_ + (float)local_240._0_4_ * fVar230;
    fVar254 = (float)local_2c0._4_4_ * auVar166._4_4_ + (float)local_240._4_4_ * fVar231;
    fVar256 = fStack_2b8 * auVar166._8_4_ + fStack_238 * fVar232;
    fVar259 = fStack_2b4 * auVar166._12_4_ + fStack_234 * fVar233;
    fVar262 = fStack_2b0 * auVar166._16_4_ + fStack_230 * fVar234;
    fVar265 = fStack_2ac * auVar166._20_4_ + fStack_22c * fVar235;
    fVar284 = fStack_2a8 * auVar166._24_4_ + fStack_228 * fVar251;
    fVar288 = (float)local_2e0._0_4_ * auVar166._0_4_ + (float)local_260._0_4_ * fVar230;
    fVar290 = (float)local_2e0._4_4_ * auVar166._4_4_ + (float)local_260._4_4_ * fVar231;
    fVar292 = fStack_2d8 * auVar166._8_4_ + fStack_258 * fVar232;
    fVar294 = fStack_2d4 * auVar166._12_4_ + fStack_254 * fVar233;
    fVar257 = fStack_2d0 * auVar166._16_4_ + fStack_250 * fVar234;
    fVar260 = fStack_2cc * auVar166._20_4_ + fStack_24c * fVar235;
    fVar263 = fStack_2c8 * auVar166._24_4_ + fStack_248 * fVar251;
    fVar266 = (float)local_300._0_4_ * auVar166._0_4_ + (float)local_280._0_4_ * fVar230;
    fVar285 = (float)local_300._4_4_ * auVar166._4_4_ + (float)local_280._4_4_ * fVar231;
    fVar287 = fStack_2f8 * auVar166._8_4_ + fStack_278 * fVar232;
    fVar289 = fStack_2f4 * auVar166._12_4_ + fStack_274 * fVar233;
    fVar291 = fStack_2f0 * auVar166._16_4_ + fStack_270 * fVar234;
    fVar293 = fStack_2ec * auVar166._20_4_ + fStack_26c * fVar235;
    fVar295 = fStack_2e8 * auVar166._24_4_ + fStack_268 * fVar251;
    fVar387 = auVar386._28_4_;
    fVar419 = fVar387 + fStack_224;
    fVar398 = fStack_204 + fVar387;
    auVar366._0_4_ =
         ((float)local_220._0_4_ * auVar166._0_4_ + fVar230 * (float)local_1a0._0_4_) * fVar230 +
         auVar166._0_4_ * fVar297;
    auVar366._4_4_ =
         ((float)local_220._4_4_ * auVar166._4_4_ + fVar231 * (float)local_1a0._4_4_) * fVar231 +
         auVar166._4_4_ * fVar312;
    auVar366._8_4_ =
         (fStack_218 * auVar166._8_4_ + fVar232 * fStack_198) * fVar232 + auVar166._8_4_ * fVar314;
    auVar366._12_4_ =
         (fStack_214 * auVar166._12_4_ + fVar233 * fStack_194) * fVar233 + auVar166._12_4_ * fVar316
    ;
    auVar366._16_4_ =
         (fStack_210 * auVar166._16_4_ + fVar234 * fStack_190) * fVar234 + auVar166._16_4_ * fVar318
    ;
    auVar366._20_4_ =
         (fStack_20c * auVar166._20_4_ + fVar235 * fStack_18c) * fVar235 + auVar166._20_4_ * fVar320
    ;
    auVar366._24_4_ =
         (fStack_208 * auVar166._24_4_ + fVar251 * fStack_188) * fVar251 + auVar166._24_4_ * fVar322
    ;
    auVar366._28_4_ = fStack_2e4 + fVar387;
    auVar372._0_4_ =
         fVar230 * ((float)local_240._0_4_ * auVar166._0_4_ + fVar230 * (float)local_1c0._0_4_) +
         auVar166._0_4_ * fVar252;
    auVar372._4_4_ =
         fVar231 * ((float)local_240._4_4_ * auVar166._4_4_ + fVar231 * (float)local_1c0._4_4_) +
         auVar166._4_4_ * fVar254;
    auVar372._8_4_ =
         fVar232 * (fStack_238 * auVar166._8_4_ + fVar232 * fStack_1b8) + auVar166._8_4_ * fVar256;
    auVar372._12_4_ =
         fVar233 * (fStack_234 * auVar166._12_4_ + fVar233 * fStack_1b4) + auVar166._12_4_ * fVar259
    ;
    auVar372._16_4_ =
         fVar234 * (fStack_230 * auVar166._16_4_ + fVar234 * fStack_1b0) + auVar166._16_4_ * fVar262
    ;
    auVar372._20_4_ =
         fVar235 * (fStack_22c * auVar166._20_4_ + fVar235 * fStack_1ac) + auVar166._20_4_ * fVar265
    ;
    auVar372._24_4_ =
         fVar251 * (fStack_228 * auVar166._24_4_ + fVar251 * fStack_1a8) + auVar166._24_4_ * fVar284
    ;
    auVar372._28_4_ = fVar286 + auVar337._28_4_ + fVar387;
    auVar384._0_4_ =
         fVar230 * ((float)local_260._0_4_ * auVar166._0_4_ + fVar230 * (float)local_1e0._0_4_) +
         auVar166._0_4_ * fVar288;
    auVar384._4_4_ =
         fVar231 * ((float)local_260._4_4_ * auVar166._4_4_ + fVar231 * (float)local_1e0._4_4_) +
         auVar166._4_4_ * fVar290;
    auVar384._8_4_ =
         fVar232 * (fStack_258 * auVar166._8_4_ + fVar232 * fStack_1d8) + auVar166._8_4_ * fVar292;
    auVar384._12_4_ =
         fVar233 * (fStack_254 * auVar166._12_4_ + fVar233 * fStack_1d4) + auVar166._12_4_ * fVar294
    ;
    auVar384._16_4_ =
         fVar234 * (fStack_250 * auVar166._16_4_ + fVar234 * fStack_1d0) + auVar166._16_4_ * fVar257
    ;
    auVar384._20_4_ =
         fVar235 * (fStack_24c * auVar166._20_4_ + fVar235 * fStack_1cc) + auVar166._20_4_ * fVar260
    ;
    auVar384._24_4_ =
         fVar251 * (fStack_248 * auVar166._24_4_ + fVar251 * fStack_1c8) + auVar166._24_4_ * fVar263
    ;
    auVar384._28_4_ = fStack_2c4 + fVar387;
    auVar331._0_4_ =
         auVar166._0_4_ * fVar266 +
         fVar230 * ((float)local_280._0_4_ * auVar166._0_4_ + fVar230 * (float)local_200._0_4_);
    auVar331._4_4_ =
         auVar166._4_4_ * fVar285 +
         fVar231 * ((float)local_280._4_4_ * auVar166._4_4_ + fVar231 * (float)local_200._4_4_);
    auVar331._8_4_ =
         auVar166._8_4_ * fVar287 + fVar232 * (fStack_278 * auVar166._8_4_ + fVar232 * fStack_1f8);
    auVar331._12_4_ =
         auVar166._12_4_ * fVar289 + fVar233 * (fStack_274 * auVar166._12_4_ + fVar233 * fStack_1f4)
    ;
    auVar331._16_4_ =
         auVar166._16_4_ * fVar291 + fVar234 * (fStack_270 * auVar166._16_4_ + fVar234 * fStack_1f0)
    ;
    auVar331._20_4_ =
         auVar166._20_4_ * fVar293 + fVar235 * (fStack_26c * auVar166._20_4_ + fVar235 * fStack_1ec)
    ;
    auVar331._24_4_ =
         auVar166._24_4_ * fVar295 + fVar251 * (fStack_268 * auVar166._24_4_ + fVar251 * fStack_1e8)
    ;
    auVar331._28_4_ = fStack_2c4 + fStack_2a4;
    auVar421._0_4_ =
         (auVar166._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar230) *
         auVar166._0_4_ + fVar230 * fVar297;
    auVar421._4_4_ =
         (auVar166._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar231) *
         auVar166._4_4_ + fVar231 * fVar312;
    auVar421._8_4_ =
         (auVar166._8_4_ * fStack_318 + fStack_298 * fVar232) * auVar166._8_4_ + fVar232 * fVar314;
    auVar421._12_4_ =
         (auVar166._12_4_ * fStack_314 + fStack_294 * fVar233) * auVar166._12_4_ + fVar233 * fVar316
    ;
    auVar421._16_4_ =
         (auVar166._16_4_ * fStack_310 + fStack_290 * fVar234) * auVar166._16_4_ + fVar234 * fVar318
    ;
    auVar421._20_4_ =
         (auVar166._20_4_ * fStack_30c + fStack_28c * fVar235) * auVar166._20_4_ + fVar235 * fVar320
    ;
    auVar421._24_4_ =
         (auVar166._24_4_ * fStack_308 + fStack_288 * fVar251) * auVar166._24_4_ + fVar251 * fVar322
    ;
    auVar421._28_4_ = fStack_2c4 + fVar286 + auVar311._28_4_;
    auVar222._0_4_ =
         (auVar166._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar230) *
         auVar166._0_4_ + fVar230 * fVar252;
    auVar222._4_4_ =
         (auVar166._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar231) *
         auVar166._4_4_ + fVar231 * fVar254;
    auVar222._8_4_ =
         (auVar166._8_4_ * fStack_338 + fStack_2b8 * fVar232) * auVar166._8_4_ + fVar232 * fVar256;
    auVar222._12_4_ =
         (auVar166._12_4_ * fStack_334 + fStack_2b4 * fVar233) * auVar166._12_4_ + fVar233 * fVar259
    ;
    auVar222._16_4_ =
         (auVar166._16_4_ * fStack_330 + fStack_2b0 * fVar234) * auVar166._16_4_ + fVar234 * fVar262
    ;
    auVar222._20_4_ =
         (auVar166._20_4_ * fStack_32c + fStack_2ac * fVar235) * auVar166._20_4_ + fVar235 * fVar265
    ;
    auVar222._24_4_ =
         (auVar166._24_4_ * fStack_328 + fStack_2a8 * fVar251) * auVar166._24_4_ + fVar251 * fVar284
    ;
    auVar222._28_4_ = fStack_2c4 + auVar250._28_4_ + fVar286;
    auVar246._0_4_ =
         auVar166._0_4_ *
         (auVar166._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar230) +
         fVar230 * fVar288;
    auVar246._4_4_ =
         auVar166._4_4_ *
         (auVar166._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar231) +
         fVar231 * fVar290;
    auVar246._8_4_ =
         auVar166._8_4_ * (auVar166._8_4_ * fStack_358 + fStack_2d8 * fVar232) + fVar232 * fVar292;
    auVar246._12_4_ =
         auVar166._12_4_ * (auVar166._12_4_ * fStack_354 + fStack_2d4 * fVar233) + fVar233 * fVar294
    ;
    auVar246._16_4_ =
         auVar166._16_4_ * (auVar166._16_4_ * fStack_350 + fStack_2d0 * fVar234) + fVar234 * fVar257
    ;
    auVar246._20_4_ =
         auVar166._20_4_ * (auVar166._20_4_ * fStack_34c + fStack_2cc * fVar235) + fVar235 * fVar260
    ;
    auVar246._24_4_ =
         auVar166._24_4_ * (auVar166._24_4_ * fStack_348 + fStack_2c8 * fVar251) + fVar251 * fVar263
    ;
    auVar246._28_4_ = fVar398 + auVar250._28_4_ + 1.0;
    auVar276._0_4_ =
         (auVar166._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar230) *
         auVar166._0_4_ + fVar230 * fVar266;
    auVar276._4_4_ =
         (auVar166._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar231) *
         auVar166._4_4_ + fVar231 * fVar285;
    auVar276._8_4_ =
         (auVar166._8_4_ * fStack_378 + fStack_2f8 * fVar232) * auVar166._8_4_ + fVar232 * fVar287;
    auVar276._12_4_ =
         (auVar166._12_4_ * fStack_374 + fStack_2f4 * fVar233) * auVar166._12_4_ + fVar233 * fVar289
    ;
    auVar276._16_4_ =
         (auVar166._16_4_ * fStack_370 + fStack_2f0 * fVar234) * auVar166._16_4_ + fVar234 * fVar291
    ;
    auVar276._20_4_ =
         (auVar166._20_4_ * fStack_36c + fStack_2ec * fVar235) * auVar166._20_4_ + fVar235 * fVar293
    ;
    auVar276._24_4_ =
         (auVar166._24_4_ * fStack_368 + fStack_2e8 * fVar251) * auVar166._24_4_ + fVar251 * fVar295
    ;
    auVar276._28_4_ = fVar419 + fVar387 + 1.0;
    fVar100 = auVar366._0_4_ * fVar230 + auVar421._0_4_ * auVar166._0_4_;
    fVar128 = auVar366._4_4_ * fVar231 + auVar421._4_4_ * auVar166._4_4_;
    fVar131 = auVar366._8_4_ * fVar232 + auVar421._8_4_ * auVar166._8_4_;
    fVar134 = auVar366._12_4_ * fVar233 + auVar421._12_4_ * auVar166._12_4_;
    fVar136 = auVar366._16_4_ * fVar234 + auVar421._16_4_ * auVar166._16_4_;
    fVar138 = auVar366._20_4_ * fVar235 + auVar421._20_4_ * auVar166._20_4_;
    fVar140 = auVar366._24_4_ * fVar251 + auVar421._24_4_ * auVar166._24_4_;
    fVar142 = fVar419 + fStack_2c4;
    fVar101 = auVar372._0_4_ * fVar230 + auVar166._0_4_ * auVar222._0_4_;
    fVar129 = auVar372._4_4_ * fVar231 + auVar166._4_4_ * auVar222._4_4_;
    fVar132 = auVar372._8_4_ * fVar232 + auVar166._8_4_ * auVar222._8_4_;
    fVar135 = auVar372._12_4_ * fVar233 + auVar166._12_4_ * auVar222._12_4_;
    fVar137 = auVar372._16_4_ * fVar234 + auVar166._16_4_ * auVar222._16_4_;
    fVar139 = auVar372._20_4_ * fVar235 + auVar166._20_4_ * auVar222._20_4_;
    fVar141 = auVar372._24_4_ * fVar251 + auVar166._24_4_ * auVar222._24_4_;
    fVar143 = fStack_2c4 + fVar398;
    local_540._0_4_ = auVar384._0_4_ * fVar230 + auVar166._0_4_ * auVar246._0_4_;
    local_540._4_4_ = auVar384._4_4_ * fVar231 + auVar166._4_4_ * auVar246._4_4_;
    local_540._8_4_ = auVar384._8_4_ * fVar232 + auVar166._8_4_ * auVar246._8_4_;
    local_540._12_4_ = auVar384._12_4_ * fVar233 + auVar166._12_4_ * auVar246._12_4_;
    local_540._16_4_ = auVar384._16_4_ * fVar234 + auVar166._16_4_ * auVar246._16_4_;
    local_540._20_4_ = auVar384._20_4_ * fVar235 + auVar166._20_4_ * auVar246._20_4_;
    local_540._24_4_ = auVar384._24_4_ * fVar251 + auVar166._24_4_ * auVar246._24_4_;
    local_540._28_4_ = fVar398 + fStack_2c4;
    local_740._0_4_ = fVar230 * auVar331._0_4_ + auVar166._0_4_ * auVar276._0_4_;
    local_740._4_4_ = fVar231 * auVar331._4_4_ + auVar166._4_4_ * auVar276._4_4_;
    local_740._8_4_ = fVar232 * auVar331._8_4_ + auVar166._8_4_ * auVar276._8_4_;
    local_740._12_4_ = fVar233 * auVar331._12_4_ + auVar166._12_4_ * auVar276._12_4_;
    local_740._16_4_ = fVar234 * auVar331._16_4_ + auVar166._16_4_ * auVar276._16_4_;
    local_740._20_4_ = fVar235 * auVar331._20_4_ + auVar166._20_4_ * auVar276._20_4_;
    local_740._24_4_ = fVar251 * auVar331._24_4_ + auVar166._24_4_ * auVar276._24_4_;
    local_740._28_4_ = auVar114._28_4_ + auVar166._28_4_;
    auVar14 = vsubps_avx(auVar421,auVar366);
    auVar114 = vsubps_avx(auVar222,auVar372);
    auVar353 = vsubps_avx(auVar246,auVar384);
    auVar15 = vsubps_avx(auVar276,auVar331);
    auVar147 = vshufps_avx(ZEXT416((uint)(fVar229 * 0.04761905)),
                           ZEXT416((uint)(fVar229 * 0.04761905)),0);
    fVar257 = auVar147._0_4_;
    fVar324 = fVar257 * auVar14._0_4_ * 3.0;
    fVar260 = auVar147._4_4_;
    fVar338 = fVar260 * auVar14._4_4_ * 3.0;
    local_9c0._4_4_ = fVar338;
    local_9c0._0_4_ = fVar324;
    fVar291 = auVar147._8_4_;
    fVar339 = fVar291 * auVar14._8_4_ * 3.0;
    fStack_9b8 = fVar339;
    fVar284 = auVar147._12_4_;
    fVar341 = fVar284 * auVar14._12_4_ * 3.0;
    fStack_9b4 = fVar341;
    fVar343 = fVar257 * auVar14._16_4_ * 3.0;
    unique0x1000a60c = fVar343;
    fVar345 = fVar260 * auVar14._20_4_ * 3.0;
    unique0x1000a610 = fVar345;
    fVar347 = fVar291 * auVar14._24_4_ * 3.0;
    unique0x1000a614 = fVar347;
    unique0x1000a618 = auVar331._28_4_;
    fVar388 = fVar257 * auVar114._0_4_ * 3.0;
    fVar392 = fVar260 * auVar114._4_4_ * 3.0;
    local_b00._4_4_ = fVar392;
    local_b00._0_4_ = fVar388;
    fVar393 = fVar291 * auVar114._8_4_ * 3.0;
    local_b00._8_4_ = fVar393;
    fVar394 = fVar284 * auVar114._12_4_ * 3.0;
    local_b00._12_4_ = fVar394;
    fVar395 = fVar257 * auVar114._16_4_ * 3.0;
    local_b00._16_4_ = fVar395;
    fVar396 = fVar260 * auVar114._20_4_ * 3.0;
    local_b00._20_4_ = fVar396;
    fVar397 = fVar291 * auVar114._24_4_ * 3.0;
    local_b00._24_4_ = fVar397;
    local_b00._28_4_ = fVar398;
    fVar399 = fVar257 * auVar353._0_4_ * 3.0;
    fVar406 = fVar260 * auVar353._4_4_ * 3.0;
    auVar26._4_4_ = fVar406;
    auVar26._0_4_ = fVar399;
    fVar409 = fVar291 * auVar353._8_4_ * 3.0;
    auVar26._8_4_ = fVar409;
    fVar411 = fVar284 * auVar353._12_4_ * 3.0;
    auVar26._12_4_ = fVar411;
    fVar413 = fVar257 * auVar353._16_4_ * 3.0;
    auVar26._16_4_ = fVar413;
    fVar415 = fVar260 * auVar353._20_4_ * 3.0;
    auVar26._20_4_ = fVar415;
    fVar417 = fVar291 * auVar353._24_4_ * 3.0;
    auVar26._24_4_ = fVar417;
    auVar26._28_4_ = fVar419;
    fVar235 = fVar257 * auVar15._0_4_ * 3.0;
    fVar251 = fVar260 * auVar15._4_4_ * 3.0;
    auVar27._4_4_ = fVar251;
    auVar27._0_4_ = fVar235;
    fVar265 = fVar291 * auVar15._8_4_ * 3.0;
    auVar27._8_4_ = fVar265;
    fVar284 = fVar284 * auVar15._12_4_ * 3.0;
    auVar27._12_4_ = fVar284;
    fVar257 = fVar257 * auVar15._16_4_ * 3.0;
    auVar27._16_4_ = fVar257;
    fVar260 = fVar260 * auVar15._20_4_ * 3.0;
    auVar27._20_4_ = fVar260;
    fVar291 = fVar291 * auVar15._24_4_ * 3.0;
    auVar27._24_4_ = fVar291;
    auVar27._28_4_ = auVar14._28_4_;
    auVar84._4_4_ = fVar129;
    auVar84._0_4_ = fVar101;
    auVar84._8_4_ = fVar132;
    auVar84._12_4_ = fVar135;
    auVar84._16_4_ = fVar137;
    auVar84._20_4_ = fVar139;
    auVar84._24_4_ = fVar141;
    auVar84._28_4_ = fVar143;
    auVar114 = vperm2f128_avx(auVar84,auVar84,1);
    auVar114 = vshufps_avx(auVar114,auVar84,0x30);
    auVar15 = vshufps_avx(auVar84,auVar114,0x29);
    auVar114 = vperm2f128_avx(local_540,local_540,1);
    auVar114 = vshufps_avx(auVar114,local_540,0x30);
    local_a40 = vshufps_avx(local_540,auVar114,0x29);
    auVar353 = vsubps_avx(local_740,auVar27);
    auVar114 = vperm2f128_avx(auVar353,auVar353,1);
    auVar114 = vshufps_avx(auVar114,auVar353,0x30);
    local_760 = vshufps_avx(auVar353,auVar114,0x29);
    local_580 = vsubps_avx(auVar15,auVar84);
    local_560 = vsubps_avx(local_a40,local_540);
    fVar230 = local_580._0_4_;
    fVar252 = local_580._4_4_;
    auVar28._4_4_ = fVar406 * fVar252;
    auVar28._0_4_ = fVar399 * fVar230;
    fVar286 = local_580._8_4_;
    auVar28._8_4_ = fVar409 * fVar286;
    fVar263 = local_580._12_4_;
    auVar28._12_4_ = fVar411 * fVar263;
    fVar295 = local_580._16_4_;
    auVar28._16_4_ = fVar413 * fVar295;
    fVar322 = local_580._20_4_;
    auVar28._20_4_ = fVar415 * fVar322;
    fVar19 = local_580._24_4_;
    auVar28._24_4_ = fVar417 * fVar19;
    auVar28._28_4_ = auVar353._28_4_;
    fVar231 = local_560._0_4_;
    fVar254 = local_560._4_4_;
    auVar29._4_4_ = fVar392 * fVar254;
    auVar29._0_4_ = fVar388 * fVar231;
    fVar288 = local_560._8_4_;
    auVar29._8_4_ = fVar393 * fVar288;
    fVar266 = local_560._12_4_;
    auVar29._12_4_ = fVar394 * fVar266;
    fVar297 = local_560._16_4_;
    auVar29._16_4_ = fVar395 * fVar297;
    fVar387 = local_560._20_4_;
    auVar29._20_4_ = fVar396 * fVar387;
    fVar20 = local_560._24_4_;
    auVar29._24_4_ = fVar397 * fVar20;
    auVar29._28_4_ = auVar114._28_4_;
    auVar405 = vsubps_avx(auVar29,auVar28);
    auVar82._4_4_ = fVar128;
    auVar82._0_4_ = fVar100;
    auVar82._8_4_ = fVar131;
    auVar82._12_4_ = fVar134;
    auVar82._16_4_ = fVar136;
    auVar82._20_4_ = fVar138;
    auVar82._24_4_ = fVar140;
    auVar82._28_4_ = fVar142;
    auVar114 = vperm2f128_avx(auVar82,auVar82,1);
    auVar114 = vshufps_avx(auVar114,auVar82,0x30);
    auVar16 = vshufps_avx(auVar82,auVar114,0x29);
    local_5a0 = vsubps_avx(auVar16,auVar82);
    auVar30._4_4_ = fVar254 * fVar338;
    auVar30._0_4_ = fVar231 * fVar324;
    auVar30._8_4_ = fVar288 * fVar339;
    auVar30._12_4_ = fVar266 * fVar341;
    auVar30._16_4_ = fVar297 * fVar343;
    auVar30._20_4_ = fVar387 * fVar345;
    auVar30._24_4_ = fVar20 * fVar347;
    auVar30._28_4_ = auVar114._28_4_;
    fVar232 = local_5a0._0_4_;
    fVar256 = local_5a0._4_4_;
    auVar31._4_4_ = fVar406 * fVar256;
    auVar31._0_4_ = fVar399 * fVar232;
    fVar290 = local_5a0._8_4_;
    auVar31._8_4_ = fVar409 * fVar290;
    fVar285 = local_5a0._12_4_;
    auVar31._12_4_ = fVar411 * fVar285;
    fVar312 = local_5a0._16_4_;
    auVar31._16_4_ = fVar413 * fVar312;
    fVar419 = local_5a0._20_4_;
    auVar31._20_4_ = fVar415 * fVar419;
    fVar21 = local_5a0._24_4_;
    auVar31._24_4_ = fVar417 * fVar21;
    auVar31._28_4_ = fVar142;
    auVar17 = vsubps_avx(auVar31,auVar30);
    auVar32._4_4_ = fVar392 * fVar256;
    auVar32._0_4_ = fVar388 * fVar232;
    auVar32._8_4_ = fVar393 * fVar290;
    auVar32._12_4_ = fVar394 * fVar285;
    auVar32._16_4_ = fVar395 * fVar312;
    auVar32._20_4_ = fVar396 * fVar419;
    auVar32._24_4_ = fVar397 * fVar21;
    auVar32._28_4_ = fVar142;
    auVar33._4_4_ = fVar252 * fVar338;
    auVar33._0_4_ = fVar230 * fVar324;
    auVar33._8_4_ = fVar286 * fVar339;
    auVar33._12_4_ = fVar263 * fVar341;
    auVar33._16_4_ = fVar295 * fVar343;
    auVar33._20_4_ = fVar322 * fVar345;
    auVar33._24_4_ = fVar19 * fVar347;
    auVar33._28_4_ = auVar372._28_4_;
    auVar308 = vsubps_avx(auVar33,auVar32);
    fVar229 = auVar308._28_4_;
    fVar293 = auVar17._28_4_ + fVar229;
    auVar223._0_4_ = fVar232 * fVar232 + fVar230 * fVar230 + fVar231 * fVar231;
    auVar223._4_4_ = fVar256 * fVar256 + fVar252 * fVar252 + fVar254 * fVar254;
    auVar223._8_4_ = fVar290 * fVar290 + fVar286 * fVar286 + fVar288 * fVar288;
    auVar223._12_4_ = fVar285 * fVar285 + fVar263 * fVar263 + fVar266 * fVar266;
    auVar223._16_4_ = fVar312 * fVar312 + fVar295 * fVar295 + fVar297 * fVar297;
    auVar223._20_4_ = fVar419 * fVar419 + fVar322 * fVar322 + fVar387 * fVar387;
    auVar223._24_4_ = fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20;
    auVar223._28_4_ = fVar229 + fVar229 + fVar293;
    auVar114 = vrcpps_avx(auVar223);
    fVar318 = auVar114._0_4_;
    fVar320 = auVar114._4_4_;
    auVar34._4_4_ = fVar320 * auVar223._4_4_;
    auVar34._0_4_ = fVar318 * auVar223._0_4_;
    fVar253 = auVar114._8_4_;
    auVar34._8_4_ = fVar253 * auVar223._8_4_;
    fVar255 = auVar114._12_4_;
    auVar34._12_4_ = fVar255 * auVar223._12_4_;
    fVar258 = auVar114._16_4_;
    auVar34._16_4_ = fVar258 * auVar223._16_4_;
    fVar261 = auVar114._20_4_;
    auVar34._20_4_ = fVar261 * auVar223._20_4_;
    fVar264 = auVar114._24_4_;
    auVar34._24_4_ = fVar264 * auVar223._24_4_;
    auVar34._28_4_ = auVar372._28_4_;
    auVar119._8_4_ = 0x3f800000;
    auVar119._0_8_ = &DAT_3f8000003f800000;
    auVar119._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar18 = vsubps_avx(auVar119,auVar34);
    fVar318 = auVar18._0_4_ * fVar318 + fVar318;
    fVar320 = auVar18._4_4_ * fVar320 + fVar320;
    fVar253 = auVar18._8_4_ * fVar253 + fVar253;
    fVar255 = auVar18._12_4_ * fVar255 + fVar255;
    fVar258 = auVar18._16_4_ * fVar258 + fVar258;
    fVar261 = auVar18._20_4_ * fVar261 + fVar261;
    fVar264 = auVar18._24_4_ * fVar264 + fVar264;
    auVar353 = vperm2f128_avx(local_b00,local_b00,1);
    auVar353 = vshufps_avx(auVar353,local_b00,0x30);
    local_980 = vshufps_avx(local_b00,auVar353,0x29);
    auVar353 = vperm2f128_avx(auVar26,auVar26,1);
    auVar353 = vshufps_avx(auVar353,auVar26,0x30);
    local_900 = vshufps_avx(auVar26,auVar353,0x29);
    fVar400 = local_900._0_4_;
    fVar407 = local_900._4_4_;
    auVar35._4_4_ = fVar407 * fVar252;
    auVar35._0_4_ = fVar400 * fVar230;
    fVar410 = local_900._8_4_;
    auVar35._8_4_ = fVar410 * fVar286;
    fVar412 = local_900._12_4_;
    auVar35._12_4_ = fVar412 * fVar263;
    fVar414 = local_900._16_4_;
    auVar35._16_4_ = fVar414 * fVar295;
    fVar416 = local_900._20_4_;
    auVar35._20_4_ = fVar416 * fVar322;
    fVar418 = local_900._24_4_;
    auVar35._24_4_ = fVar418 * fVar19;
    auVar35._28_4_ = auVar353._28_4_;
    fVar233 = local_980._0_4_;
    fVar259 = local_980._4_4_;
    auVar36._4_4_ = fVar254 * fVar259;
    auVar36._0_4_ = fVar231 * fVar233;
    fVar292 = local_980._8_4_;
    auVar36._8_4_ = fVar288 * fVar292;
    fVar287 = local_980._12_4_;
    auVar36._12_4_ = fVar266 * fVar287;
    fVar314 = local_980._16_4_;
    auVar36._16_4_ = fVar297 * fVar314;
    fVar296 = local_980._20_4_;
    auVar36._20_4_ = fVar387 * fVar296;
    fVar22 = local_980._24_4_;
    auVar36._24_4_ = fVar20 * fVar22;
    auVar36._28_4_ = fVar398;
    auVar24 = vsubps_avx(auVar36,auVar35);
    auVar353 = vperm2f128_avx(_local_9c0,_local_9c0,1);
    auVar353 = vshufps_avx(auVar353,_local_9c0,0x30);
    local_a20 = vshufps_avx(_local_9c0,auVar353,0x29);
    fVar234 = local_a20._0_4_;
    fVar262 = local_a20._4_4_;
    auVar37._4_4_ = fVar254 * fVar262;
    auVar37._0_4_ = fVar231 * fVar234;
    fVar294 = local_a20._8_4_;
    auVar37._8_4_ = fVar288 * fVar294;
    fVar289 = local_a20._12_4_;
    auVar37._12_4_ = fVar266 * fVar289;
    fVar316 = local_a20._16_4_;
    auVar37._16_4_ = fVar297 * fVar316;
    fVar398 = local_a20._20_4_;
    auVar37._20_4_ = fVar387 * fVar398;
    fVar23 = local_a20._24_4_;
    auVar37._24_4_ = fVar20 * fVar23;
    auVar37._28_4_ = auVar353._28_4_;
    auVar38._4_4_ = fVar407 * fVar256;
    auVar38._0_4_ = fVar400 * fVar232;
    auVar38._8_4_ = fVar410 * fVar290;
    auVar38._12_4_ = fVar412 * fVar285;
    auVar38._16_4_ = fVar414 * fVar312;
    auVar38._20_4_ = fVar416 * fVar419;
    uVar12 = local_900._28_4_;
    auVar38._24_4_ = fVar418 * fVar21;
    auVar38._28_4_ = uVar12;
    auVar25 = vsubps_avx(auVar38,auVar37);
    auVar39._4_4_ = fVar256 * fVar259;
    auVar39._0_4_ = fVar232 * fVar233;
    auVar39._8_4_ = fVar290 * fVar292;
    auVar39._12_4_ = fVar285 * fVar287;
    auVar39._16_4_ = fVar312 * fVar314;
    auVar39._20_4_ = fVar419 * fVar296;
    auVar39._24_4_ = fVar21 * fVar22;
    auVar39._28_4_ = uVar12;
    auVar40._4_4_ = fVar252 * fVar262;
    auVar40._0_4_ = fVar230 * fVar234;
    auVar40._8_4_ = fVar286 * fVar294;
    auVar40._12_4_ = fVar263 * fVar289;
    auVar40._16_4_ = fVar295 * fVar316;
    auVar40._20_4_ = fVar322 * fVar398;
    auVar40._24_4_ = fVar19 * fVar23;
    auVar40._28_4_ = auVar421._28_4_;
    auVar353 = vsubps_avx(auVar40,auVar39);
    fVar229 = auVar353._28_4_;
    auVar41._4_4_ =
         (auVar405._4_4_ * auVar405._4_4_ +
         auVar17._4_4_ * auVar17._4_4_ + auVar308._4_4_ * auVar308._4_4_) * fVar320;
    auVar41._0_4_ =
         (auVar405._0_4_ * auVar405._0_4_ +
         auVar17._0_4_ * auVar17._0_4_ + auVar308._0_4_ * auVar308._0_4_) * fVar318;
    auVar41._8_4_ =
         (auVar405._8_4_ * auVar405._8_4_ +
         auVar17._8_4_ * auVar17._8_4_ + auVar308._8_4_ * auVar308._8_4_) * fVar253;
    auVar41._12_4_ =
         (auVar405._12_4_ * auVar405._12_4_ +
         auVar17._12_4_ * auVar17._12_4_ + auVar308._12_4_ * auVar308._12_4_) * fVar255;
    auVar41._16_4_ =
         (auVar405._16_4_ * auVar405._16_4_ +
         auVar17._16_4_ * auVar17._16_4_ + auVar308._16_4_ * auVar308._16_4_) * fVar258;
    auVar41._20_4_ =
         (auVar405._20_4_ * auVar405._20_4_ +
         auVar17._20_4_ * auVar17._20_4_ + auVar308._20_4_ * auVar308._20_4_) * fVar261;
    auVar41._24_4_ =
         (auVar405._24_4_ * auVar405._24_4_ +
         auVar17._24_4_ * auVar17._24_4_ + auVar308._24_4_ * auVar308._24_4_) * fVar264;
    auVar41._28_4_ = auVar405._28_4_ + fVar293;
    auVar42._4_4_ =
         (auVar24._4_4_ * auVar24._4_4_ +
         auVar25._4_4_ * auVar25._4_4_ + auVar353._4_4_ * auVar353._4_4_) * fVar320;
    auVar42._0_4_ =
         (auVar24._0_4_ * auVar24._0_4_ +
         auVar25._0_4_ * auVar25._0_4_ + auVar353._0_4_ * auVar353._0_4_) * fVar318;
    auVar42._8_4_ =
         (auVar24._8_4_ * auVar24._8_4_ +
         auVar25._8_4_ * auVar25._8_4_ + auVar353._8_4_ * auVar353._8_4_) * fVar253;
    auVar42._12_4_ =
         (auVar24._12_4_ * auVar24._12_4_ +
         auVar25._12_4_ * auVar25._12_4_ + auVar353._12_4_ * auVar353._12_4_) * fVar255;
    auVar42._16_4_ =
         (auVar24._16_4_ * auVar24._16_4_ +
         auVar25._16_4_ * auVar25._16_4_ + auVar353._16_4_ * auVar353._16_4_) * fVar258;
    auVar42._20_4_ =
         (auVar24._20_4_ * auVar24._20_4_ +
         auVar25._20_4_ * auVar25._20_4_ + auVar353._20_4_ * auVar353._20_4_) * fVar261;
    auVar42._24_4_ =
         (auVar24._24_4_ * auVar24._24_4_ +
         auVar25._24_4_ * auVar25._24_4_ + auVar353._24_4_ * auVar353._24_4_) * fVar264;
    auVar42._28_4_ = auVar18._28_4_ + auVar114._28_4_;
    auVar114 = vmaxps_avx(auVar41,auVar42);
    auVar353 = vperm2f128_avx(local_740,local_740,1);
    auVar353 = vshufps_avx(auVar353,local_740,0x30);
    local_780 = vshufps_avx(local_740,auVar353,0x29);
    local_7a0._0_4_ = (float)local_740._0_4_ + fVar235;
    local_7a0._4_4_ = local_740._4_4_ + fVar251;
    local_7a0._8_4_ = local_740._8_4_ + fVar265;
    local_7a0._12_4_ = local_740._12_4_ + fVar284;
    local_7a0._16_4_ = local_740._16_4_ + fVar257;
    local_7a0._20_4_ = local_740._20_4_ + fVar260;
    local_7a0._24_4_ = local_740._24_4_ + fVar291;
    local_7a0._28_4_ = local_740._28_4_ + auVar14._28_4_;
    auVar353 = vmaxps_avx(local_740,local_7a0);
    auVar14 = vmaxps_avx(local_760,local_780);
    auVar353 = vmaxps_avx(auVar353,auVar14);
    auVar14 = vrsqrtps_avx(auVar223);
    fVar235 = auVar14._0_4_;
    fVar251 = auVar14._4_4_;
    fVar265 = auVar14._8_4_;
    fVar284 = auVar14._12_4_;
    fVar257 = auVar14._16_4_;
    fVar260 = auVar14._20_4_;
    fVar291 = auVar14._24_4_;
    local_420 = fVar235 * 1.5 + fVar235 * fVar235 * fVar235 * auVar223._0_4_ * -0.5;
    fStack_41c = fVar251 * 1.5 + fVar251 * fVar251 * fVar251 * auVar223._4_4_ * -0.5;
    fStack_418 = fVar265 * 1.5 + fVar265 * fVar265 * fVar265 * auVar223._8_4_ * -0.5;
    fStack_414 = fVar284 * 1.5 + fVar284 * fVar284 * fVar284 * auVar223._12_4_ * -0.5;
    fStack_410 = fVar257 * 1.5 + fVar257 * fVar257 * fVar257 * auVar223._16_4_ * -0.5;
    fStack_40c = fVar260 * 1.5 + fVar260 * fVar260 * fVar260 * auVar223._20_4_ * -0.5;
    fStack_408 = fVar291 * 1.5 + fVar291 * fVar291 * fVar291 * auVar223._24_4_ * -0.5;
    fStack_404 = auVar14._28_4_ + auVar223._28_4_;
    auVar85._4_4_ = fVar129;
    auVar85._0_4_ = fVar101;
    auVar85._8_4_ = fVar132;
    auVar85._12_4_ = fVar135;
    auVar85._16_4_ = fVar137;
    auVar85._20_4_ = fVar139;
    auVar85._24_4_ = fVar141;
    auVar85._28_4_ = fVar143;
    local_9e0 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    auVar405 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    fVar424 = auVar405._0_4_;
    fVar426 = auVar405._4_4_;
    fVar427 = auVar405._8_4_;
    fVar428 = auVar405._12_4_;
    fVar429 = auVar405._16_4_;
    fVar430 = auVar405._20_4_;
    fVar431 = auVar405._24_4_;
    fVar235 = local_9e0._0_4_;
    fVar265 = local_9e0._4_4_;
    fVar257 = local_9e0._8_4_;
    fVar291 = local_9e0._12_4_;
    fVar318 = local_9e0._16_4_;
    fVar253 = local_9e0._20_4_;
    fVar258 = local_9e0._24_4_;
    auVar83._4_4_ = fVar128;
    auVar83._0_4_ = fVar100;
    auVar83._8_4_ = fVar131;
    auVar83._12_4_ = fVar134;
    auVar83._16_4_ = fVar136;
    auVar83._20_4_ = fVar138;
    auVar83._24_4_ = fVar140;
    auVar83._28_4_ = fVar142;
    auVar405 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
    fVar251 = auVar405._0_4_;
    fVar284 = auVar405._4_4_;
    fVar260 = auVar405._8_4_;
    fVar293 = auVar405._12_4_;
    fVar320 = auVar405._16_4_;
    fVar255 = auVar405._20_4_;
    fVar261 = auVar405._24_4_;
    auVar390._0_4_ =
         (float)local_7c0._0_4_ * fVar251 +
         (float)local_7e0._0_4_ * fVar235 + fVar424 * (float)local_860._0_4_;
    auVar390._4_4_ =
         (float)local_7c0._4_4_ * fVar284 +
         (float)local_7e0._4_4_ * fVar265 + fVar426 * (float)local_860._4_4_;
    auVar390._8_4_ = fStack_7b8 * fVar260 + fStack_7d8 * fVar257 + fVar427 * fStack_858;
    auVar390._12_4_ = fStack_7b4 * fVar293 + fStack_7d4 * fVar291 + fVar428 * fStack_854;
    auVar390._16_4_ = fStack_7b0 * fVar320 + fStack_7d0 * fVar318 + fVar429 * fStack_850;
    auVar390._20_4_ = fStack_7ac * fVar255 + fStack_7cc * fVar253 + fVar430 * fStack_84c;
    auVar390._24_4_ = fStack_7a8 * fVar261 + fStack_7c8 * fVar258 + fVar431 * fStack_848;
    auVar390._28_4_ = fVar229 + auVar25._28_4_ + fVar229 + auVar14._28_4_;
    auVar403._0_4_ = fVar251 * fVar251 + fVar235 * fVar235 + fVar424 * fVar424;
    auVar403._4_4_ = fVar284 * fVar284 + fVar265 * fVar265 + fVar426 * fVar426;
    auVar403._8_4_ = fVar260 * fVar260 + fVar257 * fVar257 + fVar427 * fVar427;
    auVar403._12_4_ = fVar293 * fVar293 + fVar291 * fVar291 + fVar428 * fVar428;
    auVar403._16_4_ = fVar320 * fVar320 + fVar318 * fVar318 + fVar429 * fVar429;
    auVar403._20_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar430 * fVar430;
    auVar403._24_4_ = fVar261 * fVar261 + fVar258 * fVar258 + fVar431 * fVar431;
    auVar403._28_4_ = auVar421._28_4_ + auVar421._28_4_ + fVar229;
    fVar349 = (float)local_7c0._0_4_ * fVar232 * local_420 +
              fVar230 * local_420 * (float)local_7e0._0_4_ +
              fVar231 * local_420 * (float)local_860._0_4_;
    fVar355 = (float)local_7c0._4_4_ * fVar256 * fStack_41c +
              fVar252 * fStack_41c * (float)local_7e0._4_4_ +
              fVar254 * fStack_41c * (float)local_860._4_4_;
    fVar356 = fStack_7b8 * fVar290 * fStack_418 +
              fVar286 * fStack_418 * fStack_7d8 + fVar288 * fStack_418 * fStack_858;
    fVar357 = fStack_7b4 * fVar285 * fStack_414 +
              fVar263 * fStack_414 * fStack_7d4 + fVar266 * fStack_414 * fStack_854;
    fVar358 = fStack_7b0 * fVar312 * fStack_410 +
              fVar295 * fStack_410 * fStack_7d0 + fVar297 * fStack_410 * fStack_850;
    fVar359 = fStack_7ac * fVar419 * fStack_40c +
              fVar322 * fStack_40c * fStack_7cc + fVar387 * fStack_40c * fStack_84c;
    fVar360 = fStack_7a8 * fVar21 * fStack_408 +
              fVar19 * fStack_408 * fStack_7c8 + fVar20 * fStack_408 * fStack_848;
    fVar229 = fStack_7a4 + fStack_7c4 + fStack_844;
    fVar369 = fVar251 * fVar232 * local_420 +
              fVar230 * local_420 * fVar235 + fVar424 * fVar231 * local_420;
    fVar374 = fVar284 * fVar256 * fStack_41c +
              fVar252 * fStack_41c * fVar265 + fVar426 * fVar254 * fStack_41c;
    fVar375 = fVar260 * fVar290 * fStack_418 +
              fVar286 * fStack_418 * fVar257 + fVar427 * fVar288 * fStack_418;
    fVar376 = fVar293 * fVar285 * fStack_414 +
              fVar263 * fStack_414 * fVar291 + fVar428 * fVar266 * fStack_414;
    fVar377 = fVar320 * fVar312 * fStack_410 +
              fVar295 * fStack_410 * fVar318 + fVar429 * fVar297 * fStack_410;
    fVar378 = fVar255 * fVar419 * fStack_40c +
              fVar322 * fStack_40c * fVar253 + fVar430 * fVar387 * fStack_40c;
    fVar379 = fVar261 * fVar21 * fStack_408 +
              fVar19 * fStack_408 * fVar258 + fVar431 * fVar20 * fStack_408;
    fVar380 = fStack_7c4 + fVar229;
    auVar43._4_4_ = fVar355 * fVar374;
    auVar43._0_4_ = fVar349 * fVar369;
    auVar43._8_4_ = fVar356 * fVar375;
    auVar43._12_4_ = fVar357 * fVar376;
    auVar43._16_4_ = fVar358 * fVar377;
    auVar43._20_4_ = fVar359 * fVar378;
    auVar43._24_4_ = fVar360 * fVar379;
    auVar43._28_4_ = fVar229;
    auVar17 = vsubps_avx(auVar390,auVar43);
    auVar44._4_4_ = fVar374 * fVar374;
    auVar44._0_4_ = fVar369 * fVar369;
    auVar44._8_4_ = fVar375 * fVar375;
    auVar44._12_4_ = fVar376 * fVar376;
    auVar44._16_4_ = fVar377 * fVar377;
    auVar44._20_4_ = fVar378 * fVar378;
    auVar44._24_4_ = fVar379 * fVar379;
    auVar44._28_4_ = fStack_7c4;
    local_620 = vsubps_avx(auVar403,auVar44);
    auVar14 = vsqrtps_avx(auVar114);
    fVar229 = (auVar14._0_4_ + auVar353._0_4_) * 1.0000002;
    fVar264 = (auVar14._4_4_ + auVar353._4_4_) * 1.0000002;
    fVar184 = (auVar14._8_4_ + auVar353._8_4_) * 1.0000002;
    fVar186 = (auVar14._12_4_ + auVar353._12_4_) * 1.0000002;
    fVar187 = (auVar14._16_4_ + auVar353._16_4_) * 1.0000002;
    fVar188 = (auVar14._20_4_ + auVar353._20_4_) * 1.0000002;
    fVar189 = (auVar14._24_4_ + auVar353._24_4_) * 1.0000002;
    auVar45._4_4_ = fVar264 * fVar264;
    auVar45._0_4_ = fVar229 * fVar229;
    auVar45._8_4_ = fVar184 * fVar184;
    auVar45._12_4_ = fVar186 * fVar186;
    auVar45._16_4_ = fVar187 * fVar187;
    auVar45._20_4_ = fVar188 * fVar188;
    auVar45._24_4_ = fVar189 * fVar189;
    auVar45._28_4_ = auVar14._28_4_ + auVar353._28_4_;
    fVar401 = auVar17._0_4_ + auVar17._0_4_;
    fVar408 = auVar17._4_4_ + auVar17._4_4_;
    local_5c0._0_8_ = CONCAT44(fVar408,fVar401);
    local_5c0._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    local_5c0._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    local_5c0._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    local_5c0._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    local_5c0._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    fVar229 = auVar17._28_4_;
    local_5c0._28_4_ = fVar229 + fVar229;
    auVar353 = vsubps_avx(local_620,auVar45);
    local_440._4_4_ = fVar355 * fVar355;
    local_440._0_4_ = fVar349 * fVar349;
    local_440._8_4_ = fVar356 * fVar356;
    local_440._12_4_ = fVar357 * fVar357;
    local_440._16_4_ = fVar358 * fVar358;
    local_440._20_4_ = fVar359 * fVar359;
    local_440._24_4_ = fVar360 * fVar360;
    local_440._28_4_ = local_5a0._28_4_;
    auVar386 = ZEXT3264(local_440);
    local_660 = vsubps_avx(local_3a0,local_440);
    auVar46._4_4_ = fVar408 * fVar408;
    auVar46._0_4_ = fVar401 * fVar401;
    auVar46._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
    auVar46._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
    auVar46._16_4_ = local_5c0._16_4_ * local_5c0._16_4_;
    auVar46._20_4_ = local_5c0._20_4_ * local_5c0._20_4_;
    auVar46._24_4_ = local_5c0._24_4_ * local_5c0._24_4_;
    auVar46._28_4_ = fVar229;
    fVar264 = local_660._0_4_;
    fVar184 = local_660._4_4_;
    fVar186 = local_660._8_4_;
    fVar187 = local_660._12_4_;
    fVar188 = local_660._16_4_;
    fVar189 = local_660._20_4_;
    fVar368 = local_660._24_4_;
    auVar47._4_4_ = fVar184 * 4.0 * auVar353._4_4_;
    auVar47._0_4_ = fVar264 * 4.0 * auVar353._0_4_;
    auVar47._8_4_ = fVar186 * 4.0 * auVar353._8_4_;
    auVar47._12_4_ = fVar187 * 4.0 * auVar353._12_4_;
    auVar47._16_4_ = fVar188 * 4.0 * auVar353._16_4_;
    auVar47._20_4_ = fVar189 * 4.0 * auVar353._20_4_;
    auVar47._24_4_ = fVar368 * 4.0 * auVar353._24_4_;
    auVar47._28_4_ = 0x40800000;
    auVar17 = vsubps_avx(auVar46,auVar47);
    auVar114 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
    fVar229 = local_660._28_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      auVar224._8_4_ = 0x7f800000;
      auVar224._0_8_ = 0x7f8000007f800000;
      auVar224._12_4_ = 0x7f800000;
      auVar224._16_4_ = 0x7f800000;
      auVar224._20_4_ = 0x7f800000;
      auVar224._24_4_ = 0x7f800000;
      auVar224._28_4_ = 0x7f800000;
      auVar422._8_4_ = 0xff800000;
      auVar422._0_8_ = 0xff800000ff800000;
      auVar422._12_4_ = 0xff800000;
      auVar422._16_4_ = 0xff800000;
      auVar422._20_4_ = 0xff800000;
      auVar422._24_4_ = 0xff800000;
      auVar422._28_4_ = 0xff800000;
    }
    else {
      auVar24 = vsqrtps_avx(auVar17);
      auVar305._0_4_ = fVar264 + fVar264;
      auVar305._4_4_ = fVar184 + fVar184;
      auVar305._8_4_ = fVar186 + fVar186;
      auVar305._12_4_ = fVar187 + fVar187;
      auVar305._16_4_ = fVar188 + fVar188;
      auVar305._20_4_ = fVar189 + fVar189;
      auVar305._24_4_ = fVar368 + fVar368;
      auVar305._28_4_ = fVar229 + fVar229;
      auVar18 = vrcpps_avx(auVar305);
      auVar308 = vcmpps_avx(auVar17,ZEXT832(0) << 0x20,5);
      fVar298 = auVar18._0_4_;
      fVar313 = auVar18._4_4_;
      auVar48._4_4_ = auVar305._4_4_ * fVar313;
      auVar48._0_4_ = auVar305._0_4_ * fVar298;
      fVar315 = auVar18._8_4_;
      auVar48._8_4_ = auVar305._8_4_ * fVar315;
      fVar317 = auVar18._12_4_;
      auVar48._12_4_ = auVar305._12_4_ * fVar317;
      fVar319 = auVar18._16_4_;
      auVar48._16_4_ = auVar305._16_4_ * fVar319;
      fVar321 = auVar18._20_4_;
      auVar48._20_4_ = auVar305._20_4_ * fVar321;
      fVar323 = auVar18._24_4_;
      auVar48._24_4_ = auVar305._24_4_ * fVar323;
      auVar48._28_4_ = auVar305._28_4_;
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = &DAT_3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar225._16_4_ = 0x3f800000;
      auVar225._20_4_ = 0x3f800000;
      auVar225._24_4_ = 0x3f800000;
      auVar225._28_4_ = 0x3f800000;
      auVar17 = vsubps_avx(auVar225,auVar48);
      fVar298 = fVar298 + fVar298 * auVar17._0_4_;
      fVar313 = fVar313 + fVar313 * auVar17._4_4_;
      fVar315 = fVar315 + fVar315 * auVar17._8_4_;
      fVar317 = fVar317 + fVar317 * auVar17._12_4_;
      fVar319 = fVar319 + fVar319 * auVar17._16_4_;
      fVar321 = fVar321 + fVar321 * auVar17._20_4_;
      fVar323 = fVar323 + fVar323 * auVar17._24_4_;
      auVar332._0_8_ = CONCAT44(fVar408,fVar401) ^ 0x8000000080000000;
      auVar332._8_4_ = -local_5c0._8_4_;
      auVar332._12_4_ = -local_5c0._12_4_;
      auVar332._16_4_ = -local_5c0._16_4_;
      auVar332._20_4_ = -local_5c0._20_4_;
      auVar332._24_4_ = -local_5c0._24_4_;
      auVar332._28_4_ = -local_5c0._28_4_;
      auVar25 = vsubps_avx(auVar332,auVar24);
      fVar401 = auVar25._0_4_ * fVar298;
      fVar408 = auVar25._4_4_ * fVar313;
      auVar49._4_4_ = fVar408;
      auVar49._0_4_ = fVar401;
      fVar340 = auVar25._8_4_ * fVar315;
      auVar49._8_4_ = fVar340;
      fVar342 = auVar25._12_4_ * fVar317;
      auVar49._12_4_ = fVar342;
      fVar344 = auVar25._16_4_ * fVar319;
      auVar49._16_4_ = fVar344;
      fVar346 = auVar25._20_4_ * fVar321;
      auVar49._20_4_ = fVar346;
      fVar348 = auVar25._24_4_ * fVar323;
      auVar49._24_4_ = fVar348;
      auVar49._28_4_ = auVar25._28_4_;
      auVar24 = vsubps_avx(auVar24,local_5c0);
      fVar298 = auVar24._0_4_ * fVar298;
      fVar313 = auVar24._4_4_ * fVar313;
      auVar50._4_4_ = fVar313;
      auVar50._0_4_ = fVar298;
      fVar315 = auVar24._8_4_ * fVar315;
      auVar50._8_4_ = fVar315;
      fVar317 = auVar24._12_4_ * fVar317;
      auVar50._12_4_ = fVar317;
      fVar319 = auVar24._16_4_ * fVar319;
      auVar50._16_4_ = fVar319;
      fVar321 = auVar24._20_4_ * fVar321;
      auVar50._20_4_ = fVar321;
      fVar323 = auVar24._24_4_ * fVar323;
      auVar50._24_4_ = fVar323;
      auVar50._28_4_ = auVar24._28_4_;
      fStack_4e4 = fVar380 + auVar18._28_4_ + auVar17._28_4_;
      local_500[0] = local_420 * (fVar369 + fVar349 * fVar401);
      local_500[1] = fStack_41c * (fVar374 + fVar355 * fVar408);
      local_500[2] = fStack_418 * (fVar375 + fVar356 * fVar340);
      local_500[3] = fStack_414 * (fVar376 + fVar357 * fVar342);
      fStack_4f0 = fStack_410 * (fVar377 + fVar358 * fVar344);
      fStack_4ec = fStack_40c * (fVar378 + fVar359 * fVar346);
      fStack_4e8 = fStack_408 * (fVar379 + fVar360 * fVar348);
      local_520[0] = local_420 * (fVar369 + fVar349 * fVar298);
      local_520[1] = fStack_41c * (fVar374 + fVar355 * fVar313);
      local_520[2] = fStack_418 * (fVar375 + fVar356 * fVar315);
      local_520[3] = fStack_414 * (fVar376 + fVar357 * fVar317);
      fStack_510 = fStack_410 * (fVar377 + fVar358 * fVar319);
      fStack_50c = fStack_40c * (fVar378 + fVar359 * fVar321);
      fStack_508 = fStack_408 * (fVar379 + fVar360 * fVar323);
      fStack_504 = fVar380 + fStack_4e4;
      auVar306._8_4_ = 0x7f800000;
      auVar306._0_8_ = 0x7f8000007f800000;
      auVar306._12_4_ = 0x7f800000;
      auVar306._16_4_ = 0x7f800000;
      auVar306._20_4_ = 0x7f800000;
      auVar306._24_4_ = 0x7f800000;
      auVar306._28_4_ = 0x7f800000;
      auVar224 = vblendvps_avx(auVar306,auVar49,auVar308);
      auVar333._8_4_ = 0x7fffffff;
      auVar333._0_8_ = 0x7fffffff7fffffff;
      auVar333._12_4_ = 0x7fffffff;
      auVar333._16_4_ = 0x7fffffff;
      auVar333._20_4_ = 0x7fffffff;
      auVar333._24_4_ = 0x7fffffff;
      auVar333._28_4_ = 0x7fffffff;
      auVar17 = vandps_avx(local_440,auVar333);
      auVar17 = vmaxps_avx(local_4e0,auVar17);
      auVar51._4_4_ = auVar17._4_4_ * 1.9073486e-06;
      auVar51._0_4_ = auVar17._0_4_ * 1.9073486e-06;
      auVar51._8_4_ = auVar17._8_4_ * 1.9073486e-06;
      auVar51._12_4_ = auVar17._12_4_ * 1.9073486e-06;
      auVar51._16_4_ = auVar17._16_4_ * 1.9073486e-06;
      auVar51._20_4_ = auVar17._20_4_ * 1.9073486e-06;
      auVar51._24_4_ = auVar17._24_4_ * 1.9073486e-06;
      auVar51._28_4_ = auVar17._28_4_;
      auVar17 = vandps_avx(local_660,auVar333);
      auVar17 = vcmpps_avx(auVar17,auVar51,1);
      auVar307._8_4_ = 0xff800000;
      auVar307._0_8_ = 0xff800000ff800000;
      auVar307._12_4_ = 0xff800000;
      auVar307._16_4_ = 0xff800000;
      auVar307._20_4_ = 0xff800000;
      auVar307._24_4_ = 0xff800000;
      auVar307._28_4_ = 0xff800000;
      auVar422 = vblendvps_avx(auVar307,auVar50,auVar308);
      auVar18 = auVar308 & auVar17;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar17,auVar308);
        auVar147 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar17 = vcmpps_avx(auVar353,ZEXT832(0) << 0x20,2);
        auVar354._8_4_ = 0xff800000;
        auVar354._0_8_ = 0xff800000ff800000;
        auVar354._12_4_ = 0xff800000;
        auVar354._16_4_ = 0xff800000;
        auVar354._20_4_ = 0xff800000;
        auVar354._24_4_ = 0xff800000;
        auVar354._28_4_ = 0xff800000;
        auVar404._8_4_ = 0x7f800000;
        auVar404._0_8_ = 0x7f8000007f800000;
        auVar404._12_4_ = 0x7f800000;
        auVar404._16_4_ = 0x7f800000;
        auVar404._20_4_ = 0x7f800000;
        auVar404._24_4_ = 0x7f800000;
        auVar404._28_4_ = 0x7f800000;
        auVar353 = vblendvps_avx(auVar404,auVar354,auVar17);
        auVar214 = vpmovsxwd_avx(auVar147);
        auVar147 = vpunpckhwd_avx(auVar147,auVar147);
        auVar283._16_16_ = auVar147;
        auVar283._0_16_ = auVar214;
        auVar224 = vblendvps_avx(auVar224,auVar353,auVar283);
        auVar353 = vblendvps_avx(auVar354,auVar404,auVar17);
        auVar422 = vblendvps_avx(auVar422,auVar353,auVar283);
        auVar353 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar205._0_4_ = auVar114._0_4_ ^ auVar353._0_4_;
        auVar205._4_4_ = auVar114._4_4_ ^ auVar353._4_4_;
        auVar205._8_4_ = auVar114._8_4_ ^ auVar353._8_4_;
        auVar205._12_4_ = auVar114._12_4_ ^ auVar353._12_4_;
        auVar205._16_4_ = auVar114._16_4_ ^ auVar353._16_4_;
        auVar205._20_4_ = auVar114._20_4_ ^ auVar353._20_4_;
        auVar205._24_4_ = auVar114._24_4_ ^ auVar353._24_4_;
        auVar205._28_4_ = auVar114._28_4_ ^ auVar353._28_4_;
        auVar114 = vorps_avx(auVar17,auVar205);
        auVar114 = vandps_avx(auVar308,auVar114);
      }
    }
    auVar353 = local_3c0 & auVar114;
    auVar311 = ZEXT3264(_local_940);
    auVar337 = ZEXT1664(local_a00);
    if ((((((((auVar353 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar353 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar353 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar353 >> 0x7f,0) == '\0') &&
          (auVar353 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar353 >> 0xbf,0) == '\0') &&
        (auVar353 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar353[0x1f])
    {
      auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      auVar147 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8c0._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_8c0._0_4_)),0);
      auVar167._16_16_ = auVar147;
      auVar167._0_16_ = auVar147;
      local_640 = vminps_avx(auVar167,auVar422);
      auVar120._0_4_ =
           (float)local_7c0._0_4_ * fVar324 +
           (float)local_7e0._0_4_ * fVar388 + fVar399 * (float)local_860._0_4_;
      auVar120._4_4_ =
           (float)local_7c0._4_4_ * fVar338 +
           (float)local_7e0._4_4_ * fVar392 + fVar406 * (float)local_860._4_4_;
      auVar120._8_4_ = fStack_7b8 * fVar339 + fStack_7d8 * fVar393 + fVar409 * fStack_858;
      auVar120._12_4_ = fStack_7b4 * fVar341 + fStack_7d4 * fVar394 + fVar411 * fStack_854;
      auVar120._16_4_ = fStack_7b0 * fVar343 + fStack_7d0 * fVar395 + fVar413 * fStack_850;
      auVar120._20_4_ = fStack_7ac * fVar345 + fStack_7cc * fVar396 + fVar415 * fStack_84c;
      auVar120._24_4_ = fStack_7a8 * fVar347 + fStack_7c8 * fVar397 + fVar417 * fStack_848;
      auVar120._28_4_ = auVar331._28_4_ + auVar405._28_4_ + 1.0;
      auVar353 = vrcpps_avx(auVar120);
      fVar401 = auVar353._0_4_;
      fVar408 = auVar353._4_4_;
      auVar52._4_4_ = auVar120._4_4_ * fVar408;
      auVar52._0_4_ = auVar120._0_4_ * fVar401;
      fVar298 = auVar353._8_4_;
      auVar52._8_4_ = auVar120._8_4_ * fVar298;
      fVar313 = auVar353._12_4_;
      auVar52._12_4_ = auVar120._12_4_ * fVar313;
      fVar315 = auVar353._16_4_;
      auVar52._16_4_ = auVar120._16_4_ * fVar315;
      fVar317 = auVar353._20_4_;
      auVar52._20_4_ = auVar120._20_4_ * fVar317;
      fVar319 = auVar353._24_4_;
      auVar52._24_4_ = auVar120._24_4_ * fVar319;
      auVar52._28_4_ = 0x3f800000;
      auVar373._8_4_ = 0x3f800000;
      auVar373._0_8_ = &DAT_3f8000003f800000;
      auVar373._12_4_ = 0x3f800000;
      auVar373._16_4_ = 0x3f800000;
      auVar373._20_4_ = 0x3f800000;
      auVar373._24_4_ = 0x3f800000;
      auVar373._28_4_ = 0x3f800000;
      auVar308 = vsubps_avx(auVar373,auVar52);
      auVar334._8_4_ = 0x7fffffff;
      auVar334._0_8_ = 0x7fffffff7fffffff;
      auVar334._12_4_ = 0x7fffffff;
      auVar334._16_4_ = 0x7fffffff;
      auVar334._20_4_ = 0x7fffffff;
      auVar334._24_4_ = 0x7fffffff;
      auVar334._28_4_ = 0x7fffffff;
      auVar353 = vandps_avx(auVar120,auVar334);
      auVar367._8_4_ = 0x219392ef;
      auVar367._0_8_ = 0x219392ef219392ef;
      auVar367._12_4_ = 0x219392ef;
      auVar367._16_4_ = 0x219392ef;
      auVar367._20_4_ = 0x219392ef;
      auVar367._24_4_ = 0x219392ef;
      auVar367._28_4_ = 0x219392ef;
      auVar17 = vcmpps_avx(auVar353,auVar367,1);
      auVar53._4_4_ =
           (fVar408 + fVar408 * auVar308._4_4_) *
           -(fVar284 * fVar338 + fVar392 * fVar265 + fVar426 * fVar406);
      auVar53._0_4_ =
           (fVar401 + fVar401 * auVar308._0_4_) *
           -(fVar251 * fVar324 + fVar388 * fVar235 + fVar424 * fVar399);
      auVar53._8_4_ =
           (fVar298 + fVar298 * auVar308._8_4_) *
           -(fVar260 * fVar339 + fVar393 * fVar257 + fVar427 * fVar409);
      auVar53._12_4_ =
           (fVar313 + fVar313 * auVar308._12_4_) *
           -(fVar293 * fVar341 + fVar394 * fVar291 + fVar428 * fVar411);
      auVar53._16_4_ =
           (fVar315 + fVar315 * auVar308._16_4_) *
           -(fVar320 * fVar343 + fVar395 * fVar318 + fVar429 * fVar413);
      auVar53._20_4_ =
           (fVar317 + fVar317 * auVar308._20_4_) *
           -(fVar255 * fVar345 + fVar396 * fVar253 + fVar430 * fVar415);
      auVar53._24_4_ =
           (fVar319 + fVar319 * auVar308._24_4_) *
           -(fVar261 * fVar347 + fVar397 * fVar258 + fVar431 * fVar417);
      auVar53._28_4_ = -(auVar405._28_4_ + auVar224._28_4_ + 1.0);
      auVar353 = vcmpps_avx(auVar120,ZEXT832(0) << 0x20,1);
      auVar353 = vorps_avx(auVar17,auVar353);
      auVar385._8_4_ = 0xff800000;
      auVar385._0_8_ = 0xff800000ff800000;
      auVar385._12_4_ = 0xff800000;
      auVar385._16_4_ = 0xff800000;
      auVar385._20_4_ = 0xff800000;
      auVar385._24_4_ = 0xff800000;
      auVar385._28_4_ = 0xff800000;
      auVar386 = ZEXT3264(auVar385);
      auVar353 = vblendvps_avx(auVar53,auVar385,auVar353);
      auVar405 = vcmpps_avx(auVar120,ZEXT832(0) << 0x20,6);
      auVar405 = vorps_avx(auVar17,auVar405);
      auVar391._8_4_ = 0x7f800000;
      auVar391._0_8_ = 0x7f8000007f800000;
      auVar391._12_4_ = 0x7f800000;
      auVar391._16_4_ = 0x7f800000;
      auVar391._20_4_ = 0x7f800000;
      auVar391._24_4_ = 0x7f800000;
      auVar391._28_4_ = 0x7f800000;
      auVar405 = vblendvps_avx(auVar53,auVar391,auVar405);
      auVar17 = vmaxps_avx(local_3e0,auVar224);
      auVar17 = vmaxps_avx(auVar17,auVar353);
      auVar405 = vminps_avx(local_640,auVar405);
      auVar308 = ZEXT832(0) << 0x20;
      auVar353 = vsubps_avx(auVar308,auVar15);
      auVar15 = vsubps_avx(auVar308,local_a40);
      auVar54._4_4_ = auVar15._4_4_ * -fVar407;
      auVar54._0_4_ = auVar15._0_4_ * -fVar400;
      auVar54._8_4_ = auVar15._8_4_ * -fVar410;
      auVar54._12_4_ = auVar15._12_4_ * -fVar412;
      auVar54._16_4_ = auVar15._16_4_ * -fVar414;
      auVar54._20_4_ = auVar15._20_4_ * -fVar416;
      auVar54._24_4_ = auVar15._24_4_ * -fVar418;
      auVar54._28_4_ = auVar15._28_4_;
      auVar55._4_4_ = fVar259 * auVar353._4_4_;
      auVar55._0_4_ = fVar233 * auVar353._0_4_;
      auVar55._8_4_ = fVar292 * auVar353._8_4_;
      auVar55._12_4_ = fVar287 * auVar353._12_4_;
      auVar55._16_4_ = fVar314 * auVar353._16_4_;
      auVar55._20_4_ = fVar296 * auVar353._20_4_;
      auVar55._24_4_ = fVar22 * auVar353._24_4_;
      auVar55._28_4_ = auVar353._28_4_;
      auVar353 = vsubps_avx(auVar54,auVar55);
      auVar15 = vsubps_avx(auVar308,auVar16);
      auVar56._4_4_ = fVar262 * auVar15._4_4_;
      auVar56._0_4_ = fVar234 * auVar15._0_4_;
      auVar56._8_4_ = fVar294 * auVar15._8_4_;
      auVar56._12_4_ = fVar289 * auVar15._12_4_;
      auVar56._16_4_ = fVar316 * auVar15._16_4_;
      auVar56._20_4_ = fVar398 * auVar15._20_4_;
      uVar2 = auVar15._28_4_;
      auVar56._24_4_ = fVar23 * auVar15._24_4_;
      auVar56._28_4_ = uVar2;
      auVar308 = vsubps_avx(auVar353,auVar56);
      auVar57._4_4_ = -fVar407 * (float)local_860._4_4_;
      auVar57._0_4_ = -fVar400 * (float)local_860._0_4_;
      auVar57._8_4_ = -fVar410 * fStack_858;
      auVar57._12_4_ = -fVar412 * fStack_854;
      auVar57._16_4_ = -fVar414 * fStack_850;
      auVar57._20_4_ = -fVar416 * fStack_84c;
      auVar57._24_4_ = -fVar418 * fStack_848;
      auVar57._28_4_ = uVar12 ^ 0x80000000;
      auVar58._4_4_ = (float)local_7e0._4_4_ * fVar259;
      auVar58._0_4_ = (float)local_7e0._0_4_ * fVar233;
      auVar58._8_4_ = fStack_7d8 * fVar292;
      auVar58._12_4_ = fStack_7d4 * fVar287;
      auVar58._16_4_ = fStack_7d0 * fVar314;
      auVar58._20_4_ = fStack_7cc * fVar296;
      auVar58._24_4_ = fStack_7c8 * fVar22;
      auVar58._28_4_ = uVar2;
      auVar248._8_4_ = 0x3f800000;
      auVar248._0_8_ = &DAT_3f8000003f800000;
      auVar248._12_4_ = 0x3f800000;
      auVar248._16_4_ = 0x3f800000;
      auVar248._20_4_ = 0x3f800000;
      auVar248._24_4_ = 0x3f800000;
      auVar248._28_4_ = 0x3f800000;
      auVar353 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = (float)local_7c0._4_4_ * fVar262;
      auVar59._0_4_ = (float)local_7c0._0_4_ * fVar234;
      auVar59._8_4_ = fStack_7b8 * fVar294;
      auVar59._12_4_ = fStack_7b4 * fVar289;
      auVar59._16_4_ = fStack_7b0 * fVar316;
      auVar59._20_4_ = fStack_7ac * fVar398;
      auVar59._24_4_ = fStack_7a8 * fVar23;
      auVar59._28_4_ = uVar2;
      auVar18 = vsubps_avx(auVar353,auVar59);
      auVar353 = vrcpps_avx(auVar18);
      fVar233 = auVar353._0_4_;
      fVar234 = auVar353._4_4_;
      auVar60._4_4_ = auVar18._4_4_ * fVar234;
      auVar60._0_4_ = auVar18._0_4_ * fVar233;
      fVar235 = auVar353._8_4_;
      auVar60._8_4_ = auVar18._8_4_ * fVar235;
      fVar251 = auVar353._12_4_;
      auVar60._12_4_ = auVar18._12_4_ * fVar251;
      fVar259 = auVar353._16_4_;
      auVar60._16_4_ = auVar18._16_4_ * fVar259;
      fVar262 = auVar353._20_4_;
      auVar60._20_4_ = auVar18._20_4_ * fVar262;
      fVar265 = auVar353._24_4_;
      auVar60._24_4_ = auVar18._24_4_ * fVar265;
      auVar60._28_4_ = local_a20._28_4_;
      auVar24 = vsubps_avx(auVar248,auVar60);
      auVar353 = vandps_avx(auVar18,auVar334);
      auVar15 = vcmpps_avx(auVar353,auVar367,1);
      auVar61._4_4_ = (fVar234 + fVar234 * auVar24._4_4_) * -auVar308._4_4_;
      auVar61._0_4_ = (fVar233 + fVar233 * auVar24._0_4_) * -auVar308._0_4_;
      auVar61._8_4_ = (fVar235 + fVar235 * auVar24._8_4_) * -auVar308._8_4_;
      auVar61._12_4_ = (fVar251 + fVar251 * auVar24._12_4_) * -auVar308._12_4_;
      auVar61._16_4_ = (fVar259 + fVar259 * auVar24._16_4_) * -auVar308._16_4_;
      auVar61._20_4_ = (fVar262 + fVar262 * auVar24._20_4_) * -auVar308._20_4_;
      auVar61._24_4_ = (fVar265 + fVar265 * auVar24._24_4_) * -auVar308._24_4_;
      auVar61._28_4_ = auVar308._28_4_ ^ 0x80000000;
      auVar308 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar353 = vcmpps_avx(auVar18,auVar308,1);
      auVar353 = vorps_avx(auVar15,auVar353);
      auVar353 = vblendvps_avx(auVar61,auVar385,auVar353);
      local_640 = vmaxps_avx(auVar17,auVar353);
      auVar353 = vcmpps_avx(auVar18,auVar308,6);
      auVar353 = vorps_avx(auVar15,auVar353);
      auVar353 = vblendvps_avx(auVar61,auVar391,auVar353);
      auVar114 = vandps_avx(local_3c0,auVar114);
      local_460 = vminps_avx(auVar405,auVar353);
      auVar353 = vcmpps_avx(local_640,local_460,2);
      auVar15 = auVar114 & auVar353;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar15 >> 0x7f,0) == '\0') &&
            (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar15 >> 0xbf,0) == '\0') &&
          (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar15[0x1f])
      {
LAB_0111d7d1:
        auVar311 = ZEXT3264(_local_940);
      }
      else {
        auVar15 = vminps_avx(local_740,local_7a0);
        auVar405 = vminps_avx(local_760,local_780);
        auVar15 = vminps_avx(auVar15,auVar405);
        auVar14 = vsubps_avx(auVar15,auVar14);
        auVar114 = vandps_avx(auVar353,auVar114);
        auVar91._4_4_ = local_500[1];
        auVar91._0_4_ = local_500[0];
        auVar91._8_4_ = local_500[2];
        auVar91._12_4_ = local_500[3];
        auVar91._16_4_ = fStack_4f0;
        auVar91._20_4_ = fStack_4ec;
        auVar91._24_4_ = fStack_4e8;
        auVar91._28_4_ = fStack_4e4;
        auVar353 = vminps_avx(auVar91,auVar248);
        auVar353 = vmaxps_avx(auVar353,ZEXT832(0) << 0x20);
        local_500[0] = fVar99 + fVar144 * (auVar353._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar127 + fVar182 * (auVar353._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar130 + fVar183 * (auVar353._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar133 + fVar185 * (auVar353._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar99 + fVar144 * (auVar353._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar127 + fVar182 * (auVar353._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar130 + fVar183 * (auVar353._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar133 + auVar353._28_4_ + 7.0;
        auVar90._4_4_ = local_520[1];
        auVar90._0_4_ = local_520[0];
        auVar90._8_4_ = local_520[2];
        auVar90._12_4_ = local_520[3];
        auVar90._16_4_ = fStack_510;
        auVar90._20_4_ = fStack_50c;
        auVar90._24_4_ = fStack_508;
        auVar90._28_4_ = fStack_504;
        auVar353 = vminps_avx(auVar90,auVar248);
        auVar353 = vmaxps_avx(auVar353,ZEXT832(0) << 0x20);
        local_520[0] = fVar99 + fVar144 * (auVar353._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar127 + fVar182 * (auVar353._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar130 + fVar183 * (auVar353._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar133 + fVar185 * (auVar353._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar99 + fVar144 * (auVar353._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar127 + fVar182 * (auVar353._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar130 + fVar183 * (auVar353._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar133 + auVar353._28_4_ + 7.0;
        auVar62._4_4_ = auVar14._4_4_ * 0.99999976;
        auVar62._0_4_ = auVar14._0_4_ * 0.99999976;
        auVar62._8_4_ = auVar14._8_4_ * 0.99999976;
        auVar62._12_4_ = auVar14._12_4_ * 0.99999976;
        auVar62._16_4_ = auVar14._16_4_ * 0.99999976;
        auVar62._20_4_ = auVar14._20_4_ * 0.99999976;
        auVar62._24_4_ = auVar14._24_4_ * 0.99999976;
        auVar62._28_4_ = 0x3f7ffffc;
        auVar353 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar62);
        auVar63._4_4_ = auVar353._4_4_ * auVar353._4_4_;
        auVar63._0_4_ = auVar353._0_4_ * auVar353._0_4_;
        auVar63._8_4_ = auVar353._8_4_ * auVar353._8_4_;
        auVar63._12_4_ = auVar353._12_4_ * auVar353._12_4_;
        auVar63._16_4_ = auVar353._16_4_ * auVar353._16_4_;
        auVar63._20_4_ = auVar353._20_4_ * auVar353._20_4_;
        auVar63._24_4_ = auVar353._24_4_ * auVar353._24_4_;
        auVar63._28_4_ = auVar353._28_4_;
        local_ae0 = vsubps_avx(local_620,auVar63);
        auVar64._4_4_ = local_ae0._4_4_ * fVar184 * 4.0;
        auVar64._0_4_ = local_ae0._0_4_ * fVar264 * 4.0;
        auVar64._8_4_ = local_ae0._8_4_ * fVar186 * 4.0;
        auVar64._12_4_ = local_ae0._12_4_ * fVar187 * 4.0;
        auVar64._16_4_ = local_ae0._16_4_ * fVar188 * 4.0;
        auVar64._20_4_ = local_ae0._20_4_ * fVar189 * 4.0;
        auVar64._24_4_ = local_ae0._24_4_ * fVar368 * 4.0;
        auVar64._28_4_ = auVar353._28_4_;
        auVar14 = vsubps_avx(auVar46,auVar64);
        local_8e0 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,5);
        auVar353 = local_8e0;
        if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_8e0 >> 0x7f,0) == '\0') &&
              (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0xbf,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8e0[0x1f]) {
          _local_8a0 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_820 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar218 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar245 = ZEXT828(0) << 0x20;
          auVar363 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar168._8_4_ = 0x7f800000;
          auVar168._0_8_ = 0x7f8000007f800000;
          auVar168._12_4_ = 0x7f800000;
          auVar168._16_4_ = 0x7f800000;
          auVar168._20_4_ = 0x7f800000;
          auVar168._24_4_ = 0x7f800000;
          auVar168._28_4_ = 0x7f800000;
          auVar277._8_4_ = 0xff800000;
          auVar277._0_8_ = 0xff800000ff800000;
          auVar277._12_4_ = 0xff800000;
          auVar277._16_4_ = 0xff800000;
          auVar277._20_4_ = 0xff800000;
          auVar277._24_4_ = 0xff800000;
          auVar277._28_4_ = 0xff800000;
          local_ae0 = auVar16;
          local_8e0 = auVar26;
          _local_880 = _local_8a0;
        }
        else {
          auVar16 = vsqrtps_avx(auVar14);
          auVar169._0_4_ = fVar264 + fVar264;
          auVar169._4_4_ = fVar184 + fVar184;
          auVar169._8_4_ = fVar186 + fVar186;
          auVar169._12_4_ = fVar187 + fVar187;
          auVar169._16_4_ = fVar188 + fVar188;
          auVar169._20_4_ = fVar189 + fVar189;
          auVar169._24_4_ = fVar368 + fVar368;
          auVar169._28_4_ = fVar229 + fVar229;
          auVar15 = vrcpps_avx(auVar169);
          fVar229 = auVar15._0_4_;
          fVar233 = auVar15._4_4_;
          auVar65._4_4_ = auVar169._4_4_ * fVar233;
          auVar65._0_4_ = auVar169._0_4_ * fVar229;
          fVar234 = auVar15._8_4_;
          auVar65._8_4_ = auVar169._8_4_ * fVar234;
          fVar235 = auVar15._12_4_;
          auVar65._12_4_ = auVar169._12_4_ * fVar235;
          fVar251 = auVar15._16_4_;
          auVar65._16_4_ = auVar169._16_4_ * fVar251;
          fVar259 = auVar15._20_4_;
          auVar65._20_4_ = auVar169._20_4_ * fVar259;
          fVar262 = auVar15._24_4_;
          auVar65._24_4_ = auVar169._24_4_ * fVar262;
          auVar65._28_4_ = auVar169._28_4_;
          auVar405 = vsubps_avx(auVar248,auVar65);
          fVar229 = fVar229 + fVar229 * auVar405._0_4_;
          fVar233 = fVar233 + fVar233 * auVar405._4_4_;
          fVar234 = fVar234 + fVar234 * auVar405._8_4_;
          fVar235 = fVar235 + fVar235 * auVar405._12_4_;
          fVar251 = fVar251 + fVar251 * auVar405._16_4_;
          fVar259 = fVar259 + fVar259 * auVar405._20_4_;
          fVar262 = fVar262 + fVar262 * auVar405._24_4_;
          fVar289 = auVar15._28_4_ + auVar405._28_4_;
          auVar170._0_8_ = local_5c0._0_8_ ^ 0x8000000080000000;
          auVar170._8_4_ = -local_5c0._8_4_;
          auVar170._12_4_ = -local_5c0._12_4_;
          auVar170._16_4_ = -local_5c0._16_4_;
          auVar170._20_4_ = -local_5c0._20_4_;
          auVar170._24_4_ = -local_5c0._24_4_;
          auVar170._28_4_ = -local_5c0._28_4_;
          auVar15 = vsubps_avx(auVar170,auVar16);
          fVar265 = auVar15._0_4_ * fVar229;
          fVar284 = auVar15._4_4_ * fVar233;
          auVar66._4_4_ = fVar284;
          auVar66._0_4_ = fVar265;
          fVar292 = auVar15._8_4_ * fVar234;
          auVar66._8_4_ = fVar292;
          fVar294 = auVar15._12_4_ * fVar235;
          auVar66._12_4_ = fVar294;
          fVar257 = auVar15._16_4_ * fVar251;
          auVar66._16_4_ = fVar257;
          fVar260 = auVar15._20_4_ * fVar259;
          auVar66._20_4_ = fVar260;
          fVar287 = auVar15._24_4_ * fVar262;
          auVar66._24_4_ = fVar287;
          auVar66._28_4_ = auVar15._28_4_;
          auVar15 = vsubps_avx(auVar16,local_5c0);
          fVar229 = auVar15._0_4_ * fVar229;
          fVar233 = auVar15._4_4_ * fVar233;
          auVar67._4_4_ = fVar233;
          auVar67._0_4_ = fVar229;
          fVar234 = auVar15._8_4_ * fVar234;
          auVar67._8_4_ = fVar234;
          fVar235 = auVar15._12_4_ * fVar235;
          auVar67._12_4_ = fVar235;
          fVar251 = auVar15._16_4_ * fVar251;
          auVar67._16_4_ = fVar251;
          fVar259 = auVar15._20_4_ * fVar259;
          auVar67._20_4_ = fVar259;
          fVar262 = auVar15._24_4_ * fVar262;
          auVar67._24_4_ = fVar262;
          auVar67._28_4_ = 0x80000000;
          auVar13._4_4_ = fStack_41c;
          auVar13._0_4_ = local_420;
          auVar13._8_4_ = fStack_418;
          auVar13._12_4_ = fStack_414;
          auVar13._16_4_ = fStack_410;
          auVar13._20_4_ = fStack_40c;
          auVar13._24_4_ = fStack_408;
          auVar13._28_4_ = fStack_404;
          fVar291 = local_420 * (fVar265 * fVar349 + fVar369);
          fVar293 = fStack_41c * (fVar284 * fVar355 + fVar374);
          fVar314 = fStack_418 * (fVar292 * fVar356 + fVar375);
          fVar316 = fStack_414 * (fVar294 * fVar357 + fVar376);
          fVar318 = fStack_410 * (fVar257 * fVar358 + fVar377);
          fVar320 = fStack_40c * (fVar260 * fVar359 + fVar378);
          fVar296 = fStack_408 * (fVar287 * fVar360 + fVar379);
          auVar226._0_4_ = fVar100 + fVar232 * fVar291;
          auVar226._4_4_ = fVar128 + fVar256 * fVar293;
          auVar226._8_4_ = fVar131 + fVar290 * fVar314;
          auVar226._12_4_ = fVar134 + fVar285 * fVar316;
          auVar226._16_4_ = fVar136 + fVar312 * fVar318;
          auVar226._20_4_ = fVar138 + fVar419 * fVar320;
          auVar226._24_4_ = fVar140 + fVar21 * fVar296;
          auVar226._28_4_ = fVar142 + auVar15._28_4_ + fVar380;
          auVar68._4_4_ = (float)local_7c0._4_4_ * fVar284;
          auVar68._0_4_ = (float)local_7c0._0_4_ * fVar265;
          auVar68._8_4_ = fStack_7b8 * fVar292;
          auVar68._12_4_ = fStack_7b4 * fVar294;
          auVar68._16_4_ = fStack_7b0 * fVar257;
          auVar68._20_4_ = fStack_7ac * fVar260;
          auVar68._24_4_ = fStack_7a8 * fVar287;
          auVar68._28_4_ = fVar289;
          local_a40 = vsubps_avx(auVar68,auVar226);
          auVar247._0_4_ = fVar101 + fVar230 * fVar291;
          auVar247._4_4_ = fVar129 + fVar252 * fVar293;
          auVar247._8_4_ = fVar132 + fVar286 * fVar314;
          auVar247._12_4_ = fVar135 + fVar263 * fVar316;
          auVar247._16_4_ = fVar137 + fVar295 * fVar318;
          auVar247._20_4_ = fVar139 + fVar322 * fVar320;
          auVar247._24_4_ = fVar141 + fVar19 * fVar296;
          auVar247._28_4_ = fVar143 + fVar289;
          auVar69._4_4_ = (float)local_7e0._4_4_ * fVar284;
          auVar69._0_4_ = (float)local_7e0._0_4_ * fVar265;
          auVar69._8_4_ = fStack_7d8 * fVar292;
          auVar69._12_4_ = fStack_7d4 * fVar294;
          auVar69._16_4_ = fStack_7d0 * fVar257;
          auVar69._20_4_ = fStack_7cc * fVar260;
          auVar69._24_4_ = fStack_7c8 * fVar287;
          auVar69._28_4_ = fVar133;
          _local_9c0 = vsubps_avx(auVar69,auVar247);
          auVar278._0_4_ = local_540._0_4_ + fVar231 * fVar291;
          auVar278._4_4_ = local_540._4_4_ + fVar254 * fVar293;
          auVar278._8_4_ = local_540._8_4_ + fVar288 * fVar314;
          auVar278._12_4_ = local_540._12_4_ + fVar266 * fVar316;
          auVar278._16_4_ = local_540._16_4_ + fVar297 * fVar318;
          auVar278._20_4_ = local_540._20_4_ + fVar387 * fVar320;
          auVar278._24_4_ = local_540._24_4_ + fVar20 * fVar296;
          auVar278._28_4_ = local_540._28_4_ + 0.0;
          auVar70._4_4_ = (float)local_860._4_4_ * fVar284;
          auVar70._0_4_ = (float)local_860._0_4_ * fVar265;
          auVar70._8_4_ = fStack_858 * fVar292;
          auVar70._12_4_ = fStack_854 * fVar294;
          auVar70._16_4_ = fStack_850 * fVar257;
          auVar70._20_4_ = fStack_84c * fVar260;
          auVar70._24_4_ = fStack_848 * fVar287;
          auVar70._28_4_ = fVar133;
          local_b00 = vsubps_avx(auVar70,auVar278);
          fVar265 = local_420 * (fVar229 * fVar349 + fVar369);
          fVar284 = fStack_41c * (fVar233 * fVar355 + fVar374);
          fVar292 = fStack_418 * (fVar234 * fVar356 + fVar375);
          fVar294 = fStack_414 * (fVar235 * fVar357 + fVar376);
          fVar257 = fStack_410 * (fVar251 * fVar358 + fVar377);
          fVar260 = fStack_40c * (fVar259 * fVar359 + fVar378);
          fVar287 = fStack_408 * (fVar262 * fVar360 + fVar379);
          auVar309._0_4_ = fVar100 + fVar232 * fVar265;
          auVar309._4_4_ = fVar128 + fVar256 * fVar284;
          auVar309._8_4_ = fVar131 + fVar290 * fVar292;
          auVar309._12_4_ = fVar134 + fVar285 * fVar294;
          auVar309._16_4_ = fVar136 + fVar312 * fVar257;
          auVar309._20_4_ = fVar138 + fVar419 * fVar260;
          auVar309._24_4_ = fVar140 + fVar21 * fVar287;
          auVar309._28_4_ = fVar142 + fVar133;
          auVar71._4_4_ = fVar233 * (float)local_7c0._4_4_;
          auVar71._0_4_ = fVar229 * (float)local_7c0._0_4_;
          auVar71._8_4_ = fVar234 * fStack_7b8;
          auVar71._12_4_ = fVar235 * fStack_7b4;
          auVar71._16_4_ = fVar251 * fStack_7b0;
          auVar71._20_4_ = fVar259 * fStack_7ac;
          auVar71._24_4_ = fVar262 * fStack_7a8;
          auVar71._28_4_ = fStack_7a4;
          _local_880 = vsubps_avx(auVar71,auVar309);
          auVar310._0_4_ = fVar101 + fVar230 * fVar265;
          auVar310._4_4_ = fVar129 + fVar252 * fVar284;
          auVar310._8_4_ = fVar132 + fVar286 * fVar292;
          auVar310._12_4_ = fVar135 + fVar263 * fVar294;
          auVar310._16_4_ = fVar137 + fVar295 * fVar257;
          auVar310._20_4_ = fVar139 + fVar322 * fVar260;
          auVar310._24_4_ = fVar141 + fVar19 * fVar287;
          auVar310._28_4_ = fVar143 + local_880._28_4_;
          auVar72._4_4_ = (float)local_7e0._4_4_ * fVar233;
          auVar72._0_4_ = (float)local_7e0._0_4_ * fVar229;
          auVar72._8_4_ = fStack_7d8 * fVar234;
          auVar72._12_4_ = fStack_7d4 * fVar235;
          auVar72._16_4_ = fStack_7d0 * fVar251;
          auVar72._20_4_ = fStack_7cc * fVar259;
          auVar72._24_4_ = fStack_7c8 * fVar262;
          auVar72._28_4_ = fStack_7a4;
          _local_8a0 = vsubps_avx(auVar72,auVar310);
          auVar279._0_4_ = local_540._0_4_ + fVar231 * fVar265;
          auVar279._4_4_ = local_540._4_4_ + fVar254 * fVar284;
          auVar279._8_4_ = local_540._8_4_ + fVar288 * fVar292;
          auVar279._12_4_ = local_540._12_4_ + fVar266 * fVar294;
          auVar279._16_4_ = local_540._16_4_ + fVar297 * fVar257;
          auVar279._20_4_ = local_540._20_4_ + fVar387 * fVar260;
          auVar279._24_4_ = local_540._24_4_ + fVar20 * fVar287;
          auVar279._28_4_ = local_540._28_4_ + local_b00._28_4_ + fVar380;
          auVar73._4_4_ = (float)local_860._4_4_ * fVar233;
          auVar73._0_4_ = (float)local_860._0_4_ * fVar229;
          auVar73._8_4_ = fStack_858 * fVar234;
          auVar73._12_4_ = fStack_854 * fVar235;
          auVar73._16_4_ = fStack_850 * fVar251;
          auVar73._20_4_ = fStack_84c * fVar259;
          auVar73._24_4_ = fStack_848 * fVar262;
          auVar73._28_4_ = local_8a0._28_4_;
          _local_820 = vsubps_avx(auVar73,auVar279);
          auVar15 = vcmpps_avx(auVar14,_DAT_02020f00,5);
          auVar280._8_4_ = 0x7f800000;
          auVar280._0_8_ = 0x7f8000007f800000;
          auVar280._12_4_ = 0x7f800000;
          auVar280._16_4_ = 0x7f800000;
          auVar280._20_4_ = 0x7f800000;
          auVar280._24_4_ = 0x7f800000;
          auVar280._28_4_ = 0x7f800000;
          auVar168 = vblendvps_avx(auVar280,auVar66,auVar15);
          auVar335._8_4_ = 0x7fffffff;
          auVar335._0_8_ = 0x7fffffff7fffffff;
          auVar335._12_4_ = 0x7fffffff;
          auVar335._16_4_ = 0x7fffffff;
          auVar335._20_4_ = 0x7fffffff;
          auVar335._24_4_ = 0x7fffffff;
          auVar335._28_4_ = 0x7fffffff;
          auVar14 = vandps_avx(auVar335,local_440);
          auVar14 = vmaxps_avx(local_4e0,auVar14);
          auVar74._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar74._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar74._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar74._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar74._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar74._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar74._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar74._28_4_ = auVar14._28_4_;
          auVar14 = vandps_avx(auVar335,local_660);
          auVar14 = vcmpps_avx(auVar14,auVar74,1);
          auVar281._8_4_ = 0xff800000;
          auVar281._0_8_ = 0xff800000ff800000;
          auVar281._12_4_ = 0xff800000;
          auVar281._16_4_ = 0xff800000;
          auVar281._20_4_ = 0xff800000;
          auVar281._24_4_ = 0xff800000;
          auVar281._28_4_ = 0xff800000;
          auVar277 = vblendvps_avx(auVar281,auVar67,auVar15);
          auVar16 = auVar15 & auVar14;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar353 = vandps_avx(auVar14,auVar15);
            auVar147 = vpackssdw_avx(auVar353._0_16_,auVar353._16_16_);
            auVar405 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar16 = vcmpps_avx(local_ae0,auVar405,2);
            auVar423._8_4_ = 0xff800000;
            auVar423._0_8_ = 0xff800000ff800000;
            auVar423._12_4_ = 0xff800000;
            auVar423._16_4_ = 0xff800000;
            auVar423._20_4_ = 0xff800000;
            auVar423._24_4_ = 0xff800000;
            auVar423._28_4_ = 0xff800000;
            auVar425._8_4_ = 0x7f800000;
            auVar425._0_8_ = 0x7f8000007f800000;
            auVar425._12_4_ = 0x7f800000;
            auVar425._16_4_ = 0x7f800000;
            auVar425._20_4_ = 0x7f800000;
            auVar425._24_4_ = 0x7f800000;
            auVar425._28_4_ = 0x7f800000;
            auVar14 = vblendvps_avx(auVar425,auVar423,auVar16);
            auVar214 = vpmovsxwd_avx(auVar147);
            auVar147 = vpunpckhwd_avx(auVar147,auVar147);
            auVar336._16_16_ = auVar147;
            auVar336._0_16_ = auVar214;
            auVar168 = vblendvps_avx(auVar168,auVar14,auVar336);
            auVar13 = vblendvps_avx(auVar423,auVar425,auVar16);
            auVar277 = vblendvps_avx(auVar277,auVar13,auVar336);
            auVar14 = vcmpps_avx(auVar405,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar206._0_4_ = auVar353._0_4_ ^ auVar14._0_4_;
            auVar206._4_4_ = auVar353._4_4_ ^ auVar14._4_4_;
            auVar206._8_4_ = auVar353._8_4_ ^ auVar14._8_4_;
            auVar206._12_4_ = auVar353._12_4_ ^ auVar14._12_4_;
            auVar206._16_4_ = auVar353._16_4_ ^ auVar14._16_4_;
            auVar206._20_4_ = auVar353._20_4_ ^ auVar14._20_4_;
            auVar206._24_4_ = auVar353._24_4_ ^ auVar14._24_4_;
            auVar206._28_4_ = auVar353._28_4_ ^ auVar14._28_4_;
            auVar353 = vorps_avx(auVar16,auVar206);
            auVar353 = vandps_avx(auVar15,auVar353);
          }
          auVar386 = ZEXT3264(auVar13);
          auVar218 = local_a40._0_28_;
          auVar245 = local_9c0._0_28_;
          auVar363 = local_b00._0_28_;
        }
        _local_4c0 = local_640;
        local_4a0 = vminps_avx(local_460,auVar168);
        _local_480 = vmaxps_avx(local_640,auVar277);
        auVar14 = vcmpps_avx(local_640,local_4a0,2);
        local_540 = vandps_avx(auVar114,auVar14);
        local_5e0 = local_540;
        auVar14 = vcmpps_avx(_local_480,local_460,2);
        local_600 = vandps_avx(auVar114,auVar14);
        auVar114 = vorps_avx(local_600,local_540);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0x7f,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar114 >> 0xbf,0) == '\0') &&
            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar114[0x1f]) {
          auVar248._8_4_ = 0x3f800000;
          auVar248._0_8_ = &DAT_3f8000003f800000;
          auVar248._12_4_ = 0x3f800000;
          auVar248._16_4_ = 0x3f800000;
          auVar248._20_4_ = 0x3f800000;
          auVar248._24_4_ = 0x3f800000;
          auVar248._28_4_ = 0x3f800000;
          goto LAB_0111d7d1;
        }
        local_580 = local_600;
        local_840 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_5c0._0_4_ = auVar353._0_4_ ^ local_840._0_4_;
        local_5c0._4_4_ = auVar353._4_4_ ^ local_840._4_4_;
        local_5c0._8_4_ = (float)(auVar353._8_4_ ^ local_840._8_4_);
        local_5c0._12_4_ = (float)(auVar353._12_4_ ^ local_840._12_4_);
        local_5c0._16_4_ = (float)(auVar353._16_4_ ^ local_840._16_4_);
        local_5c0._20_4_ = (float)(auVar353._20_4_ ^ local_840._20_4_);
        local_5c0._24_4_ = (float)(auVar353._24_4_ ^ local_840._24_4_);
        local_5c0._28_4_ = (float)((uint)auVar353._28_4_ ^ (uint)local_840._28_4_);
        auVar122._0_4_ =
             auVar218._0_4_ * (float)local_7c0._0_4_ +
             auVar245._0_4_ * (float)local_7e0._0_4_ + auVar363._0_4_ * (float)local_860._0_4_;
        auVar122._4_4_ =
             auVar218._4_4_ * (float)local_7c0._4_4_ +
             auVar245._4_4_ * (float)local_7e0._4_4_ + auVar363._4_4_ * (float)local_860._4_4_;
        auVar122._8_4_ =
             auVar218._8_4_ * fStack_7b8 + auVar245._8_4_ * fStack_7d8 + auVar363._8_4_ * fStack_858
        ;
        auVar122._12_4_ =
             auVar218._12_4_ * fStack_7b4 +
             auVar245._12_4_ * fStack_7d4 + auVar363._12_4_ * fStack_854;
        auVar122._16_4_ =
             auVar218._16_4_ * fStack_7b0 +
             auVar245._16_4_ * fStack_7d0 + auVar363._16_4_ * fStack_850;
        auVar122._20_4_ =
             auVar218._20_4_ * fStack_7ac +
             auVar245._20_4_ * fStack_7cc + auVar363._20_4_ * fStack_84c;
        auVar122._24_4_ =
             auVar218._24_4_ * fStack_7a8 +
             auVar245._24_4_ * fStack_7c8 + auVar363._24_4_ * fStack_848;
        auVar122._28_4_ = local_840._28_4_ + local_540._28_4_ + auVar353._28_4_;
        auVar171._8_4_ = 0x7fffffff;
        auVar171._0_8_ = 0x7fffffff7fffffff;
        auVar171._12_4_ = 0x7fffffff;
        auVar171._16_4_ = 0x7fffffff;
        auVar171._20_4_ = 0x7fffffff;
        auVar171._24_4_ = 0x7fffffff;
        auVar171._28_4_ = 0x7fffffff;
        auVar114 = vandps_avx(auVar122,auVar171);
        auVar172._8_4_ = 0x3e99999a;
        auVar172._0_8_ = 0x3e99999a3e99999a;
        auVar172._12_4_ = 0x3e99999a;
        auVar172._16_4_ = 0x3e99999a;
        auVar172._20_4_ = 0x3e99999a;
        auVar172._24_4_ = 0x3e99999a;
        auVar172._28_4_ = 0x3e99999a;
        auVar114 = vcmpps_avx(auVar114,auVar172,1);
        auVar114 = vorps_avx(auVar114,local_5c0);
        auVar173._8_4_ = 3;
        auVar173._0_8_ = 0x300000003;
        auVar173._12_4_ = 3;
        auVar173._16_4_ = 3;
        auVar173._20_4_ = 3;
        auVar173._24_4_ = 3;
        auVar173._28_4_ = 3;
        auVar201._8_4_ = 2;
        auVar201._0_8_ = 0x200000002;
        auVar201._12_4_ = 2;
        auVar201._16_4_ = 2;
        auVar201._20_4_ = 2;
        auVar201._24_4_ = 2;
        auVar201._28_4_ = 2;
        auVar114 = vblendvps_avx(auVar201,auVar173,auVar114);
        local_5a0 = ZEXT432((uint)uVar96);
        auVar214 = vpshufd_avx(ZEXT416((uint)uVar96),0);
        auVar147 = vpcmpgtd_avx(auVar114._16_16_,auVar214);
        local_660._0_16_ = auVar214;
        auVar214 = vpcmpgtd_avx(auVar114._0_16_,auVar214);
        auVar174._16_16_ = auVar147;
        auVar174._0_16_ = auVar214;
        local_560 = vblendps_avx(ZEXT1632(auVar214),auVar174,0xf0);
        local_5e0 = vandnps_avx(local_560,local_540);
        auVar114 = local_540 & ~local_560;
        auVar228 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_620._0_8_ = uVar96;
        auVar353 = _local_480;
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          local_800._4_4_ = local_640._4_4_ + (float)local_940._4_4_;
          local_800._0_4_ = local_640._0_4_ + (float)local_940._0_4_;
          fStack_7f8 = local_640._8_4_ + fStack_938;
          fStack_7f4 = local_640._12_4_ + fStack_934;
          fStack_7f0 = local_640._16_4_ + fStack_930;
          fStack_7ec = local_640._20_4_ + fStack_92c;
          fStack_7e8 = local_640._24_4_ + fStack_928;
          fStack_7e4 = local_640._28_4_ + fStack_924;
          local_9e0 = _local_480;
          do {
            auVar237 = auVar228._0_16_;
            auVar175._8_4_ = 0x7f800000;
            auVar175._0_8_ = 0x7f8000007f800000;
            auVar175._12_4_ = 0x7f800000;
            auVar175._16_4_ = 0x7f800000;
            auVar175._20_4_ = 0x7f800000;
            auVar175._24_4_ = 0x7f800000;
            auVar175._28_4_ = 0x7f800000;
            auVar114 = vblendvps_avx(auVar175,local_640,local_5e0);
            auVar353 = vshufps_avx(auVar114,auVar114,0xb1);
            auVar353 = vminps_avx(auVar114,auVar353);
            auVar14 = vshufpd_avx(auVar353,auVar353,5);
            auVar353 = vminps_avx(auVar353,auVar14);
            auVar14 = vperm2f128_avx(auVar353,auVar353,1);
            auVar353 = vminps_avx(auVar353,auVar14);
            auVar353 = vcmpps_avx(auVar114,auVar353,0);
            auVar14 = local_5e0 & auVar353;
            auVar114 = local_5e0;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar114 = vandps_avx(auVar353,local_5e0);
            }
            uVar94 = vmovmskps_avx(auVar114);
            uVar12 = 0;
            if (uVar94 != 0) {
              for (; (uVar94 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar96 = (ulong)uVar12;
            *(undefined4 *)(local_5e0 + uVar96 * 4) = 0;
            fVar229 = local_500[uVar96];
            uVar12 = *(uint *)(local_4c0 + uVar96 * 4);
            fVar230 = local_b04;
            if ((float)local_960._0_4_ < 0.0) {
              fVar230 = sqrtf((float)local_960._0_4_);
              auVar237._8_4_ = 0x7fffffff;
              auVar237._0_8_ = 0x7fffffff7fffffff;
              auVar237._12_4_ = 0x7fffffff;
            }
            auVar386 = ZEXT464(uVar12);
            auVar214 = vminps_avx(_local_a80,_local_aa0);
            auVar147 = vmaxps_avx(_local_a80,_local_aa0);
            auVar106 = vminps_avx(_local_a90,_local_ab0);
            auVar191 = vminps_avx(auVar214,auVar106);
            auVar214 = vmaxps_avx(_local_a90,_local_ab0);
            auVar106 = vmaxps_avx(auVar147,auVar214);
            auVar147 = vandps_avx(auVar191,auVar237);
            auVar214 = vandps_avx(auVar106,auVar237);
            auVar147 = vmaxps_avx(auVar147,auVar214);
            auVar214 = vmovshdup_avx(auVar147);
            auVar214 = vmaxss_avx(auVar214,auVar147);
            auVar147 = vshufpd_avx(auVar147,auVar147,1);
            auVar147 = vmaxss_avx(auVar147,auVar214);
            local_a40._0_4_ = auVar147._0_4_ * 1.9073486e-06;
            local_900._0_4_ = fVar230 * 1.9073486e-06;
            local_7a0._0_16_ = vshufps_avx(auVar106,auVar106,0xff);
            lVar95 = 4;
            do {
              local_b00._0_4_ = 1.0 - fVar229;
              auVar147 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
              fVar230 = auVar147._0_4_;
              fVar231 = auVar147._4_4_;
              fVar232 = auVar147._8_4_;
              fVar233 = auVar147._12_4_;
              auVar147 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_),0
                                    );
              fVar234 = auVar147._0_4_;
              fVar235 = auVar147._4_4_;
              fVar251 = auVar147._8_4_;
              fVar252 = auVar147._12_4_;
              fVar254 = (float)local_a90._0_4_ * fVar230 + (float)local_aa0._0_4_ * fVar234;
              fVar256 = (float)local_a90._4_4_ * fVar231 + (float)local_aa0._4_4_ * fVar235;
              fVar259 = fStack_a88 * fVar232 + fStack_a98 * fVar251;
              fVar262 = fStack_a84 * fVar233 + fStack_a94 * fVar252;
              auVar269._0_4_ =
                   fVar234 * ((float)local_aa0._0_4_ * fVar230 + fVar234 * (float)local_a80._0_4_) +
                   fVar230 * fVar254;
              auVar269._4_4_ =
                   fVar235 * ((float)local_aa0._4_4_ * fVar231 + fVar235 * (float)local_a80._4_4_) +
                   fVar231 * fVar256;
              auVar269._8_4_ =
                   fVar251 * (fStack_a98 * fVar232 + fVar251 * fStack_a78) + fVar232 * fVar259;
              auVar269._12_4_ =
                   fVar252 * (fStack_a94 * fVar233 + fVar252 * fStack_a74) + fVar233 * fVar262;
              auVar210._0_4_ =
                   fVar234 * fVar254 +
                   fVar230 * (fVar230 * (float)local_ab0._0_4_ + (float)local_a90._0_4_ * fVar234);
              auVar210._4_4_ =
                   fVar235 * fVar256 +
                   fVar231 * (fVar231 * (float)local_ab0._4_4_ + (float)local_a90._4_4_ * fVar235);
              auVar210._8_4_ =
                   fVar251 * fVar259 + fVar232 * (fVar232 * fStack_aa8 + fStack_a88 * fVar251);
              auVar210._12_4_ =
                   fVar252 * fVar262 + fVar233 * (fVar233 * fStack_aa4 + fStack_a84 * fVar252);
              auVar147 = vshufps_avx(auVar386._0_16_,auVar386._0_16_,0);
              auVar148._0_4_ = auVar147._0_4_ * (float)local_950._0_4_ + 0.0;
              auVar148._4_4_ = auVar147._4_4_ * (float)local_950._4_4_ + 0.0;
              auVar148._8_4_ = auVar147._8_4_ * fStack_948 + 0.0;
              auVar148._12_4_ = auVar147._12_4_ * fStack_944 + 0.0;
              auVar105._0_4_ = fVar234 * auVar269._0_4_ + fVar230 * auVar210._0_4_;
              auVar105._4_4_ = fVar235 * auVar269._4_4_ + fVar231 * auVar210._4_4_;
              auVar105._8_4_ = fVar251 * auVar269._8_4_ + fVar232 * auVar210._8_4_;
              auVar105._12_4_ = fVar252 * auVar269._12_4_ + fVar233 * auVar210._12_4_;
              local_8e0._0_16_ = auVar105;
              auVar147 = vsubps_avx(auVar148,auVar105);
              _local_9c0 = auVar147;
              auVar147 = vdpps_avx(auVar147,auVar147,0x7f);
              fVar230 = auVar147._0_4_;
              local_bc0 = auVar386._0_4_;
              if (fVar230 < 0.0) {
                local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                local_ae0._0_16_ = auVar269;
                local_980._0_16_ = auVar210;
                fVar231 = sqrtf(fVar230);
                auVar210 = local_980._0_16_;
                auVar269 = local_ae0._0_16_;
              }
              else {
                auVar214 = vsqrtss_avx(auVar147,auVar147);
                fVar231 = auVar214._0_4_;
              }
              auVar214 = vsubps_avx(auVar210,auVar269);
              auVar300._0_4_ = auVar214._0_4_ * 3.0;
              auVar300._4_4_ = auVar214._4_4_ * 3.0;
              auVar300._8_4_ = auVar214._8_4_ * 3.0;
              auVar300._12_4_ = auVar214._12_4_ * 3.0;
              auVar214 = vshufps_avx(ZEXT416((uint)(fVar229 * 6.0)),ZEXT416((uint)(fVar229 * 6.0)),0
                                    );
              auVar106 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar229 + fVar229)) * 6.0));
              auVar191 = vshufps_avx(auVar106,auVar106,0);
              auVar106 = ZEXT416((uint)((fVar229 - ((float)local_b00._0_4_ + (float)local_b00._0_4_)
                                        ) * 6.0));
              auVar211 = vshufps_avx(auVar106,auVar106,0);
              auVar3 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                   ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
              auVar106 = vdpps_avx(auVar300,auVar300,0x7f);
              auVar149._0_4_ =
                   auVar3._0_4_ * (float)local_a80._0_4_ +
                   auVar211._0_4_ * (float)local_aa0._0_4_ +
                   auVar214._0_4_ * (float)local_ab0._0_4_ + auVar191._0_4_ * (float)local_a90._0_4_
              ;
              auVar149._4_4_ =
                   auVar3._4_4_ * (float)local_a80._4_4_ +
                   auVar211._4_4_ * (float)local_aa0._4_4_ +
                   auVar214._4_4_ * (float)local_ab0._4_4_ + auVar191._4_4_ * (float)local_a90._4_4_
              ;
              auVar149._8_4_ =
                   auVar3._8_4_ * fStack_a78 +
                   auVar211._8_4_ * fStack_a98 +
                   auVar214._8_4_ * fStack_aa8 + auVar191._8_4_ * fStack_a88;
              auVar149._12_4_ =
                   auVar3._12_4_ * fStack_a74 +
                   auVar211._12_4_ * fStack_a94 +
                   auVar214._12_4_ * fStack_aa4 + auVar191._12_4_ * fStack_a84;
              auVar214 = vblendps_avx(auVar106,_DAT_01feba10,0xe);
              auVar191 = vrsqrtss_avx(auVar214,auVar214);
              fVar233 = auVar191._0_4_;
              fVar232 = auVar106._0_4_;
              auVar191 = vdpps_avx(auVar300,auVar149,0x7f);
              auVar211 = vshufps_avx(auVar106,auVar106,0);
              auVar150._0_4_ = auVar149._0_4_ * auVar211._0_4_;
              auVar150._4_4_ = auVar149._4_4_ * auVar211._4_4_;
              auVar150._8_4_ = auVar149._8_4_ * auVar211._8_4_;
              auVar150._12_4_ = auVar149._12_4_ * auVar211._12_4_;
              auVar191 = vshufps_avx(auVar191,auVar191,0);
              auVar238._0_4_ = auVar300._0_4_ * auVar191._0_4_;
              auVar238._4_4_ = auVar300._4_4_ * auVar191._4_4_;
              auVar238._8_4_ = auVar300._8_4_ * auVar191._8_4_;
              auVar238._12_4_ = auVar300._12_4_ * auVar191._12_4_;
              auVar3 = vsubps_avx(auVar150,auVar238);
              auVar191 = vrcpss_avx(auVar214,auVar214);
              auVar214 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                    ZEXT416((uint)(local_bc0 * (float)local_900._0_4_)));
              auVar191 = ZEXT416((uint)(auVar191._0_4_ * (2.0 - fVar232 * auVar191._0_4_)));
              auVar191 = vshufps_avx(auVar191,auVar191,0);
              uVar96 = CONCAT44(auVar300._4_4_,auVar300._0_4_);
              local_a20._0_8_ = uVar96 ^ 0x8000000080000000;
              local_a20._8_4_ = -auVar300._8_4_;
              local_a20._12_4_ = -auVar300._12_4_;
              auVar211 = ZEXT416((uint)(fVar233 * 1.5 + fVar232 * -0.5 * fVar233 * fVar233 * fVar233
                                       ));
              auVar211 = vshufps_avx(auVar211,auVar211,0);
              auVar212._0_4_ = auVar211._0_4_ * auVar3._0_4_ * auVar191._0_4_;
              auVar212._4_4_ = auVar211._4_4_ * auVar3._4_4_ * auVar191._4_4_;
              auVar212._8_4_ = auVar211._8_4_ * auVar3._8_4_ * auVar191._8_4_;
              auVar212._12_4_ = auVar211._12_4_ * auVar3._12_4_ * auVar191._12_4_;
              auVar362._0_4_ = auVar300._0_4_ * auVar211._0_4_;
              auVar362._4_4_ = auVar300._4_4_ * auVar211._4_4_;
              auVar362._8_4_ = auVar300._8_4_ * auVar211._8_4_;
              auVar362._12_4_ = auVar300._12_4_ * auVar211._12_4_;
              local_b00._0_16_ = auVar300;
              local_ae0._0_4_ = auVar214._0_4_;
              if (fVar232 < 0.0) {
                local_980._0_4_ = fVar231;
                local_9a0._0_16_ = auVar362;
                local_920._0_16_ = auVar212;
                fVar233 = sqrtf(fVar232);
                auVar212 = local_920._0_16_;
                auVar362 = local_9a0._0_16_;
                fVar231 = (float)local_980._0_4_;
                fVar232 = (float)local_ae0._0_4_;
              }
              else {
                auVar106 = vsqrtss_avx(auVar106,auVar106);
                fVar233 = auVar106._0_4_;
                fVar232 = auVar214._0_4_;
              }
              auVar214 = vdpps_avx(_local_9c0,auVar362,0x7f);
              local_980._0_4_ =
                   ((float)local_a40._0_4_ / fVar233) * (fVar231 + 1.0) +
                   fVar232 + fVar231 * (float)local_a40._0_4_;
              auVar106 = vdpps_avx(local_a20._0_16_,auVar362,0x7f);
              auVar191 = vdpps_avx(_local_9c0,auVar212,0x7f);
              auVar211 = vdpps_avx(_local_950,auVar362,0x7f);
              auVar3 = vdpps_avx(_local_9c0,local_a20._0_16_,0x7f);
              fVar231 = auVar106._0_4_ + auVar191._0_4_;
              fVar233 = auVar214._0_4_;
              auVar107._0_4_ = fVar233 * fVar233;
              auVar107._4_4_ = auVar214._4_4_ * auVar214._4_4_;
              auVar107._8_4_ = auVar214._8_4_ * auVar214._8_4_;
              auVar107._12_4_ = auVar214._12_4_ * auVar214._12_4_;
              auVar191 = vsubps_avx(auVar147,auVar107);
              local_a20._0_16_ = ZEXT416((uint)fVar231);
              auVar106 = vdpps_avx(_local_9c0,_local_950,0x7f);
              fVar234 = auVar3._0_4_ - fVar233 * fVar231;
              fVar233 = auVar106._0_4_ - fVar233 * auVar211._0_4_;
              auVar106 = vrsqrtss_avx(auVar191,auVar191);
              fVar235 = auVar191._0_4_;
              fVar231 = auVar106._0_4_;
              fVar231 = fVar231 * 1.5 + fVar235 * -0.5 * fVar231 * fVar231 * fVar231;
              if (fVar235 < 0.0) {
                local_9a0._0_16_ = auVar214;
                local_920._0_16_ = auVar211;
                local_740._0_4_ = fVar234;
                local_760._0_4_ = fVar233;
                local_780._0_4_ = fVar231;
                fVar235 = sqrtf(fVar235);
                fVar231 = (float)local_780._0_4_;
                fVar234 = (float)local_740._0_4_;
                fVar233 = (float)local_760._0_4_;
                auVar211 = local_920._0_16_;
                auVar214 = local_9a0._0_16_;
                fVar232 = (float)local_ae0._0_4_;
              }
              else {
                auVar106 = vsqrtss_avx(auVar191,auVar191);
                fVar235 = auVar106._0_4_;
              }
              auVar191 = vpermilps_avx(local_8e0._0_16_,0xff);
              auVar3 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
              fVar234 = fVar234 * fVar231 - auVar3._0_4_;
              auVar239._0_8_ = auVar211._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = auVar211._8_4_ ^ 0x80000000;
              auVar239._12_4_ = auVar211._12_4_ ^ 0x80000000;
              auVar270._0_4_ = -fVar234;
              auVar270._4_4_ = 0x80000000;
              auVar270._8_4_ = 0x80000000;
              auVar270._12_4_ = 0x80000000;
              auVar106 = vinsertps_avx(ZEXT416((uint)(fVar233 * fVar231)),auVar239,0x10);
              auVar211 = vmovsldup_avx(ZEXT416((uint)(local_a20._0_4_ * fVar233 * fVar231 -
                                                     auVar211._0_4_ * fVar234)));
              auVar106 = vdivps_avx(auVar106,auVar211);
              auVar151 = ZEXT416((uint)(fVar235 - auVar191._0_4_));
              auVar191 = vinsertps_avx(auVar214,auVar151,0x10);
              auVar213._0_4_ = auVar191._0_4_ * auVar106._0_4_;
              auVar213._4_4_ = auVar191._4_4_ * auVar106._4_4_;
              auVar213._8_4_ = auVar191._8_4_ * auVar106._8_4_;
              auVar213._12_4_ = auVar191._12_4_ * auVar106._12_4_;
              auVar106 = vinsertps_avx(auVar270,local_a20._0_16_,0x1c);
              auVar106 = vdivps_avx(auVar106,auVar211);
              auVar192._0_4_ = auVar191._0_4_ * auVar106._0_4_;
              auVar192._4_4_ = auVar191._4_4_ * auVar106._4_4_;
              auVar192._8_4_ = auVar191._8_4_ * auVar106._8_4_;
              auVar192._12_4_ = auVar191._12_4_ * auVar106._12_4_;
              auVar106 = vhaddps_avx(auVar213,auVar213);
              auVar191 = vhaddps_avx(auVar192,auVar192);
              fVar229 = fVar229 - auVar106._0_4_;
              local_bc0 = local_bc0 - auVar191._0_4_;
              auVar386 = ZEXT464((uint)local_bc0);
              auVar240._8_4_ = 0x7fffffff;
              auVar240._0_8_ = 0x7fffffff7fffffff;
              auVar240._12_4_ = 0x7fffffff;
              auVar228 = ZEXT1664(auVar240);
              auVar214 = vandps_avx(auVar214,auVar240);
              if ((float)local_980._0_4_ <= auVar214._0_4_) {
LAB_0111e1d0:
                bVar75 = false;
              }
              else {
                auVar214 = vandps_avx(auVar151,auVar240);
                if ((float)local_7a0._0_4_ * 1.9073486e-06 + fVar232 + (float)local_980._0_4_ <=
                    auVar214._0_4_) goto LAB_0111e1d0;
                local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                auVar386 = ZEXT464((uint)local_bc0);
                bVar75 = true;
                if ((((fVar207 <= local_bc0) &&
                     (fVar231 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar231)) &&
                    (0.0 <= fVar229)) && (fVar229 <= 1.0)) {
                  auVar147 = vrsqrtss_avx(auVar147,auVar147);
                  fVar232 = auVar147._0_4_;
                  pGVar9 = (context->scene->geometries).items[uVar92].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar147 = ZEXT416((uint)(fVar232 * 1.5 +
                                             fVar230 * -0.5 * fVar232 * fVar232 * fVar232));
                    auVar147 = vshufps_avx(auVar147,auVar147,0);
                    auVar152._0_4_ = auVar147._0_4_ * (float)local_9c0._0_4_;
                    auVar152._4_4_ = auVar147._4_4_ * (float)local_9c0._4_4_;
                    auVar152._8_4_ = auVar147._8_4_ * fStack_9b8;
                    auVar152._12_4_ = auVar147._12_4_ * fStack_9b4;
                    auVar108._0_4_ = local_b00._0_4_ + auVar3._0_4_ * auVar152._0_4_;
                    auVar108._4_4_ = local_b00._4_4_ + auVar3._4_4_ * auVar152._4_4_;
                    auVar108._8_4_ = local_b00._8_4_ + auVar3._8_4_ * auVar152._8_4_;
                    auVar108._12_4_ = local_b00._12_4_ + auVar3._12_4_ * auVar152._12_4_;
                    auVar147 = vshufps_avx(auVar152,auVar152,0xc9);
                    auVar214 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                    auVar153._0_4_ = auVar214._0_4_ * auVar152._0_4_;
                    auVar153._4_4_ = auVar214._4_4_ * auVar152._4_4_;
                    auVar153._8_4_ = auVar214._8_4_ * auVar152._8_4_;
                    auVar153._12_4_ = auVar214._12_4_ * auVar152._12_4_;
                    auVar193._0_4_ = local_b00._0_4_ * auVar147._0_4_;
                    auVar193._4_4_ = local_b00._4_4_ * auVar147._4_4_;
                    auVar193._8_4_ = local_b00._8_4_ * auVar147._8_4_;
                    auVar193._12_4_ = local_b00._12_4_ * auVar147._12_4_;
                    auVar106 = vsubps_avx(auVar193,auVar153);
                    auVar147 = vshufps_avx(auVar106,auVar106,0xc9);
                    auVar214 = vshufps_avx(auVar108,auVar108,0xc9);
                    auVar194._0_4_ = auVar214._0_4_ * auVar147._0_4_;
                    auVar194._4_4_ = auVar214._4_4_ * auVar147._4_4_;
                    auVar194._8_4_ = auVar214._8_4_ * auVar147._8_4_;
                    auVar194._12_4_ = auVar214._12_4_ * auVar147._12_4_;
                    auVar147 = vshufps_avx(auVar106,auVar106,0xd2);
                    auVar109._0_4_ = auVar108._0_4_ * auVar147._0_4_;
                    auVar109._4_4_ = auVar108._4_4_ * auVar147._4_4_;
                    auVar109._8_4_ = auVar108._8_4_ * auVar147._8_4_;
                    auVar109._12_4_ = auVar108._12_4_ * auVar147._12_4_;
                    auVar147 = vsubps_avx(auVar194,auVar109);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      uVar2 = vextractps_avx(auVar147,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                      uVar2 = vextractps_avx(auVar147,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                      *(int *)(ray + k * 4 + 0xe0) = auVar147._0_4_;
                      *(float *)(ray + k * 4 + 0xf0) = fVar229;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_9e8;
                      *(uint *)(ray + k * 4 + 0x120) = uVar92;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      auVar214 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                      local_700 = (RTCHitN  [16])vshufps_avx(auVar147,auVar147,0x55);
                      auVar106 = vshufps_avx(auVar147,auVar147,0xaa);
                      local_6e0 = vshufps_avx(auVar147,auVar147,0);
                      auStack_6f0 = auVar106;
                      local_6d0 = auVar214;
                      local_6c0 = ZEXT816(0) << 0x20;
                      local_6b0 = local_720._0_8_;
                      uStack_6a8 = local_720._8_8_;
                      local_6a0 = local_710._0_8_;
                      uStack_698 = local_710._8_8_;
                      uVar12 = context->user->instID[0];
                      _local_690 = CONCAT44(uVar12,uVar12);
                      _uStack_688 = CONCAT44(uVar12,uVar12);
                      uVar12 = context->user->instPrimID[0];
                      _uStack_680 = CONCAT44(uVar12,uVar12);
                      _uStack_678 = CONCAT44(uVar12,uVar12);
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      local_b20 = *local_9f0;
                      uStack_b18 = local_9f0[1];
                      local_a70.valid = (int *)&local_b20;
                      local_a70.geometryUserPtr = pGVar9->userPtr;
                      local_a70.context = context->user;
                      local_a70.hit = local_700;
                      local_a70.N = 4;
                      local_a70.ray = (RTCRayN *)ray;
                      if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->intersectionFilterN)(&local_a70);
                        auVar228._8_56_ = extraout_var;
                        auVar228._0_8_ = extraout_XMM1_Qa;
                        auVar214 = auVar228._0_16_;
                      }
                      auVar86._8_8_ = uStack_b18;
                      auVar86._0_8_ = local_b20;
                      if (auVar86 == (undefined1  [16])0x0) {
                        auVar147 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar214 = vpcmpeqd_avx(auVar214,auVar214);
                        auVar147 = auVar147 ^ auVar214;
                        auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      }
                      else {
                        p_Var11 = context->args->filter;
                        auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        auVar214 = vpcmpeqd_avx(auVar106,auVar106);
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_a70);
                          auVar214 = vpcmpeqd_avx(auVar214,auVar214);
                          auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar87._8_8_ = uStack_b18;
                        auVar87._0_8_ = local_b20;
                        auVar106 = vpcmpeqd_avx(auVar87,_DAT_01feba10);
                        auVar147 = auVar106 ^ auVar214;
                        if (auVar87 != (undefined1  [16])0x0) {
                          auVar106 = auVar106 ^ auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])local_a70.hit);
                          *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x10));
                          *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x20));
                          *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x30));
                          *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x40));
                          *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x50));
                          *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x60));
                          *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x70));
                          *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x80));
                          *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar214;
                        }
                      }
                      auVar386 = ZEXT464((uint)local_bc0);
                      auVar154._8_8_ = 0x100000001;
                      auVar154._0_8_ = 0x100000001;
                      if ((auVar154 & auVar147) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar231;
                      }
                    }
                  }
                }
              }
              auVar114 = local_5e0;
              bVar98 = lVar95 != 0;
              lVar95 = lVar95 + -1;
            } while ((!bVar75) && (bVar98));
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar123._4_4_ = uVar2;
            auVar123._0_4_ = uVar2;
            auVar123._8_4_ = uVar2;
            auVar123._12_4_ = uVar2;
            auVar123._16_4_ = uVar2;
            auVar123._20_4_ = uVar2;
            auVar123._24_4_ = uVar2;
            auVar123._28_4_ = uVar2;
            auVar353 = vcmpps_avx(_local_800,auVar123,2);
            local_5e0 = vandps_avx(auVar353,local_5e0);
            auVar114 = auVar114 & auVar353;
            uVar96 = local_620._0_8_;
            auVar353 = local_9e0;
          } while ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar114 >> 0x7f,0) != '\0') ||
                     (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar114 >> 0xbf,0) != '\0') ||
                   (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar114[0x1f] < '\0');
        }
        auVar124._0_4_ =
             (float)local_880._0_4_ * (float)local_7c0._0_4_ +
             (float)local_8a0._0_4_ * (float)local_7e0._0_4_ +
             (float)local_820._0_4_ * (float)local_860._0_4_;
        auVar124._4_4_ =
             (float)local_880._4_4_ * (float)local_7c0._4_4_ +
             (float)local_8a0._4_4_ * (float)local_7e0._4_4_ +
             (float)local_820._4_4_ * (float)local_860._4_4_;
        auVar124._8_4_ = fStack_878 * fStack_7b8 + fStack_898 * fStack_7d8 + fStack_818 * fStack_858
        ;
        auVar124._12_4_ =
             fStack_874 * fStack_7b4 + fStack_894 * fStack_7d4 + fStack_814 * fStack_854;
        auVar124._16_4_ =
             fStack_870 * fStack_7b0 + fStack_890 * fStack_7d0 + fStack_810 * fStack_850;
        auVar124._20_4_ =
             fStack_86c * fStack_7ac + fStack_88c * fStack_7cc + fStack_80c * fStack_84c;
        auVar124._24_4_ =
             fStack_868 * fStack_7a8 + fStack_888 * fStack_7c8 + fStack_808 * fStack_848;
        auVar124._28_4_ = fStack_864 + fStack_884 + fStack_804;
        auVar176._8_4_ = 0x7fffffff;
        auVar176._0_8_ = 0x7fffffff7fffffff;
        auVar176._12_4_ = 0x7fffffff;
        auVar176._16_4_ = 0x7fffffff;
        auVar176._20_4_ = 0x7fffffff;
        auVar176._24_4_ = 0x7fffffff;
        auVar176._28_4_ = 0x7fffffff;
        auVar114 = vandps_avx(auVar124,auVar176);
        auVar177._8_4_ = 0x3e99999a;
        auVar177._0_8_ = 0x3e99999a3e99999a;
        auVar177._12_4_ = 0x3e99999a;
        auVar177._16_4_ = 0x3e99999a;
        auVar177._20_4_ = 0x3e99999a;
        auVar177._24_4_ = 0x3e99999a;
        auVar177._28_4_ = 0x3e99999a;
        auVar114 = vcmpps_avx(auVar114,auVar177,1);
        auVar14 = vorps_avx(auVar114,local_5c0);
        auVar178._0_4_ = auVar353._0_4_ + (float)local_940._0_4_;
        auVar178._4_4_ = auVar353._4_4_ + (float)local_940._4_4_;
        auVar178._8_4_ = auVar353._8_4_ + fStack_938;
        auVar178._12_4_ = auVar353._12_4_ + fStack_934;
        auVar178._16_4_ = auVar353._16_4_ + fStack_930;
        auVar178._20_4_ = auVar353._20_4_ + fStack_92c;
        auVar178._24_4_ = auVar353._24_4_ + fStack_928;
        auVar178._28_4_ = auVar353._28_4_ + fStack_924;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar202._4_4_ = uVar2;
        auVar202._0_4_ = uVar2;
        auVar202._8_4_ = uVar2;
        auVar202._12_4_ = uVar2;
        auVar202._16_4_ = uVar2;
        auVar202._20_4_ = uVar2;
        auVar202._24_4_ = uVar2;
        auVar202._28_4_ = uVar2;
        auVar114 = vcmpps_avx(auVar178,auVar202,2);
        _local_880 = vandps_avx(auVar114,local_580);
        auVar179._8_4_ = 3;
        auVar179._0_8_ = 0x300000003;
        auVar179._12_4_ = 3;
        auVar179._16_4_ = 3;
        auVar179._20_4_ = 3;
        auVar179._24_4_ = 3;
        auVar179._28_4_ = 3;
        auVar203._8_4_ = 2;
        auVar203._0_8_ = 0x200000002;
        auVar203._12_4_ = 2;
        auVar203._16_4_ = 2;
        auVar203._20_4_ = 2;
        auVar203._24_4_ = 2;
        auVar203._28_4_ = 2;
        auVar114 = vblendvps_avx(auVar203,auVar179,auVar14);
        auVar147 = vpcmpgtd_avx(auVar114._16_16_,local_660._0_16_);
        auVar214 = vpshufd_avx(local_5a0._0_16_,0);
        auVar214 = vpcmpgtd_avx(auVar114._0_16_,auVar214);
        auVar180._16_16_ = auVar147;
        auVar180._0_16_ = auVar214;
        _local_8a0 = vblendps_avx(ZEXT1632(auVar214),auVar180,0xf0);
        local_600 = vandnps_avx(_local_8a0,_local_880);
        auVar114 = _local_880 & ~_local_8a0;
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          local_7a0 = _local_480;
          local_800._4_4_ = (float)local_480._4_4_ + (float)local_940._4_4_;
          local_800._0_4_ = (float)local_480._0_4_ + (float)local_940._0_4_;
          fStack_7f8 = fStack_478 + fStack_938;
          fStack_7f4 = fStack_474 + fStack_934;
          fStack_7f0 = fStack_470 + fStack_930;
          fStack_7ec = fStack_46c + fStack_92c;
          fStack_7e8 = fStack_468 + fStack_928;
          fStack_7e4 = fStack_464 + fStack_924;
          do {
            auVar241 = auVar228._0_16_;
            auVar181._8_4_ = 0x7f800000;
            auVar181._0_8_ = 0x7f8000007f800000;
            auVar181._12_4_ = 0x7f800000;
            auVar181._16_4_ = 0x7f800000;
            auVar181._20_4_ = 0x7f800000;
            auVar181._24_4_ = 0x7f800000;
            auVar181._28_4_ = 0x7f800000;
            auVar114 = vblendvps_avx(auVar181,local_7a0,local_600);
            auVar353 = vshufps_avx(auVar114,auVar114,0xb1);
            auVar353 = vminps_avx(auVar114,auVar353);
            auVar14 = vshufpd_avx(auVar353,auVar353,5);
            auVar353 = vminps_avx(auVar353,auVar14);
            auVar14 = vperm2f128_avx(auVar353,auVar353,1);
            auVar353 = vminps_avx(auVar353,auVar14);
            auVar353 = vcmpps_avx(auVar114,auVar353,0);
            auVar14 = local_600 & auVar353;
            auVar114 = local_600;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar114 = vandps_avx(auVar353,local_600);
            }
            uVar94 = vmovmskps_avx(auVar114);
            uVar12 = 0;
            if (uVar94 != 0) {
              for (; (uVar94 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar96 = (ulong)uVar12;
            *(undefined4 *)(local_600 + uVar96 * 4) = 0;
            fVar229 = local_520[uVar96];
            uVar12 = *(uint *)(local_460 + uVar96 * 4);
            fVar230 = local_b08;
            if ((float)local_960._0_4_ < 0.0) {
              fVar230 = sqrtf((float)local_960._0_4_);
              auVar241._8_4_ = 0x7fffffff;
              auVar241._0_8_ = 0x7fffffff7fffffff;
              auVar241._12_4_ = 0x7fffffff;
            }
            auVar250 = ZEXT464(uVar12);
            auVar214 = vminps_avx(_local_a80,_local_aa0);
            auVar147 = vmaxps_avx(_local_a80,_local_aa0);
            auVar106 = vminps_avx(_local_a90,_local_ab0);
            auVar191 = vminps_avx(auVar214,auVar106);
            auVar214 = vmaxps_avx(_local_a90,_local_ab0);
            auVar106 = vmaxps_avx(auVar147,auVar214);
            auVar147 = vandps_avx(auVar191,auVar241);
            auVar214 = vandps_avx(auVar106,auVar241);
            auVar147 = vmaxps_avx(auVar147,auVar214);
            auVar214 = vmovshdup_avx(auVar147);
            auVar214 = vmaxss_avx(auVar214,auVar147);
            auVar147 = vshufpd_avx(auVar147,auVar147,1);
            auVar147 = vmaxss_avx(auVar147,auVar214);
            local_a40._0_4_ = auVar147._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar230 * 1.9073486e-06;
            local_780._0_16_ = vshufps_avx(auVar106,auVar106,0xff);
            lVar95 = 4;
            do {
              local_b00._0_4_ = 1.0 - fVar229;
              auVar147 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
              fVar230 = auVar147._0_4_;
              fVar231 = auVar147._4_4_;
              fVar232 = auVar147._8_4_;
              fVar233 = auVar147._12_4_;
              auVar147 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_),0
                                    );
              fVar234 = auVar147._0_4_;
              fVar235 = auVar147._4_4_;
              fVar251 = auVar147._8_4_;
              fVar252 = auVar147._12_4_;
              fVar254 = (float)local_a90._0_4_ * fVar230 + (float)local_aa0._0_4_ * fVar234;
              fVar256 = (float)local_a90._4_4_ * fVar231 + (float)local_aa0._4_4_ * fVar235;
              fVar259 = fStack_a88 * fVar232 + fStack_a98 * fVar251;
              fVar262 = fStack_a84 * fVar233 + fStack_a94 * fVar252;
              auVar271._0_4_ =
                   fVar234 * ((float)local_aa0._0_4_ * fVar230 + fVar234 * (float)local_a80._0_4_) +
                   fVar230 * fVar254;
              auVar271._4_4_ =
                   fVar235 * ((float)local_aa0._4_4_ * fVar231 + fVar235 * (float)local_a80._4_4_) +
                   fVar231 * fVar256;
              auVar271._8_4_ =
                   fVar251 * (fStack_a98 * fVar232 + fVar251 * fStack_a78) + fVar232 * fVar259;
              auVar271._12_4_ =
                   fVar252 * (fStack_a94 * fVar233 + fVar252 * fStack_a74) + fVar233 * fVar262;
              auVar215._0_4_ =
                   fVar234 * fVar254 +
                   fVar230 * (fVar230 * (float)local_ab0._0_4_ + (float)local_a90._0_4_ * fVar234);
              auVar215._4_4_ =
                   fVar235 * fVar256 +
                   fVar231 * (fVar231 * (float)local_ab0._4_4_ + (float)local_a90._4_4_ * fVar235);
              auVar215._8_4_ =
                   fVar251 * fVar259 + fVar232 * (fVar232 * fStack_aa8 + fStack_a88 * fVar251);
              auVar215._12_4_ =
                   fVar252 * fVar262 + fVar233 * (fVar233 * fStack_aa4 + fStack_a84 * fVar252);
              auVar147 = vshufps_avx(auVar250._0_16_,auVar250._0_16_,0);
              auVar155._0_4_ = auVar147._0_4_ * (float)local_950._0_4_ + 0.0;
              auVar155._4_4_ = auVar147._4_4_ * (float)local_950._4_4_ + 0.0;
              auVar155._8_4_ = auVar147._8_4_ * fStack_948 + 0.0;
              auVar155._12_4_ = auVar147._12_4_ * fStack_944 + 0.0;
              auVar110._0_4_ = fVar234 * auVar271._0_4_ + fVar230 * auVar215._0_4_;
              auVar110._4_4_ = fVar235 * auVar271._4_4_ + fVar231 * auVar215._4_4_;
              auVar110._8_4_ = fVar251 * auVar271._8_4_ + fVar232 * auVar215._8_4_;
              auVar110._12_4_ = fVar252 * auVar271._12_4_ + fVar233 * auVar215._12_4_;
              local_8e0._0_16_ = auVar110;
              auVar147 = vsubps_avx(auVar155,auVar110);
              _local_9c0 = auVar147;
              auVar147 = vdpps_avx(auVar147,auVar147,0x7f);
              fVar230 = auVar147._0_4_;
              local_bc0 = auVar250._0_4_;
              if (fVar230 < 0.0) {
                local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                local_ae0._0_16_ = auVar271;
                local_a20._0_16_ = auVar215;
                fVar231 = sqrtf(fVar230);
                auVar215 = local_a20._0_16_;
                auVar271 = local_ae0._0_16_;
              }
              else {
                auVar214 = vsqrtss_avx(auVar147,auVar147);
                fVar231 = auVar214._0_4_;
              }
              auVar214 = vsubps_avx(auVar215,auVar271);
              auVar301._0_4_ = auVar214._0_4_ * 3.0;
              auVar301._4_4_ = auVar214._4_4_ * 3.0;
              auVar301._8_4_ = auVar214._8_4_ * 3.0;
              auVar301._12_4_ = auVar214._12_4_ * 3.0;
              auVar214 = vshufps_avx(ZEXT416((uint)(fVar229 * 6.0)),ZEXT416((uint)(fVar229 * 6.0)),0
                                    );
              auVar106 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar229 + fVar229)) * 6.0));
              auVar191 = vshufps_avx(auVar106,auVar106,0);
              auVar106 = ZEXT416((uint)((fVar229 - ((float)local_b00._0_4_ + (float)local_b00._0_4_)
                                        ) * 6.0));
              auVar211 = vshufps_avx(auVar106,auVar106,0);
              auVar3 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                   ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
              auVar106 = vdpps_avx(auVar301,auVar301,0x7f);
              auVar156._0_4_ =
                   auVar3._0_4_ * (float)local_a80._0_4_ +
                   auVar211._0_4_ * (float)local_aa0._0_4_ +
                   auVar214._0_4_ * (float)local_ab0._0_4_ + auVar191._0_4_ * (float)local_a90._0_4_
              ;
              auVar156._4_4_ =
                   auVar3._4_4_ * (float)local_a80._4_4_ +
                   auVar211._4_4_ * (float)local_aa0._4_4_ +
                   auVar214._4_4_ * (float)local_ab0._4_4_ + auVar191._4_4_ * (float)local_a90._4_4_
              ;
              auVar156._8_4_ =
                   auVar3._8_4_ * fStack_a78 +
                   auVar211._8_4_ * fStack_a98 +
                   auVar214._8_4_ * fStack_aa8 + auVar191._8_4_ * fStack_a88;
              auVar156._12_4_ =
                   auVar3._12_4_ * fStack_a74 +
                   auVar211._12_4_ * fStack_a94 +
                   auVar214._12_4_ * fStack_aa4 + auVar191._12_4_ * fStack_a84;
              auVar214 = vblendps_avx(auVar106,_DAT_01feba10,0xe);
              auVar191 = vrsqrtss_avx(auVar214,auVar214);
              fVar233 = auVar191._0_4_;
              fVar232 = auVar106._0_4_;
              auVar191 = vdpps_avx(auVar301,auVar156,0x7f);
              auVar211 = vshufps_avx(auVar106,auVar106,0);
              auVar157._0_4_ = auVar156._0_4_ * auVar211._0_4_;
              auVar157._4_4_ = auVar156._4_4_ * auVar211._4_4_;
              auVar157._8_4_ = auVar156._8_4_ * auVar211._8_4_;
              auVar157._12_4_ = auVar156._12_4_ * auVar211._12_4_;
              auVar191 = vshufps_avx(auVar191,auVar191,0);
              auVar242._0_4_ = auVar301._0_4_ * auVar191._0_4_;
              auVar242._4_4_ = auVar301._4_4_ * auVar191._4_4_;
              auVar242._8_4_ = auVar301._8_4_ * auVar191._8_4_;
              auVar242._12_4_ = auVar301._12_4_ * auVar191._12_4_;
              auVar3 = vsubps_avx(auVar157,auVar242);
              auVar191 = vrcpss_avx(auVar214,auVar214);
              auVar214 = vmaxss_avx(ZEXT416((uint)local_a40._0_4_),
                                    ZEXT416((uint)(local_bc0 * (float)local_980._0_4_)));
              auVar191 = ZEXT416((uint)(auVar191._0_4_ * (2.0 - fVar232 * auVar191._0_4_)));
              auVar191 = vshufps_avx(auVar191,auVar191,0);
              uVar96 = CONCAT44(auVar301._4_4_,auVar301._0_4_);
              auVar272._0_8_ = uVar96 ^ 0x8000000080000000;
              auVar272._8_4_ = -auVar301._8_4_;
              auVar272._12_4_ = -auVar301._12_4_;
              auVar211 = ZEXT416((uint)(fVar233 * 1.5 + fVar232 * -0.5 * fVar233 * fVar233 * fVar233
                                       ));
              auVar211 = vshufps_avx(auVar211,auVar211,0);
              auVar216._0_4_ = auVar211._0_4_ * auVar3._0_4_ * auVar191._0_4_;
              auVar216._4_4_ = auVar211._4_4_ * auVar3._4_4_ * auVar191._4_4_;
              auVar216._8_4_ = auVar211._8_4_ * auVar3._8_4_ * auVar191._8_4_;
              auVar216._12_4_ = auVar211._12_4_ * auVar3._12_4_ * auVar191._12_4_;
              auVar350._0_4_ = auVar301._0_4_ * auVar211._0_4_;
              auVar350._4_4_ = auVar301._4_4_ * auVar211._4_4_;
              auVar350._8_4_ = auVar301._8_4_ * auVar211._8_4_;
              auVar350._12_4_ = auVar301._12_4_ * auVar211._12_4_;
              local_b00._0_16_ = auVar301;
              local_ae0._0_4_ = auVar214._0_4_;
              if (fVar232 < 0.0) {
                local_a20._0_4_ = fVar231;
                local_900._0_16_ = auVar272;
                local_9e0._0_16_ = auVar350;
                local_9a0._0_16_ = auVar216;
                fVar233 = sqrtf(fVar232);
                auVar216 = local_9a0._0_16_;
                auVar272 = local_900._0_16_;
                auVar350 = local_9e0._0_16_;
                fVar232 = (float)local_ae0._0_4_;
                fVar231 = (float)local_a20._0_4_;
              }
              else {
                auVar106 = vsqrtss_avx(auVar106,auVar106);
                fVar233 = auVar106._0_4_;
                fVar232 = auVar214._0_4_;
              }
              auVar214 = vdpps_avx(_local_9c0,auVar350,0x7f);
              fVar231 = ((float)local_a40._0_4_ / fVar233) * (fVar231 + 1.0) +
                        fVar232 + fVar231 * (float)local_a40._0_4_;
              auVar106 = vdpps_avx(auVar272,auVar350,0x7f);
              auVar191 = vdpps_avx(_local_9c0,auVar216,0x7f);
              auVar211 = vdpps_avx(_local_950,auVar350,0x7f);
              auVar3 = vdpps_avx(_local_9c0,auVar272,0x7f);
              fVar233 = auVar106._0_4_ + auVar191._0_4_;
              fVar234 = auVar214._0_4_;
              auVar111._0_4_ = fVar234 * fVar234;
              auVar111._4_4_ = auVar214._4_4_ * auVar214._4_4_;
              auVar111._8_4_ = auVar214._8_4_ * auVar214._8_4_;
              auVar111._12_4_ = auVar214._12_4_ * auVar214._12_4_;
              auVar191 = vsubps_avx(auVar147,auVar111);
              auVar106 = vdpps_avx(_local_9c0,_local_950,0x7f);
              fVar235 = auVar3._0_4_ - fVar234 * fVar233;
              fVar251 = auVar106._0_4_ - fVar234 * auVar211._0_4_;
              auVar106 = vrsqrtss_avx(auVar191,auVar191);
              fVar252 = auVar191._0_4_;
              fVar234 = auVar106._0_4_;
              fVar234 = fVar234 * 1.5 + fVar252 * -0.5 * fVar234 * fVar234 * fVar234;
              if (fVar252 < 0.0) {
                local_a20._0_16_ = auVar214;
                local_900._0_4_ = fVar231;
                local_9e0._0_16_ = ZEXT416((uint)fVar233);
                local_9a0._0_16_ = auVar211;
                local_920._0_4_ = fVar235;
                local_740._0_4_ = fVar251;
                local_760._0_4_ = fVar234;
                fVar252 = sqrtf(fVar252);
                fVar231 = (float)local_900._0_4_;
                fVar234 = (float)local_760._0_4_;
                fVar235 = (float)local_920._0_4_;
                fVar251 = (float)local_740._0_4_;
                auVar211 = local_9a0._0_16_;
                auVar214 = local_a20._0_16_;
                auVar106 = local_9e0._0_16_;
                fVar232 = (float)local_ae0._0_4_;
              }
              else {
                auVar106 = vsqrtss_avx(auVar191,auVar191);
                fVar252 = auVar106._0_4_;
                auVar106 = ZEXT416((uint)fVar233);
              }
              auVar386 = ZEXT1664(local_b00._0_16_);
              auVar158 = vpermilps_avx(local_8e0._0_16_,0xff);
              auVar151 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
              fVar233 = fVar235 * fVar234 - auVar151._0_4_;
              auVar243._0_8_ = auVar211._0_8_ ^ 0x8000000080000000;
              auVar243._8_4_ = auVar211._8_4_ ^ 0x80000000;
              auVar243._12_4_ = auVar211._12_4_ ^ 0x80000000;
              auVar273._0_4_ = -fVar233;
              auVar273._4_4_ = 0x80000000;
              auVar273._8_4_ = 0x80000000;
              auVar273._12_4_ = 0x80000000;
              auVar191 = vinsertps_avx(ZEXT416((uint)(fVar251 * fVar234)),auVar243,0x10);
              auVar3 = vmovsldup_avx(ZEXT416((uint)(auVar106._0_4_ * fVar251 * fVar234 -
                                                   auVar211._0_4_ * fVar233)));
              auVar191 = vdivps_avx(auVar191,auVar3);
              auVar158 = ZEXT416((uint)(fVar252 - auVar158._0_4_));
              auVar211 = vinsertps_avx(auVar214,auVar158,0x10);
              auVar217._0_4_ = auVar211._0_4_ * auVar191._0_4_;
              auVar217._4_4_ = auVar211._4_4_ * auVar191._4_4_;
              auVar217._8_4_ = auVar211._8_4_ * auVar191._8_4_;
              auVar217._12_4_ = auVar211._12_4_ * auVar191._12_4_;
              auVar106 = vinsertps_avx(auVar273,auVar106,0x1c);
              auVar106 = vdivps_avx(auVar106,auVar3);
              auVar195._0_4_ = auVar211._0_4_ * auVar106._0_4_;
              auVar195._4_4_ = auVar211._4_4_ * auVar106._4_4_;
              auVar195._8_4_ = auVar211._8_4_ * auVar106._8_4_;
              auVar195._12_4_ = auVar211._12_4_ * auVar106._12_4_;
              auVar106 = vhaddps_avx(auVar217,auVar217);
              auVar191 = vhaddps_avx(auVar195,auVar195);
              fVar229 = fVar229 - auVar106._0_4_;
              local_bc0 = local_bc0 - auVar191._0_4_;
              auVar250 = ZEXT464((uint)local_bc0);
              auVar244._8_4_ = 0x7fffffff;
              auVar244._0_8_ = 0x7fffffff7fffffff;
              auVar244._12_4_ = 0x7fffffff;
              auVar228 = ZEXT1664(auVar244);
              auVar214 = vandps_avx(auVar214,auVar244);
              if (fVar231 <= auVar214._0_4_) {
LAB_0111ede6:
                bVar75 = false;
              }
              else {
                auVar214 = vandps_avx(auVar158,auVar244);
                if ((float)local_780._0_4_ * 1.9073486e-06 + fVar232 + fVar231 <= auVar214._0_4_)
                goto LAB_0111ede6;
                local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                auVar250 = ZEXT464((uint)local_bc0);
                bVar75 = true;
                if ((((fVar207 <= local_bc0) &&
                     (fVar231 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar231)) &&
                    (0.0 <= fVar229)) && (fVar229 <= 1.0)) {
                  auVar147 = vrsqrtss_avx(auVar147,auVar147);
                  fVar232 = auVar147._0_4_;
                  pGVar9 = (context->scene->geometries).items[uVar92].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar147 = ZEXT416((uint)(fVar232 * 1.5 +
                                             fVar230 * -0.5 * fVar232 * fVar232 * fVar232));
                    auVar147 = vshufps_avx(auVar147,auVar147,0);
                    auVar159._0_4_ = auVar147._0_4_ * (float)local_9c0._0_4_;
                    auVar159._4_4_ = auVar147._4_4_ * (float)local_9c0._4_4_;
                    auVar159._8_4_ = auVar147._8_4_ * fStack_9b8;
                    auVar159._12_4_ = auVar147._12_4_ * fStack_9b4;
                    auVar112._0_4_ = local_b00._0_4_ + auVar151._0_4_ * auVar159._0_4_;
                    auVar112._4_4_ = local_b00._4_4_ + auVar151._4_4_ * auVar159._4_4_;
                    auVar112._8_4_ = local_b00._8_4_ + auVar151._8_4_ * auVar159._8_4_;
                    auVar112._12_4_ = local_b00._12_4_ + auVar151._12_4_ * auVar159._12_4_;
                    auVar147 = vshufps_avx(auVar159,auVar159,0xc9);
                    auVar214 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                    auVar160._0_4_ = auVar214._0_4_ * auVar159._0_4_;
                    auVar160._4_4_ = auVar214._4_4_ * auVar159._4_4_;
                    auVar160._8_4_ = auVar214._8_4_ * auVar159._8_4_;
                    auVar160._12_4_ = auVar214._12_4_ * auVar159._12_4_;
                    auVar196._0_4_ = local_b00._0_4_ * auVar147._0_4_;
                    auVar196._4_4_ = local_b00._4_4_ * auVar147._4_4_;
                    auVar196._8_4_ = local_b00._8_4_ * auVar147._8_4_;
                    auVar196._12_4_ = local_b00._12_4_ * auVar147._12_4_;
                    auVar106 = vsubps_avx(auVar196,auVar160);
                    auVar147 = vshufps_avx(auVar106,auVar106,0xc9);
                    auVar214 = vshufps_avx(auVar112,auVar112,0xc9);
                    auVar197._0_4_ = auVar214._0_4_ * auVar147._0_4_;
                    auVar197._4_4_ = auVar214._4_4_ * auVar147._4_4_;
                    auVar197._8_4_ = auVar214._8_4_ * auVar147._8_4_;
                    auVar197._12_4_ = auVar214._12_4_ * auVar147._12_4_;
                    auVar147 = vshufps_avx(auVar106,auVar106,0xd2);
                    auVar113._0_4_ = auVar112._0_4_ * auVar147._0_4_;
                    auVar113._4_4_ = auVar112._4_4_ * auVar147._4_4_;
                    auVar113._8_4_ = auVar112._8_4_ * auVar147._8_4_;
                    auVar113._12_4_ = auVar112._12_4_ * auVar147._12_4_;
                    auVar147 = vsubps_avx(auVar197,auVar113);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      uVar2 = vextractps_avx(auVar147,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                      uVar2 = vextractps_avx(auVar147,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                      *(int *)(ray + k * 4 + 0xe0) = auVar147._0_4_;
                      *(float *)(ray + k * 4 + 0xf0) = fVar229;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_9e8;
                      *(uint *)(ray + k * 4 + 0x120) = uVar92;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      auVar214 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
                      local_700 = (RTCHitN  [16])vshufps_avx(auVar147,auVar147,0x55);
                      auVar106 = vshufps_avx(auVar147,auVar147,0xaa);
                      local_6e0 = vshufps_avx(auVar147,auVar147,0);
                      auStack_6f0 = auVar106;
                      local_6d0 = auVar214;
                      local_6c0 = ZEXT816(0) << 0x20;
                      local_6b0 = local_720._0_8_;
                      uStack_6a8 = local_720._8_8_;
                      local_6a0 = local_710._0_8_;
                      uStack_698 = local_710._8_8_;
                      uVar12 = context->user->instID[0];
                      _local_690 = CONCAT44(uVar12,uVar12);
                      _uStack_688 = CONCAT44(uVar12,uVar12);
                      uVar12 = context->user->instPrimID[0];
                      _uStack_680 = CONCAT44(uVar12,uVar12);
                      _uStack_678 = CONCAT44(uVar12,uVar12);
                      *(float *)(ray + k * 4 + 0x80) = local_bc0;
                      local_b20 = *local_9f0;
                      uStack_b18 = local_9f0[1];
                      local_a70.valid = (int *)&local_b20;
                      local_a70.geometryUserPtr = pGVar9->userPtr;
                      local_a70.context = context->user;
                      local_a70.hit = local_700;
                      local_a70.N = 4;
                      local_a70.ray = (RTCRayN *)ray;
                      if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar386 = ZEXT1664(local_b00._0_16_);
                        (*pGVar9->intersectionFilterN)(&local_a70);
                        auVar250._8_56_ = extraout_var_00;
                        auVar250._0_8_ = extraout_XMM1_Qa_00;
                        auVar214 = auVar250._0_16_;
                      }
                      auVar88._8_8_ = uStack_b18;
                      auVar88._0_8_ = local_b20;
                      if (auVar88 == (undefined1  [16])0x0) {
                        auVar147 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar214 = vpcmpeqd_avx(auVar214,auVar214);
                        auVar147 = auVar147 ^ auVar214;
                        auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      }
                      else {
                        p_Var11 = context->args->filter;
                        auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        auVar214 = vpcmpeqd_avx(auVar106,auVar106);
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar386 = ZEXT1664(auVar386._0_16_);
                          (*p_Var11)(&local_a70);
                          auVar214 = vpcmpeqd_avx(auVar214,auVar214);
                          auVar228 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar89._8_8_ = uStack_b18;
                        auVar89._0_8_ = local_b20;
                        auVar106 = vpcmpeqd_avx(auVar89,_DAT_01feba10);
                        auVar147 = auVar106 ^ auVar214;
                        if (auVar89 != (undefined1  [16])0x0) {
                          auVar106 = auVar106 ^ auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])local_a70.hit);
                          *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x10));
                          *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x20));
                          *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x30));
                          *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x40));
                          *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x50));
                          *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x60));
                          *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x70));
                          *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar214;
                          auVar214 = vmaskmovps_avx(auVar106,*(undefined1 (*) [16])
                                                              (local_a70.hit + 0x80));
                          *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar214;
                        }
                      }
                      auVar250 = ZEXT464((uint)local_bc0);
                      auVar161._8_8_ = 0x100000001;
                      auVar161._0_8_ = 0x100000001;
                      if ((auVar161 & auVar147) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar231;
                      }
                    }
                  }
                }
              }
              auVar114 = local_600;
              bVar98 = lVar95 != 0;
              lVar95 = lVar95 + -1;
            } while ((!bVar75) && (bVar98));
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar125._4_4_ = uVar2;
            auVar125._0_4_ = uVar2;
            auVar125._8_4_ = uVar2;
            auVar125._12_4_ = uVar2;
            auVar125._16_4_ = uVar2;
            auVar125._20_4_ = uVar2;
            auVar125._24_4_ = uVar2;
            auVar125._28_4_ = uVar2;
            auVar353 = vcmpps_avx(_local_800,auVar125,2);
            local_600 = vandps_avx(auVar353,local_600);
            auVar114 = auVar114 & auVar353;
            uVar96 = local_620._0_8_;
          } while ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar114 >> 0x7f,0) != '\0') ||
                     (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar114 >> 0xbf,0) != '\0') ||
                   (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar114[0x1f] < '\0');
        }
        auVar114 = vandps_avx(local_560,local_540);
        auVar353 = vandps_avx(_local_8a0,_local_880);
        auVar311 = ZEXT3264(_local_940);
        auVar204._0_4_ = local_940._0_4_ + local_4c0._0_4_;
        auVar204._4_4_ = local_940._4_4_ + local_4c0._4_4_;
        auVar204._8_4_ = local_940._8_4_ + local_4c0._8_4_;
        auVar204._12_4_ = local_940._12_4_ + local_4c0._12_4_;
        auVar204._16_4_ = local_940._16_4_ + local_4c0._16_4_;
        auVar204._20_4_ = local_940._20_4_ + local_4c0._20_4_;
        auVar204._24_4_ = local_940._24_4_ + local_4c0._24_4_;
        auVar204._28_4_ = local_940._28_4_ + local_4c0._28_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar249._4_4_ = uVar2;
        auVar249._0_4_ = uVar2;
        auVar249._8_4_ = uVar2;
        auVar249._12_4_ = uVar2;
        auVar249._16_4_ = uVar2;
        auVar249._20_4_ = uVar2;
        auVar249._24_4_ = uVar2;
        auVar249._28_4_ = uVar2;
        auVar14 = vcmpps_avx(auVar204,auVar249,2);
        auVar114 = vandps_avx(auVar14,auVar114);
        auVar282._0_4_ = local_940._0_4_ + local_480._0_4_;
        auVar282._4_4_ = local_940._4_4_ + local_480._4_4_;
        auVar282._8_4_ = local_940._8_4_ + local_480._8_4_;
        auVar282._12_4_ = local_940._12_4_ + local_480._12_4_;
        auVar282._16_4_ = local_940._16_4_ + local_480._16_4_;
        auVar282._20_4_ = local_940._20_4_ + local_480._20_4_;
        auVar282._24_4_ = local_940._24_4_ + local_480._24_4_;
        auVar282._28_4_ = local_940._28_4_ + local_480._28_4_;
        auVar14 = vcmpps_avx(auVar282,auVar249,2);
        auVar353 = vandps_avx(auVar14,auVar353);
        auVar353 = vorps_avx(auVar114,auVar353);
        if ((((((((auVar353 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar353 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar353 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar353 >> 0x7f,0) != '\0') ||
              (auVar353 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar353 >> 0xbf,0) != '\0') ||
            (auVar353 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar353[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar353;
          auVar114 = vblendvps_avx(_local_480,_local_4c0,auVar114);
          *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar114;
          auVar337 = ZEXT1664(local_a00);
          *(long *)(afStack_140 + uVar93 * 0x18) = local_a00._0_8_;
          auStack_138[uVar93 * 0x18] = (int)uVar96 + 1;
          uVar93 = (ulong)((int)uVar93 + 1);
          auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_0111d7ee;
        }
        auVar248._8_4_ = 0x3f800000;
        auVar248._0_8_ = &DAT_3f8000003f800000;
        auVar248._12_4_ = 0x3f800000;
        auVar248._16_4_ = 0x3f800000;
        auVar248._20_4_ = 0x3f800000;
        auVar248._24_4_ = 0x3f800000;
        auVar248._28_4_ = 0x3f800000;
      }
      auVar250 = ZEXT3264(auVar248);
      auVar337 = ZEXT1664(local_a00);
    }
LAB_0111d7ee:
    do {
      if ((int)uVar93 == 0) {
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar126._4_4_ = uVar2;
        auVar126._0_4_ = uVar2;
        auVar126._8_4_ = uVar2;
        auVar126._12_4_ = uVar2;
        auVar126._16_4_ = uVar2;
        auVar126._20_4_ = uVar2;
        auVar126._24_4_ = uVar2;
        auVar126._28_4_ = uVar2;
        auVar114 = vcmpps_avx(local_400,auVar126,2);
        uVar92 = vmovmskps_avx(auVar114);
        uVar92 = (uint)local_8a8 - 1 & (uint)local_8a8 & uVar92;
        if (uVar92 == 0) {
          return;
        }
        goto LAB_0111c70c;
      }
      uVar97 = (ulong)((int)uVar93 - 1);
      lVar95 = uVar97 * 0x60;
      auVar114 = *(undefined1 (*) [32])(auStack_160 + lVar95);
      auVar121._0_4_ = auVar311._0_4_ + auVar114._0_4_;
      auVar121._4_4_ = auVar311._4_4_ + auVar114._4_4_;
      auVar121._8_4_ = auVar311._8_4_ + auVar114._8_4_;
      auVar121._12_4_ = auVar311._12_4_ + auVar114._12_4_;
      auVar121._16_4_ = auVar311._16_4_ + auVar114._16_4_;
      auVar121._20_4_ = auVar311._20_4_ + auVar114._20_4_;
      auVar121._24_4_ = auVar311._24_4_ + auVar114._24_4_;
      auVar121._28_4_ = auVar311._28_4_ + auVar114._28_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar227._4_4_ = uVar2;
      auVar227._0_4_ = uVar2;
      auVar227._8_4_ = uVar2;
      auVar227._12_4_ = uVar2;
      auVar227._16_4_ = uVar2;
      auVar227._20_4_ = uVar2;
      auVar227._24_4_ = uVar2;
      auVar227._28_4_ = uVar2;
      auVar14 = vcmpps_avx(auVar121,auVar227,2);
      auVar353 = vandps_avx(auVar14,*(undefined1 (*) [32])(auStack_180 + lVar95));
      _local_700 = auVar353;
      auVar15 = *(undefined1 (*) [32])(auStack_180 + lVar95) & auVar14;
      bVar80 = (auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar81 = (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar79 = (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar78 = SUB321(auVar15 >> 0x7f,0) == '\0';
      bVar77 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar76 = SUB321(auVar15 >> 0xbf,0) == '\0';
      bVar98 = (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar75 = -1 < auVar15[0x1f];
      if (((((((!bVar80 || !bVar81) || !bVar79) || !bVar78) || !bVar77) || !bVar76) || !bVar98) ||
          !bVar75) {
        auVar200._8_4_ = 0x7f800000;
        auVar200._0_8_ = 0x7f8000007f800000;
        auVar200._12_4_ = 0x7f800000;
        auVar200._16_4_ = 0x7f800000;
        auVar200._20_4_ = 0x7f800000;
        auVar200._24_4_ = 0x7f800000;
        auVar200._28_4_ = 0x7f800000;
        auVar114 = vblendvps_avx(auVar200,auVar114,auVar353);
        auVar14 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar14 = vminps_avx(auVar114,auVar14);
        auVar15 = vshufpd_avx(auVar14,auVar14,5);
        auVar15 = vminps_avx(auVar14,auVar15);
        auVar14 = vperm2f128_avx(auVar15,auVar15,1);
        auVar15 = vminps_avx(auVar15,auVar14);
        auVar114 = vcmpps_avx(auVar114,auVar15,0);
        auVar15 = auVar353 & auVar114;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          auVar353 = vandps_avx(auVar114,auVar353);
        }
        fVar229 = afStack_140[uVar97 * 0x18 + 1];
        uVar96 = (ulong)auStack_138[uVar97 * 0x18];
        uVar94 = vmovmskps_avx(auVar353);
        uVar12 = 0;
        if (uVar94 != 0) {
          for (; (uVar94 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        fVar230 = afStack_140[uVar97 * 0x18];
        *(undefined4 *)(local_700 + (ulong)uVar12 * 4) = 0;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar97 = uVar93;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar95) = _local_700;
        auVar147 = vshufps_avx(ZEXT416((uint)(fVar229 - fVar230)),ZEXT416((uint)(fVar229 - fVar230))
                               ,0);
        local_4c0._4_4_ = fVar230 + auVar147._4_4_ * 0.14285715;
        local_4c0._0_4_ = fVar230 + auVar147._0_4_ * 0.0;
        fStack_4b8 = fVar230 + auVar147._8_4_ * 0.2857143;
        fStack_4b4 = fVar230 + auVar147._12_4_ * 0.42857146;
        fStack_4b0 = fVar230 + auVar147._0_4_ * 0.5714286;
        fStack_4ac = fVar230 + auVar147._4_4_ * 0.71428573;
        fStack_4a8 = fVar230 + auVar147._8_4_ * 0.8571429;
        fStack_4a4 = fVar230 + auVar147._12_4_;
        auVar337 = ZEXT864(*(ulong *)(local_4c0 + (ulong)uVar12 * 4));
      }
      uVar93 = uVar97;
      auVar228 = ZEXT3264(auVar14);
    } while (((((((bVar80 && bVar81) && bVar79) && bVar78) && bVar77) && bVar76) && bVar98) &&
             bVar75);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }